

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float *pfVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  pointer pMVar8;
  Mat *pMVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [8];
  int iVar79;
  void *pvVar80;
  int iVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  undefined1 (*pauVar86) [32];
  undefined1 (*pauVar87) [16];
  int iVar88;
  undefined1 auVar89 [8];
  undefined8 *puVar90;
  undefined1 (*pauVar91) [32];
  undefined1 (*pauVar92) [16];
  undefined1 (*pauVar93) [32];
  undefined1 (*pauVar94) [16];
  void *pvVar95;
  float *pfVar96;
  float *pfVar97;
  long lVar98;
  ulong uVar99;
  void *pvVar100;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  ulong uVar105;
  __m256 *pafVar106;
  __m256 *pafVar107;
  __m256 *pafVar108;
  undefined1 auVar109 [8];
  long lVar110;
  long lVar111;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined8 uVar273;
  undefined1 auVar197 [32];
  undefined8 uVar270;
  undefined1 auVar112 [16];
  undefined8 uVar271;
  undefined8 uVar274;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar135 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar185 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  __m256 afVar254;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar272 [56];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar373 [64];
  undefined1 auVar374 [64];
  undefined1 auVar375 [64];
  undefined1 auVar376 [64];
  undefined1 auVar377 [64];
  undefined1 auVar378 [64];
  undefined1 auVar379 [64];
  undefined1 auVar380 [64];
  undefined1 auVar381 [64];
  undefined1 auVar382 [64];
  undefined1 auVar383 [64];
  undefined1 auVar384 [64];
  undefined1 auVar385 [64];
  undefined1 auVar386 [64];
  undefined1 auVar387 [64];
  undefined1 auVar388 [64];
  undefined1 auVar389 [64];
  undefined1 auVar390 [64];
  undefined1 auVar391 [64];
  undefined1 auVar392 [64];
  undefined1 auVar393 [64];
  undefined1 auVar394 [64];
  undefined1 auVar395 [16];
  undefined1 auVar396 [32];
  float fVar397;
  float fVar426;
  float fVar427;
  float fVar428;
  undefined1 in_ZMM3 [64];
  undefined1 auVar398 [64];
  undefined1 auVar399 [64];
  undefined1 auVar400 [64];
  undefined1 auVar401 [64];
  undefined1 auVar402 [64];
  undefined1 auVar403 [64];
  undefined1 auVar404 [64];
  undefined1 auVar405 [64];
  undefined1 auVar406 [64];
  undefined1 auVar407 [64];
  undefined1 auVar408 [64];
  undefined1 auVar409 [64];
  undefined1 auVar410 [64];
  undefined1 auVar411 [64];
  undefined1 auVar412 [64];
  undefined1 auVar413 [64];
  undefined1 auVar414 [64];
  float fVar429;
  undefined1 auVar415 [64];
  undefined1 auVar416 [64];
  undefined1 auVar417 [64];
  undefined1 auVar418 [64];
  undefined1 auVar419 [64];
  undefined1 auVar420 [64];
  undefined1 auVar421 [64];
  undefined1 auVar422 [64];
  undefined1 auVar423 [64];
  undefined1 auVar424 [64];
  undefined1 auVar425 [64];
  __m128 afVar430;
  binary_op_pow_pack8 op;
  __m256 _b0;
  __m256 _p;
  __m256 *local_140;
  binary_op_pow_pack8 local_131;
  void *local_130;
  undefined8 local_128;
  pointer local_120;
  ulong local_118;
  pointer local_110;
  Mat *local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  __m256 local_80;
  ulong local_60;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = pMVar8 + 1;
  pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar79 = pMVar8->elempack;
  iVar81 = pMVar8[1].elempack;
  local_120 = pMVar8;
  local_110 = pMVar1;
  local_108 = pMVar9;
  if (iVar81 == 8 || iVar79 == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3])) {
    case 0:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  fVar429 = pfVar96[4];
                  fVar14 = pfVar96[5];
                  fVar15 = pfVar96[6];
                  fVar71 = pfVar96[7];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 + *pfVar96;
                  pfVar97[1] = fVar397 + fVar426;
                  pfVar97[2] = fVar397 + fVar427;
                  pfVar97[3] = fVar397 + fVar428;
                  pfVar97[4] = fVar397 + fVar429;
                  pfVar97[5] = fVar397 + fVar14;
                  pfVar97[6] = fVar397 + fVar15;
                  pfVar97[7] = fVar397 + fVar71;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  fVar429 = pfVar96[4];
                  fVar14 = pfVar96[5];
                  fVar15 = pfVar96[6];
                  fVar71 = pfVar96[7];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 + *pfVar96;
                  pfVar97[1] = fVar397 + fVar426;
                  pfVar97[2] = fVar397 + fVar427;
                  pfVar97[3] = fVar397 + fVar428;
                  pfVar97[4] = fVar397 + fVar429;
                  pfVar97[5] = fVar397 + fVar14;
                  pfVar97[6] = fVar397 + fVar15;
                  pfVar97[7] = fVar397 + fVar71;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar353._0_4_ = fVar397 + *pfVar96;
                      auVar353._4_4_ = fVar397 + pfVar96[1];
                      auVar353._8_4_ = fVar397 + pfVar96[2];
                      auVar353._12_4_ = fVar397 + pfVar96[3];
                      auVar353._16_4_ = fVar397 + pfVar96[4];
                      auVar353._20_4_ = fVar397 + pfVar96[5];
                      auVar353._24_4_ = fVar397 + pfVar96[6];
                      auVar353._28_4_ = fVar397 + pfVar96[7];
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar353;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                pfVar96 = (float *)((long)pvVar100 + lVar98);
                fVar397 = pfVar96[1];
                fVar426 = pfVar96[2];
                fVar427 = pfVar96[3];
                fVar428 = pfVar96[4];
                fVar429 = pfVar96[5];
                fVar14 = pfVar96[6];
                fVar15 = pfVar96[7];
                pfVar97 = (float *)((long)pvVar95 + lVar98);
                fVar71 = pfVar97[1];
                fVar72 = pfVar97[2];
                fVar73 = pfVar97[3];
                fVar74 = pfVar97[4];
                fVar75 = pfVar97[5];
                fVar76 = pfVar97[6];
                fVar77 = pfVar97[7];
                pfVar2 = (float *)((long)pvVar80 + lVar98);
                *pfVar2 = *pfVar96 + *pfVar97;
                pfVar2[1] = fVar397 + fVar71;
                pfVar2[2] = fVar426 + fVar72;
                pfVar2[3] = fVar427 + fVar73;
                pfVar2[4] = fVar428 + fVar74;
                pfVar2[5] = fVar429 + fVar75;
                pfVar2[6] = fVar14 + fVar76;
                pfVar2[7] = fVar15 + fVar77;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *local_110->data;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              fVar429 = pfVar96[4];
              fVar14 = pfVar96[5];
              fVar15 = pfVar96[6];
              fVar71 = pfVar96[7];
              pfVar97 = (float *)((long)pvVar80 + lVar98);
              *pfVar97 = fVar397 + *pfVar96;
              pfVar97[1] = fVar397 + fVar426;
              pfVar97[2] = fVar397 + fVar427;
              pfVar97[3] = fVar397 + fVar428;
              pfVar97[4] = fVar397 + fVar429;
              pfVar97[5] = fVar397 + fVar14;
              pfVar97[6] = fVar397 + fVar15;
              pfVar97[7] = fVar397 + fVar71;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pfVar96 = (float *)pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar362._0_4_ = auVar202._0_4_ + *pfVar96;
                    auVar362._4_4_ = auVar202._4_4_ + pfVar96[1];
                    auVar362._8_4_ = auVar202._8_4_ + pfVar96[2];
                    auVar362._12_4_ = auVar202._12_4_ + pfVar96[3];
                    auVar362._16_4_ = auVar202._16_4_ + pfVar96[4];
                    auVar362._20_4_ = auVar202._20_4_ + pfVar96[5];
                    auVar362._24_4_ = auVar202._24_4_ + pfVar96[6];
                    auVar362._28_4_ = auVar202._28_4_ + pfVar96[7];
                    *pauVar86 = auVar362;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                auVar355._0_4_ = auVar202._0_4_ + *pfVar96;
                auVar355._4_4_ = auVar202._4_4_ + pfVar96[1];
                auVar355._8_4_ = auVar202._8_4_ + pfVar96[2];
                auVar355._12_4_ = auVar202._12_4_ + pfVar96[3];
                auVar355._16_4_ = auVar202._16_4_ + pfVar96[4];
                auVar355._20_4_ = auVar202._20_4_ + pfVar96[5];
                auVar355._24_4_ = auVar202._24_4_ + pfVar96[6];
                auVar355._28_4_ = auVar202._28_4_ + pfVar96[7];
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar355
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar93 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar93;
                      uVar101 = uVar103;
                      do {
                        auVar351._0_4_ = auVar202._0_4_ + *pfVar96;
                        auVar351._4_4_ = auVar202._4_4_ + pfVar96[1];
                        auVar351._8_4_ = auVar202._8_4_ + pfVar96[2];
                        auVar351._12_4_ = auVar202._12_4_ + pfVar96[3];
                        auVar351._16_4_ = auVar202._16_4_ + pfVar96[4];
                        auVar351._20_4_ = auVar202._20_4_ + pfVar96[5];
                        auVar351._24_4_ = auVar202._24_4_ + pfVar96[6];
                        auVar351._28_4_ = auVar202._28_4_ + pfVar96[7];
                        *pauVar86 = auVar351;
                        pfVar96 = pfVar96 + 8;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar93 = pauVar93 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar100 + lVar98);
              fVar397 = pfVar96[1];
              fVar426 = pfVar96[2];
              fVar427 = pfVar96[3];
              fVar428 = pfVar96[4];
              fVar429 = pfVar96[5];
              fVar14 = pfVar96[6];
              fVar15 = pfVar96[7];
              pfVar97 = (float *)((long)pvVar95 + lVar98);
              fVar71 = pfVar97[1];
              fVar72 = pfVar97[2];
              fVar73 = pfVar97[3];
              fVar74 = pfVar97[4];
              fVar75 = pfVar97[5];
              fVar76 = pfVar97[6];
              fVar77 = pfVar97[7];
              pfVar2 = (float *)((long)pvVar80 + lVar98);
              *pfVar2 = *pfVar96 + *pfVar97;
              pfVar2[1] = fVar397 + fVar71;
              pfVar2[2] = fVar426 + fVar72;
              pfVar2[3] = fVar427 + fVar73;
              pfVar2[4] = fVar428 + fVar74;
              pfVar2[5] = fVar429 + fVar75;
              pfVar2[6] = fVar14 + fVar76;
              pfVar2[7] = fVar15 + fVar77;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)local_120->data;
              pauVar93 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar82 = uVar83;
                  do {
                    auVar371._0_4_ = auVar202._0_4_ + *pfVar96;
                    auVar371._4_4_ = auVar202._4_4_ + pfVar96[1];
                    auVar371._8_4_ = auVar202._8_4_ + pfVar96[2];
                    auVar371._12_4_ = auVar202._12_4_ + pfVar96[3];
                    auVar371._16_4_ = auVar202._16_4_ + pfVar96[4];
                    auVar371._20_4_ = auVar202._20_4_ + pfVar96[5];
                    auVar371._24_4_ = auVar202._24_4_ + pfVar96[6];
                    auVar371._28_4_ = auVar202._28_4_ + pfVar96[7];
                    *pauVar86 = auVar371;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar397 = *local_110->data;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              fVar429 = pfVar96[4];
              fVar14 = pfVar96[5];
              fVar15 = pfVar96[6];
              fVar71 = pfVar96[7];
              pfVar97 = (float *)((long)*pauVar86 + lVar98);
              *pfVar97 = fVar397 + *pfVar96;
              pfVar97[1] = fVar397 + fVar426;
              pfVar97[2] = fVar397 + fVar427;
              pfVar97[3] = fVar397 + fVar428;
              pfVar97[4] = fVar397 + fVar429;
              pfVar97[5] = fVar397 + fVar14;
              pfVar97[6] = fVar397 + fVar15;
              pfVar97[7] = fVar397 + fVar71;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar367._0_4_ = auVar202._0_4_ + *pfVar96;
                    auVar367._4_4_ = auVar202._4_4_ + pfVar96[1];
                    auVar367._8_4_ = auVar202._8_4_ + pfVar96[2];
                    auVar367._12_4_ = auVar202._12_4_ + pfVar96[3];
                    auVar367._16_4_ = auVar202._16_4_ + pfVar96[4];
                    auVar367._20_4_ = auVar202._20_4_ + pfVar96[5];
                    auVar367._24_4_ = auVar202._24_4_ + pfVar96[6];
                    auVar367._28_4_ = auVar202._28_4_ + pfVar96[7];
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar367;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar397 = *local_110->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar365._0_4_ = fVar397 + *pfVar96;
                  auVar365._4_4_ = fVar397 + pfVar96[1];
                  auVar365._8_4_ = fVar397 + pfVar96[2];
                  auVar365._12_4_ = fVar397 + pfVar96[3];
                  auVar365._16_4_ = fVar397 + pfVar96[4];
                  auVar365._20_4_ = fVar397 + pfVar96[5];
                  auVar365._24_4_ = fVar397 + pfVar96[6];
                  auVar365._28_4_ = fVar397 + pfVar96[7];
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar365;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar96 = (float *)(local_120->cstep * uVar82 * local_120->elemsize +
                                 (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar356._0_4_ = auVar202._0_4_ + *pfVar96;
                    auVar356._4_4_ = auVar202._4_4_ + pfVar96[1];
                    auVar356._8_4_ = auVar202._8_4_ + pfVar96[2];
                    auVar356._12_4_ = auVar202._12_4_ + pfVar96[3];
                    auVar356._16_4_ = auVar202._16_4_ + pfVar96[4];
                    auVar356._20_4_ = auVar202._20_4_ + pfVar96[5];
                    auVar356._24_4_ = auVar202._24_4_ + pfVar96[6];
                    auVar356._28_4_ = auVar202._28_4_ + pfVar96[7];
                    *pauVar86 = auVar356;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar348._0_4_ = auVar202._0_4_ + *pfVar96;
                  auVar348._4_4_ = auVar202._4_4_ + pfVar96[1];
                  auVar348._8_4_ = auVar202._8_4_ + pfVar96[2];
                  auVar348._12_4_ = auVar202._12_4_ + pfVar96[3];
                  auVar348._16_4_ = auVar202._16_4_ + pfVar96[4];
                  auVar348._20_4_ = auVar202._20_4_ + pfVar96[5];
                  auVar348._24_4_ = auVar202._24_4_ + pfVar96[6];
                  auVar348._28_4_ = auVar202._28_4_ + pfVar96[7];
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar348;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar82);
                  auVar208._0_4_ = fVar397 + *pfVar96;
                  auVar208._4_4_ = fVar397 + pfVar96[1];
                  auVar208._8_4_ = fVar397 + pfVar96[2];
                  auVar208._12_4_ = fVar397 + pfVar96[3];
                  auVar208._16_4_ = fVar397 + pfVar96[4];
                  auVar208._20_4_ = fVar397 + pfVar96[5];
                  auVar208._24_4_ = fVar397 + pfVar96[6];
                  auVar208._28_4_ = fVar397 + pfVar96[7];
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar208;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83);
                  auVar360._0_4_ = auVar202._0_4_ + *pfVar96;
                  auVar360._4_4_ = auVar202._4_4_ + pfVar96[1];
                  auVar360._8_4_ = auVar202._8_4_ + pfVar96[2];
                  auVar360._12_4_ = auVar202._12_4_ + pfVar96[3];
                  auVar360._16_4_ = auVar202._16_4_ + pfVar96[4];
                  auVar360._20_4_ = auVar202._20_4_ + pfVar96[5];
                  auVar360._24_4_ = auVar202._24_4_ + pfVar96[6];
                  auVar360._28_4_ = auVar202._28_4_ + pfVar96[7];
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar360;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar83);
                  auVar232._0_4_ = fVar397 + *pfVar96;
                  auVar232._4_4_ = fVar397 + pfVar96[1];
                  auVar232._8_4_ = fVar397 + pfVar96[2];
                  auVar232._12_4_ = fVar397 + pfVar96[3];
                  auVar232._16_4_ = fVar397 + pfVar96[4];
                  auVar232._20_4_ = fVar397 + pfVar96[5];
                  auVar232._24_4_ = fVar397 + pfVar96[6];
                  auVar232._28_4_ = fVar397 + pfVar96[7];
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar232;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar363._0_4_ = auVar202._0_4_ + *pfVar96;
                      auVar363._4_4_ = auVar202._4_4_ + pfVar96[1];
                      auVar363._8_4_ = auVar202._8_4_ + pfVar96[2];
                      auVar363._12_4_ = auVar202._12_4_ + pfVar96[3];
                      auVar363._16_4_ = auVar202._16_4_ + pfVar96[4];
                      auVar363._20_4_ = auVar202._20_4_ + pfVar96[5];
                      auVar363._24_4_ = auVar202._24_4_ + pfVar96[6];
                      auVar363._28_4_ = auVar202._28_4_ + pfVar96[7];
                      *pauVar86 = auVar363;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84);
                      pfVar97 = (float *)((long)pvVar100 + lVar98);
                      auVar247._0_4_ = *pfVar96 + *pfVar97;
                      auVar247._4_4_ = pfVar96[1] + pfVar97[1];
                      auVar247._8_4_ = pfVar96[2] + pfVar97[2];
                      auVar247._12_4_ = pfVar96[3] + pfVar97[3];
                      auVar247._16_4_ = pfVar96[4] + pfVar97[4];
                      auVar247._20_4_ = pfVar96[5] + pfVar97[5];
                      auVar247._24_4_ = pfVar96[6] + pfVar97[6];
                      auVar247._28_4_ = pfVar96[7] + pfVar97[7];
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar247;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar370._0_4_ = auVar202._0_4_ + *pfVar96;
                      auVar370._4_4_ = auVar202._4_4_ + pfVar96[1];
                      auVar370._8_4_ = auVar202._8_4_ + pfVar96[2];
                      auVar370._12_4_ = auVar202._12_4_ + pfVar96[3];
                      auVar370._16_4_ = auVar202._16_4_ + pfVar96[4];
                      auVar370._20_4_ = auVar202._20_4_ + pfVar96[5];
                      auVar370._24_4_ = auVar202._24_4_ + pfVar96[6];
                      auVar370._28_4_ = auVar202._28_4_ + pfVar96[7];
                      *pauVar86 = auVar370;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)auVar89 + lVar98);
                      pfVar97 = (float *)((long)auVar78 + lVar98);
                      auVar253._0_4_ = *pfVar96 + *pfVar97;
                      auVar253._4_4_ = pfVar96[1] + pfVar97[1];
                      auVar253._8_4_ = pfVar96[2] + pfVar97[2];
                      auVar253._12_4_ = pfVar96[3] + pfVar97[3];
                      auVar253._16_4_ = pfVar96[4] + pfVar97[4];
                      auVar253._20_4_ = pfVar96[5] + pfVar97[5];
                      auVar253._24_4_ = pfVar96[6] + pfVar97[6];
                      auVar253._28_4_ = pfVar96[7] + pfVar97[7];
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar253;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                pfVar96 = (float *)((long)auVar89 + lVar98);
                pfVar97 = (float *)((long)auVar78 + lVar98);
                auVar257._0_4_ = *pfVar96 + *pfVar97;
                auVar257._4_4_ = pfVar96[1] + pfVar97[1];
                auVar257._8_4_ = pfVar96[2] + pfVar97[2];
                auVar257._12_4_ = pfVar96[3] + pfVar97[3];
                auVar257._16_4_ = pfVar96[4] + pfVar97[4];
                auVar257._20_4_ = pfVar96[5] + pfVar97[5];
                auVar257._24_4_ = pfVar96[6] + pfVar97[6];
                auVar257._28_4_ = pfVar96[7] + pfVar97[7];
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar257;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar225._4_4_ = uVar4;
                auVar225._0_4_ = uVar4;
                auVar225._8_4_ = uVar4;
                auVar225._12_4_ = uVar4;
                auVar225._16_4_ = uVar4;
                auVar225._20_4_ = uVar4;
                auVar225._24_4_ = uVar4;
                auVar225._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vsubps_avx(auVar225,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar222._4_4_ = uVar4;
                auVar222._0_4_ = uVar4;
                auVar222._8_4_ = uVar4;
                auVar222._12_4_ = uVar4;
                auVar222._16_4_ = uVar4;
                auVar222._20_4_ = uVar4;
                auVar222._24_4_ = uVar4;
                auVar222._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vsubps_avx(auVar222,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar201._4_4_ = uVar4;
                auVar201._0_4_ = uVar4;
                auVar201._8_4_ = uVar4;
                auVar201._12_4_ = uVar4;
                auVar201._16_4_ = uVar4;
                auVar201._20_4_ = uVar4;
                auVar201._24_4_ = uVar4;
                auVar201._28_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      auVar202 = vsubps_avx(auVar201,*(undefined1 (*) [32])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar202;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [32])((long)pvVar100 + lVar98));
                *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar214._4_4_ = uVar4;
            auVar214._0_4_ = uVar4;
            auVar214._8_4_ = uVar4;
            auVar214._12_4_ = uVar4;
            auVar214._16_4_ = uVar4;
            auVar214._20_4_ = uVar4;
            auVar214._24_4_ = uVar4;
            auVar214._28_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),auVar214);
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pauVar91 = (undefined1 (*) [32])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar243 = vsubps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                auVar243 = vsubps_avx(auVar202,*(undefined1 (*) [32])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar243
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar93 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar91 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar91;
                      uVar101 = uVar103;
                      do {
                        auVar243 = vsubps_avx(auVar202,*pauVar93);
                        *pauVar86 = auVar243;
                        pauVar93 = pauVar93 + 1;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar91 = pauVar91 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar93 = (undefined1 (*) [32])local_120->data;
              pauVar91 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar91;
                  uVar82 = uVar83;
                  do {
                    auVar243 = vsubps_avx(*pauVar93,auVar202);
                    *pauVar86 = auVar243;
                    pauVar93 = pauVar93 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar91 = pauVar91 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar239._4_4_ = uVar4;
            auVar239._0_4_ = uVar4;
            auVar239._8_4_ = uVar4;
            auVar239._12_4_ = uVar4;
            auVar239._16_4_ = uVar4;
            auVar239._20_4_ = uVar4;
            auVar239._24_4_ = uVar4;
            auVar239._28_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar80 + lVar98),auVar239);
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    auVar243 = vsubps_avx(*(undefined1 (*) [32])
                                           ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82),
                                          auVar202);
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar243;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar242._4_4_ = uVar4;
            auVar242._0_4_ = uVar4;
            auVar242._8_4_ = uVar4;
            auVar242._12_4_ = uVar4;
            auVar242._16_4_ = uVar4;
            auVar242._20_4_ = uVar4;
            auVar242._24_4_ = uVar4;
            auVar242._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar202 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82),
                                        auVar242);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar91 = (undefined1 (*) [32])
                         (local_120->cstep * uVar82 * local_120->elemsize + (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar243 = vsubps_avx(*pauVar91,auVar202);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar243 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82),
                                        auVar202);
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar358._4_4_ = uVar4;
                  auVar358._0_4_ = uVar4;
                  auVar358._8_4_ = uVar4;
                  auVar358._12_4_ = uVar4;
                  auVar358._16_4_ = uVar4;
                  auVar358._20_4_ = uVar4;
                  auVar358._24_4_ = uVar4;
                  auVar358._28_4_ = uVar4;
                  auVar202 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar82),
                                        auVar358);
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar243 = vsubps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar233._4_4_ = uVar4;
                  auVar233._0_4_ = uVar4;
                  auVar233._8_4_ = uVar4;
                  auVar233._12_4_ = uVar4;
                  auVar233._16_4_ = uVar4;
                  auVar233._20_4_ = uVar4;
                  auVar233._24_4_ = uVar4;
                  auVar233._28_4_ = uVar4;
                  auVar202 = vsubps_avx(auVar233,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar243 = vsubps_avx(*pauVar93,auVar202);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84));
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar243 = vsubps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [32])((long)auVar89 + lVar98));
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [32])((long)auVar89 + lVar98));
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  auVar384._0_4_ = fVar397 * *pfVar96;
                  auVar384._4_4_ = fVar397 * pfVar96[1];
                  auVar384._8_4_ = fVar397 * pfVar96[2];
                  auVar384._12_4_ = fVar397 * pfVar96[3];
                  auVar384._16_4_ = fVar397 * pfVar96[4];
                  auVar384._20_4_ = fVar397 * pfVar96[5];
                  auVar384._28_36_ = in_ZMM1._28_36_;
                  auVar384._24_4_ = fVar397 * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar384._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar384._0_32_;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  auVar383._0_4_ = fVar397 * *pfVar96;
                  auVar383._4_4_ = fVar397 * pfVar96[1];
                  auVar383._8_4_ = fVar397 * pfVar96[2];
                  auVar383._12_4_ = fVar397 * pfVar96[3];
                  auVar383._16_4_ = fVar397 * pfVar96[4];
                  auVar383._20_4_ = fVar397 * pfVar96[5];
                  auVar383._28_36_ = in_ZMM1._28_36_;
                  auVar383._24_4_ = fVar397 * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar383._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar383._0_32_;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar375._0_4_ = fVar397 * *pfVar96;
                      auVar375._4_4_ = fVar397 * pfVar96[1];
                      auVar375._8_4_ = fVar397 * pfVar96[2];
                      auVar375._12_4_ = fVar397 * pfVar96[3];
                      auVar375._16_4_ = fVar397 * pfVar96[4];
                      auVar375._20_4_ = fVar397 * pfVar96[5];
                      auVar375._28_36_ = in_ZMM1._28_36_;
                      auVar375._24_4_ = fVar397 * pfVar96[6];
                      in_ZMM1 = ZEXT3264(auVar375._0_32_);
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar375._0_32_;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                pfVar96 = (float *)((long)pvVar100 + lVar98);
                fVar397 = pfVar96[1];
                fVar426 = pfVar96[2];
                fVar427 = pfVar96[3];
                fVar428 = pfVar96[4];
                fVar429 = pfVar96[5];
                fVar14 = pfVar96[6];
                fVar15 = pfVar96[7];
                pfVar97 = (float *)((long)pvVar95 + lVar98);
                fVar71 = pfVar97[1];
                fVar72 = pfVar97[2];
                fVar73 = pfVar97[3];
                fVar74 = pfVar97[4];
                fVar75 = pfVar97[5];
                fVar76 = pfVar97[6];
                pfVar2 = (float *)((long)pvVar80 + lVar98);
                *pfVar2 = *pfVar96 * *pfVar97;
                pfVar2[1] = fVar397 * fVar71;
                pfVar2[2] = fVar426 * fVar72;
                pfVar2[3] = fVar427 * fVar73;
                pfVar2[4] = fVar428 * fVar74;
                pfVar2[5] = fVar429 * fVar75;
                pfVar2[6] = fVar14 * fVar76;
                pfVar2[7] = fVar15;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *local_110->data;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              auVar381._0_4_ = fVar397 * *pfVar96;
              auVar381._4_4_ = fVar397 * pfVar96[1];
              auVar381._8_4_ = fVar397 * pfVar96[2];
              auVar381._12_4_ = fVar397 * pfVar96[3];
              auVar381._16_4_ = fVar397 * pfVar96[4];
              auVar381._20_4_ = fVar397 * pfVar96[5];
              auVar381._28_36_ = in_ZMM1._28_36_;
              auVar381._24_4_ = fVar397 * pfVar96[6];
              in_ZMM1 = ZEXT3264(auVar381._0_32_);
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar381._0_32_;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pfVar96 = (float *)pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar380._0_4_ = auVar202._0_4_ * *pfVar96;
                    auVar380._4_4_ = auVar202._4_4_ * pfVar96[1];
                    auVar380._8_4_ = auVar202._8_4_ * pfVar96[2];
                    auVar380._12_4_ = auVar202._12_4_ * pfVar96[3];
                    auVar380._16_4_ = auVar202._16_4_ * pfVar96[4];
                    auVar380._20_4_ = auVar202._20_4_ * pfVar96[5];
                    auVar380._28_36_ = in_ZMM1._28_36_;
                    auVar380._24_4_ = auVar202._24_4_ * pfVar96[6];
                    in_ZMM1 = ZEXT3264(auVar380._0_32_);
                    *pauVar86 = auVar380._0_32_;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                auVar377._0_4_ = auVar202._0_4_ * *pfVar96;
                auVar377._4_4_ = auVar202._4_4_ * pfVar96[1];
                auVar377._8_4_ = auVar202._8_4_ * pfVar96[2];
                auVar377._12_4_ = auVar202._12_4_ * pfVar96[3];
                auVar377._16_4_ = auVar202._16_4_ * pfVar96[4];
                auVar377._20_4_ = auVar202._20_4_ * pfVar96[5];
                auVar377._28_36_ = in_ZMM1._28_36_;
                auVar377._24_4_ = auVar202._24_4_ * pfVar96[6];
                in_ZMM1 = ZEXT3264(auVar377._0_32_);
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                     auVar377._0_32_;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar93 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar93;
                      uVar101 = uVar103;
                      do {
                        auVar374._0_4_ = auVar202._0_4_ * *pfVar96;
                        auVar374._4_4_ = auVar202._4_4_ * pfVar96[1];
                        auVar374._8_4_ = auVar202._8_4_ * pfVar96[2];
                        auVar374._12_4_ = auVar202._12_4_ * pfVar96[3];
                        auVar374._16_4_ = auVar202._16_4_ * pfVar96[4];
                        auVar374._20_4_ = auVar202._20_4_ * pfVar96[5];
                        auVar374._28_36_ = in_ZMM1._28_36_;
                        auVar374._24_4_ = auVar202._24_4_ * pfVar96[6];
                        in_ZMM1 = ZEXT3264(auVar374._0_32_);
                        *pauVar86 = auVar374._0_32_;
                        pfVar96 = pfVar96 + 8;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar93 = pauVar93 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar100 + lVar98);
              fVar397 = pfVar96[1];
              fVar426 = pfVar96[2];
              fVar427 = pfVar96[3];
              fVar428 = pfVar96[4];
              fVar429 = pfVar96[5];
              fVar14 = pfVar96[6];
              fVar15 = pfVar96[7];
              pfVar97 = (float *)((long)pvVar95 + lVar98);
              fVar71 = pfVar97[1];
              fVar72 = pfVar97[2];
              fVar73 = pfVar97[3];
              fVar74 = pfVar97[4];
              fVar75 = pfVar97[5];
              fVar76 = pfVar97[6];
              pfVar2 = (float *)((long)pvVar80 + lVar98);
              *pfVar2 = *pfVar96 * *pfVar97;
              pfVar2[1] = fVar397 * fVar71;
              pfVar2[2] = fVar426 * fVar72;
              pfVar2[3] = fVar427 * fVar73;
              pfVar2[4] = fVar428 * fVar74;
              pfVar2[5] = fVar429 * fVar75;
              pfVar2[6] = fVar14 * fVar76;
              pfVar2[7] = fVar15;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)local_120->data;
              pauVar93 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar82 = uVar83;
                  do {
                    auVar394._0_4_ = auVar202._0_4_ * *pfVar96;
                    auVar394._4_4_ = auVar202._4_4_ * pfVar96[1];
                    auVar394._8_4_ = auVar202._8_4_ * pfVar96[2];
                    auVar394._12_4_ = auVar202._12_4_ * pfVar96[3];
                    auVar394._16_4_ = auVar202._16_4_ * pfVar96[4];
                    auVar394._20_4_ = auVar202._20_4_ * pfVar96[5];
                    auVar394._28_36_ = in_ZMM1._28_36_;
                    auVar394._24_4_ = auVar202._24_4_ * pfVar96[6];
                    in_ZMM1 = ZEXT3264(auVar394._0_32_);
                    *pauVar86 = auVar394._0_32_;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar397 = *local_110->data;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              auVar388._0_4_ = fVar397 * *pfVar96;
              auVar388._4_4_ = fVar397 * pfVar96[1];
              auVar388._8_4_ = fVar397 * pfVar96[2];
              auVar388._12_4_ = fVar397 * pfVar96[3];
              auVar388._16_4_ = fVar397 * pfVar96[4];
              auVar388._20_4_ = fVar397 * pfVar96[5];
              auVar388._28_36_ = in_ZMM1._28_36_;
              auVar388._24_4_ = fVar397 * pfVar96[6];
              in_ZMM1 = ZEXT3264(auVar388._0_32_);
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar388._0_32_;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar392._0_4_ = auVar202._0_4_ * *pfVar96;
                    auVar392._4_4_ = auVar202._4_4_ * pfVar96[1];
                    auVar392._8_4_ = auVar202._8_4_ * pfVar96[2];
                    auVar392._12_4_ = auVar202._12_4_ * pfVar96[3];
                    auVar392._16_4_ = auVar202._16_4_ * pfVar96[4];
                    auVar392._20_4_ = auVar202._20_4_ * pfVar96[5];
                    auVar392._28_36_ = in_ZMM1._28_36_;
                    auVar392._24_4_ = auVar202._24_4_ * pfVar96[6];
                    in_ZMM1 = ZEXT3264(auVar392._0_32_);
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar392._0_32_;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar397 = *local_110->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar390._0_4_ = fVar397 * *pfVar96;
                  auVar390._4_4_ = fVar397 * pfVar96[1];
                  auVar390._8_4_ = fVar397 * pfVar96[2];
                  auVar390._12_4_ = fVar397 * pfVar96[3];
                  auVar390._16_4_ = fVar397 * pfVar96[4];
                  auVar390._20_4_ = fVar397 * pfVar96[5];
                  auVar390._28_36_ = in_ZMM1._28_36_;
                  auVar390._24_4_ = fVar397 * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar390._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar390._0_32_;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar96 = (float *)(local_120->cstep * uVar82 * local_120->elemsize +
                                 (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar378._0_4_ = auVar202._0_4_ * *pfVar96;
                    auVar378._4_4_ = auVar202._4_4_ * pfVar96[1];
                    auVar378._8_4_ = auVar202._8_4_ * pfVar96[2];
                    auVar378._12_4_ = auVar202._12_4_ * pfVar96[3];
                    auVar378._16_4_ = auVar202._16_4_ * pfVar96[4];
                    auVar378._20_4_ = auVar202._20_4_ * pfVar96[5];
                    auVar378._28_36_ = in_ZMM1._28_36_;
                    auVar378._24_4_ = auVar202._24_4_ * pfVar96[6];
                    in_ZMM1 = ZEXT3264(auVar378._0_32_);
                    *pauVar86 = auVar378._0_32_;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar373._0_4_ = auVar202._0_4_ * *pfVar96;
                  auVar373._4_4_ = auVar202._4_4_ * pfVar96[1];
                  auVar373._8_4_ = auVar202._8_4_ * pfVar96[2];
                  auVar373._12_4_ = auVar202._12_4_ * pfVar96[3];
                  auVar373._16_4_ = auVar202._16_4_ * pfVar96[4];
                  auVar373._20_4_ = auVar202._20_4_ * pfVar96[5];
                  auVar373._28_36_ = in_ZMM1._28_36_;
                  auVar373._24_4_ = auVar202._24_4_ * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar373._0_32_);
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar373._0_32_;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar82);
                  auVar28._4_4_ = fVar397 * pfVar96[1];
                  auVar28._0_4_ = fVar397 * *pfVar96;
                  auVar28._8_4_ = fVar397 * pfVar96[2];
                  auVar28._12_4_ = fVar397 * pfVar96[3];
                  auVar28._16_4_ = fVar397 * pfVar96[4];
                  auVar28._20_4_ = fVar397 * pfVar96[5];
                  auVar28._24_4_ = fVar397 * pfVar96[6];
                  auVar28._28_4_ = fVar397;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar28;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83);
                  auVar379._0_4_ = auVar202._0_4_ * *pfVar96;
                  auVar379._4_4_ = auVar202._4_4_ * pfVar96[1];
                  auVar379._8_4_ = auVar202._8_4_ * pfVar96[2];
                  auVar379._12_4_ = auVar202._12_4_ * pfVar96[3];
                  auVar379._16_4_ = auVar202._16_4_ * pfVar96[4];
                  auVar379._20_4_ = auVar202._20_4_ * pfVar96[5];
                  auVar379._28_36_ = in_ZMM1._28_36_;
                  auVar379._24_4_ = auVar202._24_4_ * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar379._0_32_);
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar379._0_32_;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar83);
                  auVar37._4_4_ = fVar397 * pfVar96[1];
                  auVar37._0_4_ = fVar397 * *pfVar96;
                  auVar37._8_4_ = fVar397 * pfVar96[2];
                  auVar37._12_4_ = fVar397 * pfVar96[3];
                  auVar37._16_4_ = fVar397 * pfVar96[4];
                  auVar37._20_4_ = fVar397 * pfVar96[5];
                  auVar37._24_4_ = fVar397 * pfVar96[6];
                  auVar37._28_4_ = fVar397;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar37;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar387._0_4_ = auVar202._0_4_ * *pfVar96;
                      auVar387._4_4_ = auVar202._4_4_ * pfVar96[1];
                      auVar387._8_4_ = auVar202._8_4_ * pfVar96[2];
                      auVar387._12_4_ = auVar202._12_4_ * pfVar96[3];
                      auVar387._16_4_ = auVar202._16_4_ * pfVar96[4];
                      auVar387._20_4_ = auVar202._20_4_ * pfVar96[5];
                      auVar387._28_36_ = in_ZMM1._28_36_;
                      auVar387._24_4_ = auVar202._24_4_ * pfVar96[6];
                      in_ZMM1 = ZEXT3264(auVar387._0_32_);
                      *pauVar86 = auVar387._0_32_;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84);
                      pfVar97 = (float *)((long)pvVar100 + lVar98);
                      auVar44._4_4_ = pfVar96[1] * pfVar97[1];
                      auVar44._0_4_ = *pfVar96 * *pfVar97;
                      auVar44._8_4_ = pfVar96[2] * pfVar97[2];
                      auVar44._12_4_ = pfVar96[3] * pfVar97[3];
                      auVar44._16_4_ = pfVar96[4] * pfVar97[4];
                      auVar44._20_4_ = pfVar96[5] * pfVar97[5];
                      auVar44._24_4_ = pfVar96[6] * pfVar97[6];
                      auVar44._28_4_ = pfVar96[7];
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar44;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar393._0_4_ = auVar202._0_4_ * *pfVar96;
                      auVar393._4_4_ = auVar202._4_4_ * pfVar96[1];
                      auVar393._8_4_ = auVar202._8_4_ * pfVar96[2];
                      auVar393._12_4_ = auVar202._12_4_ * pfVar96[3];
                      auVar393._16_4_ = auVar202._16_4_ * pfVar96[4];
                      auVar393._20_4_ = auVar202._20_4_ * pfVar96[5];
                      auVar393._28_36_ = in_ZMM1._28_36_;
                      auVar393._24_4_ = auVar202._24_4_ * pfVar96[6];
                      in_ZMM1 = ZEXT3264(auVar393._0_32_);
                      *pauVar86 = auVar393._0_32_;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)auVar89 + lVar98);
                      pfVar97 = (float *)((long)auVar78 + lVar98);
                      auVar55._4_4_ = pfVar96[1] * pfVar97[1];
                      auVar55._0_4_ = *pfVar96 * *pfVar97;
                      auVar55._8_4_ = pfVar96[2] * pfVar97[2];
                      auVar55._12_4_ = pfVar96[3] * pfVar97[3];
                      auVar55._16_4_ = pfVar96[4] * pfVar97[4];
                      auVar55._20_4_ = pfVar96[5] * pfVar97[5];
                      auVar55._24_4_ = pfVar96[6] * pfVar97[6];
                      auVar55._28_4_ = pfVar96[7];
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar55;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                pfVar96 = (float *)((long)auVar89 + lVar98);
                pfVar97 = (float *)((long)auVar78 + lVar98);
                auVar58._4_4_ = pfVar96[1] * pfVar97[1];
                auVar58._0_4_ = *pfVar96 * *pfVar97;
                auVar58._8_4_ = pfVar96[2] * pfVar97[2];
                auVar58._12_4_ = pfVar96[3] * pfVar97[3];
                auVar58._16_4_ = pfVar96[4] * pfVar97[4];
                auVar58._20_4_ = pfVar96[5] * pfVar97[5];
                auVar58._24_4_ = pfVar96[6] * pfVar97[6];
                auVar58._28_4_ = pfVar96[7];
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar58;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                auVar223._4_4_ = fVar397;
                auVar223._0_4_ = fVar397;
                auVar223._8_4_ = fVar397;
                auVar223._12_4_ = fVar397;
                auVar223._16_4_ = fVar397;
                auVar223._20_4_ = fVar397;
                auVar223._24_4_ = fVar397;
                auVar223._28_4_ = fVar397;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
                  auVar243 = vrcpps_avx(auVar202);
                  auVar410._0_4_ = fVar397 * auVar243._0_4_;
                  auVar410._4_4_ = fVar397 * auVar243._4_4_;
                  auVar410._8_4_ = fVar397 * auVar243._8_4_;
                  auVar410._12_4_ = fVar397 * auVar243._12_4_;
                  auVar410._16_4_ = fVar397 * auVar243._16_4_;
                  auVar410._20_4_ = fVar397 * auVar243._20_4_;
                  auVar410._28_36_ = in_ZMM3._28_36_;
                  auVar410._24_4_ = fVar397 * auVar243._24_4_;
                  auVar36._4_4_ = auVar202._4_4_ * auVar410._4_4_;
                  auVar36._0_4_ = auVar202._0_4_ * auVar410._0_4_;
                  auVar36._8_4_ = auVar202._8_4_ * auVar410._8_4_;
                  auVar36._12_4_ = auVar202._12_4_ * auVar410._12_4_;
                  auVar36._16_4_ = auVar202._16_4_ * auVar410._16_4_;
                  auVar36._20_4_ = auVar202._20_4_ * auVar410._20_4_;
                  auVar36._24_4_ = auVar202._24_4_ * auVar410._24_4_;
                  auVar36._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar223,auVar36);
                  pfVar96 = (float *)((long)pvVar80 + lVar98);
                  *pfVar96 = auVar410._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                  pfVar96[1] = auVar410._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                  pfVar96[2] = auVar410._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                  pfVar96[3] = auVar410._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                  pfVar96[4] = auVar410._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                  pfVar96[5] = auVar410._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                  pfVar96[6] = auVar410._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                  pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                  in_ZMM3 = ZEXT3264(auVar410._0_32_);
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                fVar397 = *pMVar8->data;
                auVar220._4_4_ = fVar397;
                auVar220._0_4_ = fVar397;
                auVar220._8_4_ = fVar397;
                auVar220._12_4_ = fVar397;
                auVar220._16_4_ = fVar397;
                auVar220._20_4_ = fVar397;
                auVar220._24_4_ = fVar397;
                auVar220._28_4_ = fVar397;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
                  auVar243 = vrcpps_avx(auVar202);
                  auVar409._0_4_ = fVar397 * auVar243._0_4_;
                  auVar409._4_4_ = fVar397 * auVar243._4_4_;
                  auVar409._8_4_ = fVar397 * auVar243._8_4_;
                  auVar409._12_4_ = fVar397 * auVar243._12_4_;
                  auVar409._16_4_ = fVar397 * auVar243._16_4_;
                  auVar409._20_4_ = fVar397 * auVar243._20_4_;
                  auVar409._28_36_ = in_ZMM3._28_36_;
                  auVar409._24_4_ = fVar397 * auVar243._24_4_;
                  auVar35._4_4_ = auVar202._4_4_ * auVar409._4_4_;
                  auVar35._0_4_ = auVar202._0_4_ * auVar409._0_4_;
                  auVar35._8_4_ = auVar202._8_4_ * auVar409._8_4_;
                  auVar35._12_4_ = auVar202._12_4_ * auVar409._12_4_;
                  auVar35._16_4_ = auVar202._16_4_ * auVar409._16_4_;
                  auVar35._20_4_ = auVar202._20_4_ * auVar409._20_4_;
                  auVar35._24_4_ = auVar202._24_4_ * auVar409._24_4_;
                  auVar35._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar220,auVar35);
                  pfVar96 = (float *)((long)pvVar80 + lVar98);
                  *pfVar96 = auVar409._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                  pfVar96[1] = auVar409._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                  pfVar96[2] = auVar409._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                  pfVar96[3] = auVar409._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                  pfVar96[4] = auVar409._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                  pfVar96[5] = auVar409._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                  pfVar96[6] = auVar409._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                  pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                  in_ZMM3 = ZEXT3264(auVar409._0_32_);
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                auVar199._4_4_ = fVar397;
                auVar199._0_4_ = fVar397;
                auVar199._8_4_ = fVar397;
                auVar199._12_4_ = fVar397;
                auVar199._16_4_ = fVar397;
                auVar199._20_4_ = fVar397;
                auVar199._24_4_ = fVar397;
                auVar199._28_4_ = fVar397;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    auVar403 = in_ZMM3;
                    iVar79 = (int)local_130;
                    do {
                      auVar202 = *(undefined1 (*) [32])
                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar243 = vrcpps_avx(auVar202);
                      auVar400._0_4_ = fVar397 * auVar243._0_4_;
                      auVar400._4_4_ = fVar397 * auVar243._4_4_;
                      auVar400._8_4_ = fVar397 * auVar243._8_4_;
                      auVar400._12_4_ = fVar397 * auVar243._12_4_;
                      auVar400._16_4_ = fVar397 * auVar243._16_4_;
                      auVar400._20_4_ = fVar397 * auVar243._20_4_;
                      auVar400._28_36_ = auVar403._28_36_;
                      auVar400._24_4_ = fVar397 * auVar243._24_4_;
                      in_ZMM3 = ZEXT3264(auVar400._0_32_);
                      auVar20._4_4_ = auVar202._4_4_ * auVar400._4_4_;
                      auVar20._0_4_ = auVar202._0_4_ * auVar400._0_4_;
                      auVar20._8_4_ = auVar202._8_4_ * auVar400._8_4_;
                      auVar20._12_4_ = auVar202._12_4_ * auVar400._12_4_;
                      auVar20._16_4_ = auVar202._16_4_ * auVar400._16_4_;
                      auVar20._20_4_ = auVar202._20_4_ * auVar400._20_4_;
                      auVar20._24_4_ = auVar202._24_4_ * auVar400._24_4_;
                      auVar20._28_4_ = auVar202._28_4_;
                      auVar202 = vsubps_avx(auVar199,auVar20);
                      auVar352._0_4_ = auVar400._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                      auVar352._4_4_ = auVar400._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                      auVar352._8_4_ = auVar400._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                      auVar352._12_4_ = auVar400._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                      auVar352._16_4_ = auVar400._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                      auVar352._20_4_ = auVar400._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                      auVar352._24_4_ = auVar400._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                      auVar352._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar352;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                      auVar403 = in_ZMM3;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
                auVar243 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
                auVar16 = vrcpps_avx(auVar243);
                auVar418._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                auVar418._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                auVar418._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                auVar418._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                auVar418._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                auVar418._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                auVar418._28_36_ = in_ZMM3._28_36_;
                auVar418._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                auVar49._4_4_ = auVar243._4_4_ * auVar418._4_4_;
                auVar49._0_4_ = auVar243._0_4_ * auVar418._0_4_;
                auVar49._8_4_ = auVar243._8_4_ * auVar418._8_4_;
                auVar49._12_4_ = auVar243._12_4_ * auVar418._12_4_;
                auVar49._16_4_ = auVar243._16_4_ * auVar418._16_4_;
                auVar49._20_4_ = auVar243._20_4_ * auVar418._20_4_;
                auVar49._24_4_ = auVar243._24_4_ * auVar418._24_4_;
                auVar49._28_4_ = auVar243._28_4_;
                auVar202 = vsubps_avx(auVar202,auVar49);
                pfVar96 = (float *)((long)pvVar80 + lVar98);
                *pfVar96 = auVar418._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                pfVar96[1] = auVar418._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                pfVar96[2] = auVar418._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                pfVar96[3] = auVar418._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                pfVar96[4] = auVar418._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                pfVar96[5] = auVar418._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                pfVar96[6] = auVar418._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
                in_ZMM3 = ZEXT3264(auVar418._0_32_);
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            auVar124._0_4_ = 1.0 / *local_110->data;
            auVar124._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar124,auVar124,0);
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              auVar382._0_4_ = auVar134._0_4_ * *pfVar96;
              auVar382._4_4_ = auVar134._4_4_ * pfVar96[1];
              auVar382._8_4_ = auVar134._8_4_ * pfVar96[2];
              auVar382._12_4_ = auVar134._12_4_ * pfVar96[3];
              auVar382._16_4_ = auVar134._0_4_ * pfVar96[4];
              auVar382._20_4_ = auVar134._4_4_ * pfVar96[5];
              auVar382._28_36_ = in_ZMM1._28_36_;
              auVar382._24_4_ = auVar134._8_4_ * pfVar96[6];
              in_ZMM1 = ZEXT3264(auVar382._0_32_);
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar382._0_32_;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pauVar91 = (undefined1 (*) [32])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  auVar403 = in_ZMM3;
                  uVar101 = uVar103;
                  do {
                    auVar243 = *pauVar91;
                    auVar16 = vrcpps_avx(auVar243);
                    auVar407._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                    auVar407._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                    auVar407._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                    auVar407._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                    auVar407._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                    auVar407._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                    auVar407._28_36_ = auVar403._28_36_;
                    auVar407._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                    in_ZMM3 = ZEXT3264(auVar407._0_32_);
                    auVar32._4_4_ = auVar243._4_4_ * auVar407._4_4_;
                    auVar32._0_4_ = auVar243._0_4_ * auVar407._0_4_;
                    auVar32._8_4_ = auVar243._8_4_ * auVar407._8_4_;
                    auVar32._12_4_ = auVar243._12_4_ * auVar407._12_4_;
                    auVar32._16_4_ = auVar243._16_4_ * auVar407._16_4_;
                    auVar32._20_4_ = auVar243._20_4_ * auVar407._20_4_;
                    auVar32._24_4_ = auVar243._24_4_ * auVar407._24_4_;
                    auVar32._28_4_ = auVar243._28_4_;
                    auVar243 = vsubps_avx(auVar202,auVar32);
                    auVar361._0_4_ = auVar407._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                    auVar361._4_4_ = auVar407._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                    auVar361._8_4_ = auVar407._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                    auVar361._12_4_ = auVar407._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                    auVar361._16_4_ = auVar407._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                    auVar361._20_4_ = auVar407._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                    auVar361._24_4_ = auVar407._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                    auVar361._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                    *pauVar86 = auVar361;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                    auVar403 = in_ZMM3;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              auVar403 = in_ZMM3;
              iVar79 = (int)local_130;
              do {
                auVar243 = *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83)
                ;
                auVar16 = vrcpps_avx(auVar243);
                auVar401._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                auVar401._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                auVar401._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                auVar401._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                auVar401._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                auVar401._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                auVar401._28_36_ = auVar403._28_36_;
                auVar401._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                in_ZMM3 = ZEXT3264(auVar401._0_32_);
                auVar22._4_4_ = auVar243._4_4_ * auVar401._4_4_;
                auVar22._0_4_ = auVar243._0_4_ * auVar401._0_4_;
                auVar22._8_4_ = auVar243._8_4_ * auVar401._8_4_;
                auVar22._12_4_ = auVar243._12_4_ * auVar401._12_4_;
                auVar22._16_4_ = auVar243._16_4_ * auVar401._16_4_;
                auVar22._20_4_ = auVar243._20_4_ * auVar401._20_4_;
                auVar22._24_4_ = auVar243._24_4_ * auVar401._24_4_;
                auVar22._28_4_ = auVar243._28_4_;
                auVar243 = vsubps_avx(auVar202,auVar22);
                auVar354._0_4_ = auVar401._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                auVar354._4_4_ = auVar401._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                auVar354._8_4_ = auVar401._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                auVar354._12_4_ = auVar401._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                auVar354._16_4_ = auVar401._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                auVar354._20_4_ = auVar401._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                auVar354._24_4_ = auVar401._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                auVar354._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar354
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
                auVar403 = in_ZMM3;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar93 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar91 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar91;
                      auVar403 = in_ZMM3;
                      uVar101 = uVar103;
                      do {
                        auVar243 = *pauVar93;
                        auVar16 = vrcpps_avx(auVar243);
                        auVar399._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                        auVar399._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                        auVar399._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                        auVar399._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                        auVar399._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                        auVar399._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                        auVar399._28_36_ = auVar403._28_36_;
                        auVar399._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                        in_ZMM3 = ZEXT3264(auVar399._0_32_);
                        auVar19._4_4_ = auVar243._4_4_ * auVar399._4_4_;
                        auVar19._0_4_ = auVar243._0_4_ * auVar399._0_4_;
                        auVar19._8_4_ = auVar243._8_4_ * auVar399._8_4_;
                        auVar19._12_4_ = auVar243._12_4_ * auVar399._12_4_;
                        auVar19._16_4_ = auVar243._16_4_ * auVar399._16_4_;
                        auVar19._20_4_ = auVar243._20_4_ * auVar399._20_4_;
                        auVar19._24_4_ = auVar243._24_4_ * auVar399._24_4_;
                        auVar19._28_4_ = auVar243._28_4_;
                        auVar243 = vsubps_avx(auVar202,auVar19);
                        auVar350._0_4_ = auVar399._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                        auVar350._4_4_ = auVar399._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                        auVar350._8_4_ = auVar399._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                        auVar350._12_4_ = auVar399._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                        auVar350._16_4_ = auVar399._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                        auVar350._20_4_ = auVar399._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                        auVar350._24_4_ = auVar399._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                        auVar350._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                        *pauVar86 = auVar350;
                        pauVar93 = pauVar93 + 1;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                        auVar403 = in_ZMM3;
                      } while (uVar101 != 0);
                    }
                    pauVar91 = pauVar91 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
              auVar243 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
              auVar16 = vrcpps_avx(auVar243);
              auVar402._0_4_ = auVar202._0_4_ * auVar16._0_4_;
              auVar402._4_4_ = auVar202._4_4_ * auVar16._4_4_;
              auVar402._8_4_ = auVar202._8_4_ * auVar16._8_4_;
              auVar402._12_4_ = auVar202._12_4_ * auVar16._12_4_;
              auVar402._16_4_ = auVar202._16_4_ * auVar16._16_4_;
              auVar402._20_4_ = auVar202._20_4_ * auVar16._20_4_;
              auVar402._28_36_ = in_ZMM3._28_36_;
              auVar402._24_4_ = auVar202._24_4_ * auVar16._24_4_;
              auVar24._4_4_ = auVar243._4_4_ * auVar402._4_4_;
              auVar24._0_4_ = auVar243._0_4_ * auVar402._0_4_;
              auVar24._8_4_ = auVar243._8_4_ * auVar402._8_4_;
              auVar24._12_4_ = auVar243._12_4_ * auVar402._12_4_;
              auVar24._16_4_ = auVar243._16_4_ * auVar402._16_4_;
              auVar24._20_4_ = auVar243._20_4_ * auVar402._20_4_;
              auVar24._24_4_ = auVar243._24_4_ * auVar402._24_4_;
              auVar24._28_4_ = auVar243._28_4_;
              auVar202 = vsubps_avx(auVar202,auVar24);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = auVar402._0_4_ + auVar16._0_4_ * auVar202._0_4_;
              pfVar96[1] = auVar402._4_4_ + auVar16._4_4_ * auVar202._4_4_;
              pfVar96[2] = auVar402._8_4_ + auVar16._8_4_ * auVar202._8_4_;
              pfVar96[3] = auVar402._12_4_ + auVar16._12_4_ * auVar202._12_4_;
              pfVar96[4] = auVar402._16_4_ + auVar16._16_4_ * auVar202._16_4_;
              pfVar96[5] = auVar402._20_4_ + auVar16._20_4_ * auVar202._20_4_;
              pfVar96[6] = auVar402._24_4_ + auVar16._24_4_ * auVar202._24_4_;
              pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
              in_ZMM3 = ZEXT3264(auVar402._0_32_);
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)local_120->data;
              pauVar93 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              auVar251._8_4_ = 0x3f800000;
              auVar251._0_8_ = 0x3f8000003f800000;
              auVar251._12_4_ = 0x3f800000;
              auVar251._16_4_ = 0x3f800000;
              auVar251._20_4_ = 0x3f800000;
              auVar251._24_4_ = 0x3f800000;
              auVar251._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  auVar243 = vrcpps_avx(auVar202);
                  fVar397 = auVar243._0_4_;
                  fVar426 = auVar243._4_4_;
                  auVar53._4_4_ = auVar202._4_4_ * fVar426;
                  auVar53._0_4_ = auVar202._0_4_ * fVar397;
                  fVar427 = auVar243._8_4_;
                  auVar53._8_4_ = auVar202._8_4_ * fVar427;
                  fVar428 = auVar243._12_4_;
                  auVar53._12_4_ = auVar202._12_4_ * fVar428;
                  fVar429 = auVar243._16_4_;
                  auVar53._16_4_ = auVar202._16_4_ * fVar429;
                  fVar14 = auVar243._20_4_;
                  auVar53._20_4_ = auVar202._20_4_ * fVar14;
                  fVar15 = auVar243._24_4_;
                  auVar53._24_4_ = auVar202._24_4_ * fVar15;
                  auVar53._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar251,auVar53);
                  uVar82 = uVar83;
                  do {
                    auVar70._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                    auVar70._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                    auVar70._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                    auVar70._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                    auVar70._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                    auVar70._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                    auVar70._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                    auVar70._28_4_ = auVar243._28_4_;
                    *pauVar86 = auVar70;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                    auVar243 = auVar70;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            auVar155._0_4_ = 1.0 / *local_110->data;
            auVar155._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar155,auVar155,0);
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              auVar389._0_4_ = auVar134._0_4_ * *pfVar96;
              auVar389._4_4_ = auVar134._4_4_ * pfVar96[1];
              auVar389._8_4_ = auVar134._8_4_ * pfVar96[2];
              auVar389._12_4_ = auVar134._12_4_ * pfVar96[3];
              auVar389._16_4_ = auVar134._0_4_ * pfVar96[4];
              auVar389._20_4_ = auVar134._4_4_ * pfVar96[5];
              auVar389._28_36_ = in_ZMM1._28_36_;
              auVar389._24_4_ = auVar134._8_4_ * pfVar96[6];
              in_ZMM1 = ZEXT3264(auVar389._0_32_);
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar389._0_32_;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              auVar249._8_4_ = 0x3f800000;
              auVar249._0_8_ = 0x3f8000003f800000;
              auVar249._12_4_ = 0x3f800000;
              auVar249._16_4_ = 0x3f800000;
              auVar249._20_4_ = 0x3f800000;
              auVar249._24_4_ = 0x3f800000;
              auVar249._28_4_ = 0x3f800000;
              do {
                if (0 < (int)local_118) {
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  sVar10 = pMVar9->cstep;
                  sVar11 = local_120->cstep;
                  auVar243 = vrcpps_avx(auVar202);
                  fVar397 = auVar243._0_4_;
                  fVar426 = auVar243._4_4_;
                  auVar47._4_4_ = auVar202._4_4_ * fVar426;
                  auVar47._0_4_ = auVar202._0_4_ * fVar397;
                  fVar427 = auVar243._8_4_;
                  auVar47._8_4_ = auVar202._8_4_ * fVar427;
                  fVar428 = auVar243._12_4_;
                  auVar47._12_4_ = auVar202._12_4_ * fVar428;
                  fVar429 = auVar243._16_4_;
                  auVar47._16_4_ = auVar202._16_4_ * fVar429;
                  fVar14 = auVar243._20_4_;
                  auVar47._20_4_ = auVar202._20_4_ * fVar14;
                  fVar15 = auVar243._24_4_;
                  auVar47._24_4_ = auVar202._24_4_ * fVar15;
                  auVar47._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar249,auVar47);
                  sVar12 = pMVar9->elemsize;
                  pvVar80 = pMVar9->data;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar11 * sVar13 * uVar82);
                    auVar68._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                    auVar68._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                    auVar68._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                    auVar68._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                    auVar68._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                    auVar68._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                    auVar68._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                    auVar68._28_4_ = auVar243._28_4_;
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar12 * uVar82) =
                         auVar68;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                    auVar243 = auVar68;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            auVar156._0_4_ = 1.0 / *local_120[1].data;
            auVar156._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar156,auVar156,0);
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar391._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar391._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar391._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar391._12_4_ = auVar134._12_4_ * pfVar96[3];
                  auVar391._16_4_ = auVar134._0_4_ * pfVar96[4];
                  auVar391._20_4_ = auVar134._4_4_ * pfVar96[5];
                  auVar391._28_36_ = in_ZMM1._28_36_;
                  auVar391._24_4_ = auVar134._8_4_ * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar391._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar391._0_32_;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = 0x3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar205._16_4_ = 0x3f800000;
          auVar205._20_4_ = 0x3f800000;
          auVar205._24_4_ = 0x3f800000;
          auVar205._28_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pfVar96 = (float *)(local_120->cstep * uVar82 * local_120->elemsize +
                                 (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  auVar243 = vrcpps_avx(auVar202);
                  fVar397 = auVar243._0_4_;
                  fVar426 = auVar243._4_4_;
                  auVar25._4_4_ = auVar202._4_4_ * fVar426;
                  auVar25._0_4_ = auVar202._0_4_ * fVar397;
                  fVar427 = auVar243._8_4_;
                  auVar25._8_4_ = auVar202._8_4_ * fVar427;
                  fVar428 = auVar243._12_4_;
                  auVar25._12_4_ = auVar202._12_4_ * fVar428;
                  fVar429 = auVar243._16_4_;
                  auVar25._16_4_ = auVar202._16_4_ * fVar429;
                  fVar14 = auVar243._20_4_;
                  auVar25._20_4_ = auVar202._20_4_ * fVar14;
                  fVar15 = auVar243._24_4_;
                  auVar25._24_4_ = auVar202._24_4_ * fVar15;
                  auVar25._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar205,auVar25);
                  uVar84 = uVar83;
                  do {
                    auVar64._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                    auVar64._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                    auVar64._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                    auVar64._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                    auVar64._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                    auVar64._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                    auVar64._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                    auVar64._28_4_ = auVar243._28_4_;
                    *pauVar86 = auVar64;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                    auVar243 = auVar64;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            auVar197._8_4_ = 0x3f800000;
            auVar197._0_8_ = 0x3f8000003f800000;
            auVar197._12_4_ = 0x3f800000;
            auVar197._16_4_ = 0x3f800000;
            auVar197._20_4_ = 0x3f800000;
            auVar197._24_4_ = 0x3f800000;
            auVar197._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar8->cstep;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                auVar243 = vrcpps_avx(auVar202);
                fVar397 = auVar243._0_4_;
                fVar426 = auVar243._4_4_;
                auVar17._4_4_ = auVar202._4_4_ * fVar426;
                auVar17._0_4_ = auVar202._0_4_ * fVar397;
                fVar427 = auVar243._8_4_;
                auVar17._8_4_ = auVar202._8_4_ * fVar427;
                fVar428 = auVar243._12_4_;
                auVar17._12_4_ = auVar202._12_4_ * fVar428;
                fVar429 = auVar243._16_4_;
                auVar17._16_4_ = auVar202._16_4_ * fVar429;
                fVar14 = auVar243._20_4_;
                auVar17._20_4_ = auVar202._20_4_ * fVar14;
                fVar15 = auVar243._24_4_;
                auVar17._24_4_ = auVar202._24_4_ * fVar15;
                auVar17._28_4_ = auVar202._28_4_;
                auVar202 = vsubps_avx(auVar197,auVar17);
                sVar12 = pMVar8->elemsize;
                pvVar80 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar11 * sVar12 * uVar82);
                  auVar61._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                  auVar61._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                  auVar61._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                  auVar61._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                  auVar61._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                  auVar61._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                  auVar61._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                  auVar61._28_4_ = auVar243._28_4_;
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar10 * sVar13 * uVar82) =
                       auVar61;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                  auVar243 = auVar61;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar134 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar95 + lVar98)));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar82);
                  auVar29._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar29._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar29._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar29._12_4_ = auVar134._12_4_ * pfVar96[3];
                  auVar29._16_4_ = auVar134._0_4_ * pfVar96[4];
                  auVar29._20_4_ = auVar134._4_4_ * pfVar96[5];
                  auVar29._24_4_ = auVar134._8_4_ * pfVar96[6];
                  auVar29._28_4_ = auVar134._12_4_;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar29;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                auVar403 = in_ZMM3;
                iVar79 = (int)local_130;
                do {
                  auVar243 = *(undefined1 (*) [32])
                              ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83);
                  auVar16 = vrcpps_avx(auVar243);
                  auVar406._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                  auVar406._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                  auVar406._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                  auVar406._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                  auVar406._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                  auVar406._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                  auVar406._28_36_ = auVar403._28_36_;
                  auVar406._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                  in_ZMM3 = ZEXT3264(auVar406._0_32_);
                  auVar30._4_4_ = auVar243._4_4_ * auVar406._4_4_;
                  auVar30._0_4_ = auVar243._0_4_ * auVar406._0_4_;
                  auVar30._8_4_ = auVar243._8_4_ * auVar406._8_4_;
                  auVar30._12_4_ = auVar243._12_4_ * auVar406._12_4_;
                  auVar30._16_4_ = auVar243._16_4_ * auVar406._16_4_;
                  auVar30._20_4_ = auVar243._20_4_ * auVar406._20_4_;
                  auVar30._24_4_ = auVar243._24_4_ * auVar406._24_4_;
                  auVar30._28_4_ = auVar243._28_4_;
                  auVar243 = vsubps_avx(auVar202,auVar30);
                  auVar359._0_4_ = auVar406._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                  auVar359._4_4_ = auVar406._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                  auVar359._8_4_ = auVar406._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                  auVar359._12_4_ = auVar406._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                  auVar359._16_4_ = auVar406._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                  auVar359._20_4_ = auVar406._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                  auVar359._24_4_ = auVar406._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                  auVar359._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar359;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                  auVar403 = in_ZMM3;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                auVar403 = in_ZMM3;
                iVar79 = (int)local_130;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  auVar229._4_4_ = fVar397;
                  auVar229._0_4_ = fVar397;
                  auVar229._8_4_ = fVar397;
                  auVar229._12_4_ = fVar397;
                  auVar229._16_4_ = fVar397;
                  auVar229._20_4_ = fVar397;
                  auVar229._24_4_ = fVar397;
                  auVar229._28_4_ = fVar397;
                  auVar202 = *(undefined1 (*) [32])
                              ((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar83);
                  auVar243 = vrcpps_avx(auVar202);
                  auVar411._0_4_ = fVar397 * auVar243._0_4_;
                  auVar411._4_4_ = fVar397 * auVar243._4_4_;
                  auVar411._8_4_ = fVar397 * auVar243._8_4_;
                  auVar411._12_4_ = fVar397 * auVar243._12_4_;
                  auVar411._16_4_ = fVar397 * auVar243._16_4_;
                  auVar411._20_4_ = fVar397 * auVar243._20_4_;
                  auVar411._28_36_ = auVar403._28_36_;
                  auVar411._24_4_ = fVar397 * auVar243._24_4_;
                  in_ZMM3 = ZEXT3264(auVar411._0_32_);
                  auVar38._4_4_ = auVar202._4_4_ * auVar411._4_4_;
                  auVar38._0_4_ = auVar202._0_4_ * auVar411._0_4_;
                  auVar38._8_4_ = auVar202._8_4_ * auVar411._8_4_;
                  auVar38._12_4_ = auVar202._12_4_ * auVar411._12_4_;
                  auVar38._16_4_ = auVar202._16_4_ * auVar411._16_4_;
                  auVar38._20_4_ = auVar202._20_4_ * auVar411._20_4_;
                  auVar38._24_4_ = auVar202._24_4_ * auVar411._24_4_;
                  auVar38._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar229,auVar38);
                  auVar230._0_4_ = auVar411._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                  auVar230._4_4_ = auVar411._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                  auVar230._8_4_ = auVar411._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                  auVar230._12_4_ = auVar411._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                  auVar230._16_4_ = auVar411._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                  auVar230._20_4_ = auVar411._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                  auVar230._24_4_ = auVar411._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                  auVar230._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar230;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                  auVar403 = in_ZMM3;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            auVar235._8_4_ = 0x3f800000;
            auVar235._0_8_ = 0x3f8000003f800000;
            auVar235._12_4_ = 0x3f800000;
            auVar235._16_4_ = 0x3f800000;
            auVar235._20_4_ = 0x3f800000;
            auVar235._24_4_ = 0x3f800000;
            auVar235._28_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    auVar243 = vrcpps_avx(auVar202);
                    fVar397 = auVar243._0_4_;
                    fVar426 = auVar243._4_4_;
                    auVar40._4_4_ = auVar202._4_4_ * fVar426;
                    auVar40._0_4_ = auVar202._0_4_ * fVar397;
                    fVar427 = auVar243._8_4_;
                    auVar40._8_4_ = auVar202._8_4_ * fVar427;
                    fVar428 = auVar243._12_4_;
                    auVar40._12_4_ = auVar202._12_4_ * fVar428;
                    fVar429 = auVar243._16_4_;
                    auVar40._16_4_ = auVar202._16_4_ * fVar429;
                    fVar14 = auVar243._20_4_;
                    auVar40._20_4_ = auVar202._20_4_ * fVar14;
                    fVar15 = auVar243._24_4_;
                    auVar40._24_4_ = auVar202._24_4_ * fVar15;
                    auVar40._28_4_ = auVar202._28_4_;
                    auVar202 = vsubps_avx(auVar235,auVar40);
                    uVar105 = uVar83;
                    do {
                      auVar67._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                      auVar67._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                      auVar67._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                      auVar67._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                      auVar67._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                      auVar67._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                      auVar67._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                      auVar67._28_4_ = auVar243._28_4_;
                      *pauVar86 = auVar67;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                      auVar243 = auVar67;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    auVar403 = in_ZMM3;
                    do {
                      auVar202 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
                      auVar243 = *(undefined1 (*) [32])
                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84);
                      auVar16 = vrcpps_avx(auVar243);
                      auVar415._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                      auVar415._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                      auVar415._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                      auVar415._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                      auVar415._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                      auVar415._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                      auVar415._28_36_ = auVar403._28_36_;
                      auVar415._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar415._0_32_);
                      auVar45._4_4_ = auVar243._4_4_ * auVar415._4_4_;
                      auVar45._0_4_ = auVar243._0_4_ * auVar415._0_4_;
                      auVar45._8_4_ = auVar243._8_4_ * auVar415._8_4_;
                      auVar45._12_4_ = auVar243._12_4_ * auVar415._12_4_;
                      auVar45._16_4_ = auVar243._16_4_ * auVar415._16_4_;
                      auVar45._20_4_ = auVar243._20_4_ * auVar415._20_4_;
                      auVar45._24_4_ = auVar243._24_4_ * auVar415._24_4_;
                      auVar45._28_4_ = auVar243._28_4_;
                      auVar202 = vsubps_avx(auVar202,auVar45);
                      auVar246._0_4_ = auVar415._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                      auVar246._4_4_ = auVar415._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                      auVar246._8_4_ = auVar415._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                      auVar246._12_4_ = auVar415._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                      auVar246._16_4_ = auVar415._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                      auVar246._20_4_ = auVar415._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                      auVar246._24_4_ = auVar415._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                      auVar246._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar246;
                      lVar98 = lVar98 + 0x20;
                      auVar403 = in_ZMM3;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    auVar403 = in_ZMM3;
                    uVar104 = uVar103;
                    do {
                      auVar243 = *pauVar93;
                      auVar16 = vrcpps_avx(auVar243);
                      auVar420._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                      auVar420._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                      auVar420._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                      auVar420._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                      auVar420._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                      auVar420._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                      auVar420._28_36_ = auVar403._28_36_;
                      auVar420._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar420._0_32_);
                      auVar51._4_4_ = auVar243._4_4_ * auVar420._4_4_;
                      auVar51._0_4_ = auVar243._0_4_ * auVar420._0_4_;
                      auVar51._8_4_ = auVar243._8_4_ * auVar420._8_4_;
                      auVar51._12_4_ = auVar243._12_4_ * auVar420._12_4_;
                      auVar51._16_4_ = auVar243._16_4_ * auVar420._16_4_;
                      auVar51._20_4_ = auVar243._20_4_ * auVar420._20_4_;
                      auVar51._24_4_ = auVar243._24_4_ * auVar420._24_4_;
                      auVar51._28_4_ = auVar243._28_4_;
                      auVar243 = vsubps_avx(auVar202,auVar51);
                      auVar369._0_4_ = auVar420._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                      auVar369._4_4_ = auVar420._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                      auVar369._8_4_ = auVar420._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                      auVar369._12_4_ = auVar420._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                      auVar369._16_4_ = auVar420._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                      auVar369._20_4_ = auVar420._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                      auVar369._24_4_ = auVar420._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                      auVar369._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                      *pauVar86 = auVar369;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                      auVar403 = in_ZMM3;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar101 == uVar7) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    auVar403 = in_ZMM3;
                    do {
                      auVar202 = *(undefined1 (*) [32])((long)auVar78 + lVar98);
                      auVar243 = *(undefined1 (*) [32])((long)auVar89 + lVar98);
                      auVar16 = vrcpps_avx(auVar243);
                      auVar422._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                      auVar422._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                      auVar422._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                      auVar422._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                      auVar422._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                      auVar422._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                      auVar422._28_36_ = auVar403._28_36_;
                      auVar422._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar422._0_32_);
                      auVar56._4_4_ = auVar243._4_4_ * auVar422._4_4_;
                      auVar56._0_4_ = auVar243._0_4_ * auVar422._0_4_;
                      auVar56._8_4_ = auVar243._8_4_ * auVar422._8_4_;
                      auVar56._12_4_ = auVar243._12_4_ * auVar422._12_4_;
                      auVar56._16_4_ = auVar243._16_4_ * auVar422._16_4_;
                      auVar56._20_4_ = auVar243._20_4_ * auVar422._20_4_;
                      auVar56._24_4_ = auVar243._24_4_ * auVar422._24_4_;
                      auVar56._28_4_ = auVar243._28_4_;
                      auVar202 = vsubps_avx(auVar202,auVar56);
                      auVar252._0_4_ = auVar422._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                      auVar252._4_4_ = auVar422._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                      auVar252._8_4_ = auVar422._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                      auVar252._12_4_ = auVar422._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                      auVar252._16_4_ = auVar422._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                      auVar252._20_4_ = auVar422._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                      auVar252._24_4_ = auVar422._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                      auVar252._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar252;
                      lVar98 = lVar98 + 0x20;
                      auVar403 = in_ZMM3;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              auVar403 = in_ZMM3;
              iVar81 = (int)local_118;
              do {
                auVar202 = *(undefined1 (*) [32])((long)auVar78 + lVar98);
                auVar243 = *(undefined1 (*) [32])((long)auVar89 + lVar98);
                auVar16 = vrcpps_avx(auVar243);
                auVar424._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                auVar424._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                auVar424._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                auVar424._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                auVar424._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                auVar424._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                auVar424._28_36_ = auVar403._28_36_;
                auVar424._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                in_ZMM3 = ZEXT3264(auVar424._0_32_);
                auVar59._4_4_ = auVar243._4_4_ * auVar424._4_4_;
                auVar59._0_4_ = auVar243._0_4_ * auVar424._0_4_;
                auVar59._8_4_ = auVar243._8_4_ * auVar424._8_4_;
                auVar59._12_4_ = auVar243._12_4_ * auVar424._12_4_;
                auVar59._16_4_ = auVar243._16_4_ * auVar424._16_4_;
                auVar59._20_4_ = auVar243._20_4_ * auVar424._20_4_;
                auVar59._24_4_ = auVar243._24_4_ * auVar424._24_4_;
                auVar59._28_4_ = auVar243._28_4_;
                auVar202 = vsubps_avx(auVar202,auVar59);
                auVar256._0_4_ = auVar424._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                auVar256._4_4_ = auVar424._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                auVar256._8_4_ = auVar424._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                auVar256._12_4_ = auVar424._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                auVar256._16_4_ = auVar424._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                auVar256._20_4_ = auVar424._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                auVar256._24_4_ = auVar424._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                auVar256._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar256;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
                auVar403 = in_ZMM3;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar219._4_4_ = uVar4;
                auVar219._0_4_ = uVar4;
                auVar219._8_4_ = uVar4;
                auVar219._12_4_ = uVar4;
                auVar219._16_4_ = uVar4;
                auVar219._20_4_ = uVar4;
                auVar219._24_4_ = uVar4;
                auVar219._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vmaxps_avx(auVar219,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar218._4_4_ = uVar4;
                auVar218._0_4_ = uVar4;
                auVar218._8_4_ = uVar4;
                auVar218._12_4_ = uVar4;
                auVar218._16_4_ = uVar4;
                auVar218._20_4_ = uVar4;
                auVar218._24_4_ = uVar4;
                auVar218._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vmaxps_avx(auVar218,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar198._4_4_ = uVar4;
                auVar198._0_4_ = uVar4;
                auVar198._8_4_ = uVar4;
                auVar198._12_4_ = uVar4;
                auVar198._16_4_ = uVar4;
                auVar198._20_4_ = uVar4;
                auVar198._24_4_ = uVar4;
                auVar198._28_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      auVar202 = vmaxps_avx(auVar198,*(undefined1 (*) [32])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar202;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [32])((long)pvVar100 + lVar98));
                *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar212._4_4_ = uVar4;
            auVar212._0_4_ = uVar4;
            auVar212._8_4_ = uVar4;
            auVar212._12_4_ = uVar4;
            auVar212._16_4_ = uVar4;
            auVar212._20_4_ = uVar4;
            auVar212._24_4_ = uVar4;
            auVar212._28_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar202 = vmaxps_avx(auVar212,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pauVar91 = (undefined1 (*) [32])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar243 = vmaxps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                auVar243 = vmaxps_avx(auVar202,*(undefined1 (*) [32])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar243
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar93 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar91 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar91;
                      uVar101 = uVar103;
                      do {
                        auVar243 = vmaxps_avx(auVar202,*pauVar93);
                        *pauVar86 = auVar243;
                        pauVar93 = pauVar93 + 1;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar91 = pauVar91 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar93 = (undefined1 (*) [32])local_120->data;
              pauVar91 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar91;
                  uVar82 = uVar83;
                  do {
                    auVar243 = vmaxps_avx(auVar202,*pauVar93);
                    *pauVar86 = auVar243;
                    pauVar93 = pauVar93 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar91 = pauVar91 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar236._4_4_ = uVar4;
            auVar236._0_4_ = uVar4;
            auVar236._8_4_ = uVar4;
            auVar236._12_4_ = uVar4;
            auVar236._16_4_ = uVar4;
            auVar236._20_4_ = uVar4;
            auVar236._24_4_ = uVar4;
            auVar236._28_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar202 = vmaxps_avx(auVar236,*(undefined1 (*) [32])((long)pvVar80 + lVar98));
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    auVar243 = vmaxps_avx(auVar202,*(undefined1 (*) [32])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar243;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar237._4_4_ = uVar4;
            auVar237._0_4_ = uVar4;
            auVar237._8_4_ = uVar4;
            auVar237._12_4_ = uVar4;
            auVar237._16_4_ = uVar4;
            auVar237._20_4_ = uVar4;
            auVar237._24_4_ = uVar4;
            auVar237._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar202 = vmaxps_avx(auVar237,*(undefined1 (*) [32])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar91 = (undefined1 (*) [32])
                         (local_120->cstep * uVar82 * local_120->elemsize + (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar243 = vmaxps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar243 = vmaxps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar206._4_4_ = uVar4;
                  auVar206._0_4_ = uVar4;
                  auVar206._8_4_ = uVar4;
                  auVar206._12_4_ = uVar4;
                  auVar206._16_4_ = uVar4;
                  auVar206._20_4_ = uVar4;
                  auVar206._24_4_ = uVar4;
                  auVar206._28_4_ = uVar4;
                  auVar202 = vmaxps_avx(auVar206,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar243 = vmaxps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar228._4_4_ = uVar4;
                  auVar228._0_4_ = uVar4;
                  auVar228._8_4_ = uVar4;
                  auVar228._12_4_ = uVar4;
                  auVar228._16_4_ = uVar4;
                  auVar228._20_4_ = uVar4;
                  auVar228._24_4_ = uVar4;
                  auVar228._28_4_ = uVar4;
                  auVar202 = vmaxps_avx(auVar228,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar243 = vmaxps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar202 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84));
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar243 = vmaxps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar202 = vmaxps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [32])((long)auVar89 + lVar98));
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                auVar202 = vmaxps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [32])((long)auVar89 + lVar98));
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar227._4_4_ = uVar4;
                auVar227._0_4_ = uVar4;
                auVar227._8_4_ = uVar4;
                auVar227._12_4_ = uVar4;
                auVar227._16_4_ = uVar4;
                auVar227._20_4_ = uVar4;
                auVar227._24_4_ = uVar4;
                auVar227._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vminps_avx(auVar227,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar226._4_4_ = uVar4;
                auVar226._0_4_ = uVar4;
                auVar226._8_4_ = uVar4;
                auVar226._12_4_ = uVar4;
                auVar226._16_4_ = uVar4;
                auVar226._20_4_ = uVar4;
                auVar226._24_4_ = uVar4;
                auVar226._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vminps_avx(auVar226,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar203._4_4_ = uVar4;
                auVar203._0_4_ = uVar4;
                auVar203._8_4_ = uVar4;
                auVar203._12_4_ = uVar4;
                auVar203._16_4_ = uVar4;
                auVar203._20_4_ = uVar4;
                auVar203._24_4_ = uVar4;
                auVar203._28_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      auVar202 = vminps_avx(auVar203,*(undefined1 (*) [32])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar202;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = vminps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [32])((long)pvVar100 + lVar98));
                *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar216._4_4_ = uVar4;
            auVar216._0_4_ = uVar4;
            auVar216._8_4_ = uVar4;
            auVar216._12_4_ = uVar4;
            auVar216._16_4_ = uVar4;
            auVar216._20_4_ = uVar4;
            auVar216._24_4_ = uVar4;
            auVar216._28_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar202 = vminps_avx(auVar216,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pauVar91 = (undefined1 (*) [32])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar243 = vminps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                auVar243 = vminps_avx(auVar202,*(undefined1 (*) [32])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar243
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar93 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar91 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar91;
                      uVar101 = uVar103;
                      do {
                        auVar243 = vminps_avx(auVar202,*pauVar93);
                        *pauVar86 = auVar243;
                        pauVar93 = pauVar93 + 1;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar91 = pauVar91 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = vminps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar93 = (undefined1 (*) [32])local_120->data;
              pauVar91 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar91;
                  uVar82 = uVar83;
                  do {
                    auVar243 = vminps_avx(auVar202,*pauVar93);
                    *pauVar86 = auVar243;
                    pauVar93 = pauVar93 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar91 = pauVar91 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar241._4_4_ = uVar4;
            auVar241._0_4_ = uVar4;
            auVar241._8_4_ = uVar4;
            auVar241._12_4_ = uVar4;
            auVar241._16_4_ = uVar4;
            auVar241._20_4_ = uVar4;
            auVar241._24_4_ = uVar4;
            auVar241._28_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar202 = vminps_avx(auVar241,*(undefined1 (*) [32])((long)pvVar80 + lVar98));
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    auVar243 = vminps_avx(auVar202,*(undefined1 (*) [32])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar243;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar244._4_4_ = uVar4;
            auVar244._0_4_ = uVar4;
            auVar244._8_4_ = uVar4;
            auVar244._12_4_ = uVar4;
            auVar244._16_4_ = uVar4;
            auVar244._20_4_ = uVar4;
            auVar244._24_4_ = uVar4;
            auVar244._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar202 = vminps_avx(auVar244,*(undefined1 (*) [32])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar91 = (undefined1 (*) [32])
                         (local_120->cstep * uVar82 * local_120->elemsize + (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar243 = vminps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar243 = vminps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar209._4_4_ = uVar4;
                  auVar209._0_4_ = uVar4;
                  auVar209._8_4_ = uVar4;
                  auVar209._12_4_ = uVar4;
                  auVar209._16_4_ = uVar4;
                  auVar209._20_4_ = uVar4;
                  auVar209._24_4_ = uVar4;
                  auVar209._28_4_ = uVar4;
                  auVar202 = vminps_avx(auVar209,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar243 = vminps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar234._4_4_ = uVar4;
                  auVar234._0_4_ = uVar4;
                  auVar234._8_4_ = uVar4;
                  auVar234._12_4_ = uVar4;
                  auVar234._16_4_ = uVar4;
                  auVar234._20_4_ = uVar4;
                  auVar234._24_4_ = uVar4;
                  auVar234._28_4_ = uVar4;
                  auVar202 = vminps_avx(auVar234,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar243 = vminps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar202 = vminps_avx(*(undefined1 (*) [32])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [32])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84));
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar243 = vminps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar202 = vminps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [32])((long)auVar89 + lVar98));
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                auVar202 = vminps_avx(*(undefined1 (*) [32])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [32])((long)auVar89 + lVar98));
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar104 = pMVar8->w;
      local_100 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      iVar79 = pMVar8->elempack;
      uVar103 = pMVar8[1].w;
      local_118 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      local_130 = (void *)(ulong)uVar102;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      sVar11 = pMVar8[1].elemsize;
      iVar81 = pMVar8[1].elempack;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        local_110 = (pointer)CONCAT44(local_110._4_4_,uVar102 * uVar103);
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar103,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              fStack_d0 = (float)local_e0._4_4_;
              fStack_cc = (float)local_e0._4_4_;
              fStack_c8 = (float)local_e0._4_4_;
              fStack_c4 = (float)local_e0._4_4_;
              if ((int)local_118 < 1) {
                return 0;
              }
              pvVar95 = local_110->data;
              lVar98 = 0;
              uVar82 = local_118;
              do {
                pafVar106 = (__m256 *)((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)*pafVar106;
                uVar270 = *(undefined8 *)(*pafVar106 + 2);
                uVar273 = *(undefined8 *)(*pafVar106 + 4);
                uVar274 = *(undefined8 *)(*pafVar106 + 6);
                local_80 = *pafVar106;
                binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
                *puVar90 = uVar271;
                puVar90[1] = uVar270;
                puVar90[2] = uVar273;
                puVar90[3] = uVar274;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              fStack_d0 = (float)local_e0._4_4_;
              fStack_cc = (float)local_e0._4_4_;
              fStack_c8 = (float)local_e0._4_4_;
              fStack_c4 = (float)local_e0._4_4_;
              if ((int)local_110 < 1) {
                return 0;
              }
              pvVar95 = pMVar1->data;
              lVar98 = 0;
              iVar79 = (int)local_110;
              do {
                pafVar106 = (__m256 *)((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)*pafVar106;
                uVar270 = *(undefined8 *)(*pafVar106 + 2);
                uVar273 = *(undefined8 *)(*pafVar106 + 4);
                uVar274 = *(undefined8 *)(*pafVar106 + 6);
                local_80 = *pafVar106;
                binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
                *puVar90 = uVar271;
                puVar90[1] = uVar270;
                puVar90[2] = uVar273;
                puVar90[3] = uVar274;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              fVar397 = *local_120->data;
              local_e0._4_4_ = fVar397;
              local_e0._0_4_ = fVar397;
              fStack_d8 = fVar397;
              fStack_d4 = fVar397;
              fStack_d0 = fVar397;
              fStack_cc = fVar397;
              fStack_c8 = fVar397;
              fStack_c4 = fVar397;
              if ((int)uVar101 < 1) {
                return 0;
              }
              local_130 = (void *)0x0;
              local_f0 = uVar82;
              do {
                if (0 < (int)local_110) {
                  lVar98 = local_108->cstep * local_108->elemsize * (long)local_130;
                  pvVar80 = local_108->data;
                  local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize * (long)local_130
                                      + (long)local_120[1].data);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    local_80 = *(__m256 *)((long)local_128 + lVar110);
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)pvVar80 + lVar110 + lVar98) = local_80;
                    lVar110 = lVar110 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 == 1 && pMVar8[1].w == 1) {
            local_e0._4_4_ = *pMVar1->data;
            local_e0._0_4_ = local_e0._4_4_;
            fStack_d8 = (float)local_e0._4_4_;
            fStack_d4 = (float)local_e0._4_4_;
            fStack_d0 = (float)local_e0._4_4_;
            fStack_cc = (float)local_e0._4_4_;
            fStack_c8 = (float)local_e0._4_4_;
            fStack_c4 = (float)local_e0._4_4_;
            if (0 < (int)local_100) {
              pvVar95 = pMVar8->data;
              lVar98 = 0;
              uVar82 = local_100;
              do {
                pafVar106 = (__m256 *)((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)*pafVar106;
                uVar270 = *(undefined8 *)(*pafVar106 + 2);
                uVar273 = *(undefined8 *)(*pafVar106 + 4);
                uVar274 = *(undefined8 *)(*pafVar106 + 6);
                local_80 = *pafVar106;
                binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
                *puVar90 = uVar271;
                puVar90[1] = uVar270;
                puVar90[2] = uVar273;
                puVar90[3] = uVar274;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar104;
              } while (uVar104 != 0);
            }
          }
          else {
            if ((int)local_100 < 1) {
              return 0;
            }
            pvVar95 = pMVar8->data;
            pvVar100 = pMVar8[1].data;
            lVar98 = 0;
            uVar82 = local_100;
            do {
              _local_e0 = *(__m256 *)((long)pvVar95 + lVar98);
              pafVar106 = (__m256 *)((long)pvVar100 + lVar98);
              uVar271 = *(undefined8 *)*pafVar106;
              uVar270 = *(undefined8 *)(*pafVar106 + 2);
              uVar273 = *(undefined8 *)(*pafVar106 + 4);
              uVar274 = *(undefined8 *)(*pafVar106 + 6);
              local_80 = *pafVar106;
              binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
              puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
              *puVar90 = uVar271;
              puVar90[1] = uVar270;
              puVar90[2] = uVar273;
              puVar90[3] = uVar274;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar82 - 1;
              uVar82 = (ulong)uVar104;
            } while (uVar104 != 0);
          }
        }
        else {
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
            puVar90 = (undefined8 *)pMVar9->data;
            if (puVar90 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                local_140 = (__m256 *)pMVar8->data;
                pafVar106 = (__m256 *)pMVar8[1].data;
                local_128 = (void *)((ulong)local_128._4_4_ << 0x20);
                do {
                  _local_e0 = *local_140;
                  uVar82 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      uVar271 = *(undefined8 *)*pafVar106;
                      uVar270 = *(undefined8 *)(*pafVar106 + 2);
                      uVar273 = *(undefined8 *)(*pafVar106 + 4);
                      uVar274 = *(undefined8 *)(*pafVar106 + 6);
                      local_80 = *pafVar106;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *puVar90 = uVar271;
                      puVar90[1] = uVar270;
                      puVar90[2] = uVar273;
                      puVar90[3] = uVar274;
                      pafVar106 = pafVar106 + 1;
                      puVar90 = puVar90 + 4;
                      uVar104 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar104;
                    } while (uVar104 != 0);
                  }
                  local_140 = local_140 + 1;
                  iVar79 = (int)local_128 + 1;
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                } while (iVar79 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)uVar101) {
                local_130 = (void *)0x0;
                local_f0 = uVar82;
                do {
                  _local_e0 = *(__m256 *)((long)local_120->data + (long)local_130 * 0x20);
                  if (0 < (int)local_110) {
                    lVar110 = local_108->cstep * local_108->elemsize * (long)local_130;
                    pvVar80 = local_108->data;
                    local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize *
                                         (long)local_130 + (long)local_120[1].data);
                    lVar98 = 0;
                    iVar79 = (int)local_110;
                    do {
                      pafVar106 = (__m256 *)((long)local_128 + lVar98);
                      uVar271 = *(undefined8 *)*pafVar106;
                      uVar270 = *(undefined8 *)(*pafVar106 + 2);
                      uVar273 = *(undefined8 *)(*pafVar106 + 4);
                      uVar274 = *(undefined8 *)(*pafVar106 + 6);
                      local_80 = *pafVar106;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      puVar90 = (undefined8 *)((long)pvVar80 + lVar98 + lVar110);
                      *puVar90 = uVar271;
                      puVar90[1] = uVar270;
                      puVar90[2] = uVar273;
                      puVar90[3] = uVar274;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  local_130 = (void *)((long)local_130 + 1);
                } while (local_130 != (void *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_f8 = (ulong)uVar6;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        local_110 = (pointer)CONCAT44(local_110._4_4_,uVar102 * uVar103);
        uVar7 = pMVar8->c;
        local_e8 = (ulong)uVar7;
        local_f0 = CONCAT44(local_f0._4_4_,uVar6 * uVar104);
        if (pMVar8[1].dims != 3) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep == 0) {
            return -100;
          }
          iVar79 = (int)local_e8;
          if (local_120[1].dims != 1) {
            if (local_120[1].dims != 2) {
              return 0;
            }
            if (0 < iVar79) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  pafVar107 = (__m256 *)
                              (local_108->cstep * (long)local_130 * local_108->elemsize +
                              (long)local_108->data);
                  pafVar106 = (__m256 *)
                              ((long)local_120[1].w * (long)local_130 * local_120[1].elemsize +
                              (long)local_120[1].data);
                  pafVar108 = (__m256 *)
                              (local_120->cstep * (long)local_130 * local_120->elemsize +
                              (long)local_120->data);
                  iVar79 = 0;
                  do {
                    local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                    _local_e0 = *pafVar106;
                    uVar82 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        local_80 = *pafVar108;
                        binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                        *pafVar107 = local_80;
                        pafVar108 = pafVar108 + 1;
                        pafVar107 = pafVar107 + 1;
                        uVar104 = (int)uVar82 - 1;
                        uVar82 = (ulong)uVar104;
                      } while (uVar104 != 0);
                    }
                    pafVar106 = pafVar106 + 1;
                    iVar79 = (int)local_128 + 1;
                  } while (iVar79 != (int)local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < iVar79) {
              local_130 = (void *)0x0;
              do {
                pvVar80 = local_120->data;
                _local_e0 = *(__m256 *)((long)local_120[1].data + (long)local_130 * 0x20);
                if (0 < (int)(uint)local_f0) {
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * (long)local_130 +
                                      (long)local_108->data);
                  lVar98 = local_120->cstep * local_120->elemsize * (long)local_130;
                  lVar110 = 0;
                  iVar79 = (uint)local_f0;
                  do {
                    pafVar106 = (__m256 *)((long)pvVar80 + lVar110 + lVar98);
                    uVar271 = *(undefined8 *)*pafVar106;
                    uVar270 = *(undefined8 *)(*pafVar106 + 2);
                    uVar273 = *(undefined8 *)(*pafVar106 + 4);
                    uVar274 = *(undefined8 *)(*pafVar106 + 6);
                    local_80 = *pafVar106;
                    binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                    puVar90 = (undefined8 *)((long)local_128 + lVar110);
                    *puVar90 = uVar271;
                    puVar90[1] = uVar270;
                    puVar90[2] = uVar273;
                    puVar90[3] = uVar274;
                    lVar110 = lVar110 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          fVar397 = *pMVar1->data;
          local_e0._4_4_ = fVar397;
          local_e0._0_4_ = fVar397;
          fStack_d8 = fVar397;
          fStack_d4 = fVar397;
          fStack_d0 = fVar397;
          fStack_cc = fVar397;
          fStack_c8 = fVar397;
          fStack_c4 = fVar397;
          if (iVar79 < 1) {
            return 0;
          }
          local_130 = (void *)0x0;
          do {
            if (0 < (int)(uint)local_f0) {
              lVar98 = local_108->cstep * local_108->elemsize * (long)local_130;
              pvVar80 = local_108->data;
              local_128 = (void *)(local_120->cstep * local_120->elemsize * (long)local_130 +
                                  (long)local_120->data);
              lVar110 = 0;
              iVar79 = (uint)local_f0;
              do {
                local_80 = *(__m256 *)((long)local_128 + lVar110);
                binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                *(__m256 *)((long)pvVar80 + lVar110 + lVar98) = local_80;
                lVar110 = lVar110 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            local_130 = (void *)((long)local_130 + 1);
          } while (local_130 != (void *)local_e8);
          return 0;
        }
        if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_e8) {
              local_130 = (void *)0x0;
              do {
                pvVar80 = local_120->data;
                _local_e0 = *(__m256 *)
                             ((long)local_120[1].data +
                             local_120[1].cstep * (long)local_130 * local_120[1].elemsize);
                if (0 < (int)(uint)local_f0) {
                  lVar98 = local_120->cstep * local_120->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar110 = 0;
                  iVar79 = (uint)local_f0;
                  do {
                    pafVar106 = (__m256 *)((long)pvVar80 + lVar110 + lVar98);
                    uVar271 = *(undefined8 *)*pafVar106;
                    uVar270 = *(undefined8 *)(*pafVar106 + 2);
                    uVar273 = *(undefined8 *)(*pafVar106 + 4);
                    uVar274 = *(undefined8 *)(*pafVar106 + 6);
                    local_80 = *pafVar106;
                    binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                    puVar90 = (undefined8 *)((long)local_128 + lVar110);
                    *puVar90 = uVar271;
                    puVar90[1] = uVar270;
                    puVar90[2] = uVar273;
                    puVar90[3] = uVar274;
                    lVar110 = lVar110 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_e8);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_e8) {
              local_118 = 0;
              do {
                if (0 < (int)(uint)local_f0) {
                  lVar98 = local_120->cstep * local_120->elemsize * local_118;
                  pvVar80 = local_120->data;
                  local_130 = local_120[1].data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar110 = 0;
                  iVar79 = (uint)local_f0;
                  do {
                    _local_e0 = *(__m256 *)((long)pvVar80 + lVar110 * 8 + lVar98);
                    fVar397 = *(float *)((long)local_130 + lVar110);
                    local_80[1] = fVar397;
                    local_80[0] = fVar397;
                    local_80[2] = fVar397;
                    local_80[3] = fVar397;
                    local_80[4] = fVar397;
                    local_80[5] = fVar397;
                    local_80[6] = fVar397;
                    local_80[7] = fVar397;
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)local_128 + lVar110 * 8) = local_80;
                    lVar110 = lVar110 + 4;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_e8);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar101) {
              local_130 = (void *)0x0;
              local_f0 = uVar82;
              do {
                pvVar80 = local_120[1].data;
                _local_e0 = *(__m256 *)
                             ((long)local_120->data +
                             local_120->cstep * (long)local_130 * local_120->elemsize);
                if (0 < (int)local_110) {
                  lVar98 = local_120[1].cstep * local_120[1].elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    pafVar106 = (__m256 *)((long)pvVar80 + lVar110 + lVar98);
                    uVar271 = *(undefined8 *)*pafVar106;
                    uVar270 = *(undefined8 *)(*pafVar106 + 2);
                    uVar273 = *(undefined8 *)(*pafVar106 + 4);
                    uVar274 = *(undefined8 *)(*pafVar106 + 6);
                    local_80 = *pafVar106;
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    puVar90 = (undefined8 *)((long)local_128 + lVar110);
                    *puVar90 = uVar271;
                    puVar90[1] = uVar270;
                    puVar90[2] = uVar273;
                    puVar90[3] = uVar274;
                    lVar110 = lVar110 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar103 == uVar104) && (iVar79 == 1 && (uVar7 == 1 && uVar6 == uVar102))) {
          local_f0 = uVar82;
          Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_118 = 0;
              do {
                if (0 < (int)local_110) {
                  lVar98 = local_120[1].cstep * local_120[1].elemsize * local_118;
                  pvVar80 = local_120[1].data;
                  local_130 = local_120->data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    local_e0._4_4_ = *(float *)((long)local_130 + lVar110);
                    local_e0._0_4_ = local_e0._4_4_;
                    fStack_d8 = (float)local_e0._4_4_;
                    fStack_d4 = (float)local_e0._4_4_;
                    fStack_d0 = (float)local_e0._4_4_;
                    fStack_cc = (float)local_e0._4_4_;
                    fStack_c8 = (float)local_e0._4_4_;
                    fStack_c4 = (float)local_e0._4_4_;
                    local_80 = *(__m256 *)((long)pvVar80 + lVar110 * 8 + lVar98);
                    binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                    *(__m256 *)((long)local_128 + lVar110 * 8) = local_80;
                    lVar110 = lVar110 + 4;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar101) {
              local_130 = (void *)0x0;
              local_f0 = uVar82;
              do {
                if (0 < (int)local_f8) {
                  local_128 = (void *)(local_120[1].cstep * (long)local_130 * local_120[1].elemsize
                                      + (long)local_120[1].data);
                  pafVar106 = (__m256 *)
                              (local_108->cstep * (long)local_130 * local_108->elemsize +
                              (long)local_108->data);
                  pafVar108 = (__m256 *)
                              (local_120->cstep * (long)local_130 * local_120->elemsize +
                              (long)local_120->data);
                  uVar82 = 0;
                  do {
                    _local_e0 = *(__m256 *)((long)local_128 + uVar82 * 0x20);
                    uVar83 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        local_80 = *pafVar108;
                        binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                        *pafVar106 = local_80;
                        pafVar108 = pafVar108 + 1;
                        pafVar106 = pafVar106 + 1;
                        uVar104 = (int)uVar83 - 1;
                        uVar83 = (ulong)uVar104;
                      } while (uVar104 != 0);
                    }
                    uVar82 = uVar82 + 1;
                  } while (uVar82 != local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        uVar85 = uVar103 ^ uVar104;
        local_60 = CONCAT44(local_60._4_4_,uVar85);
        if (((uVar102 != 1 || uVar85 != 0) || uVar101 != uVar7) || uVar6 == 1) {
          if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
            local_f0 = uVar82;
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)(uint)local_f0) {
                local_f8 = 0;
                pvVar80 = local_130;
                do {
                  if (0 < (int)pvVar80) {
                    local_128 = (void *)(local_120->cstep * local_f8 * local_120->elemsize +
                                        (long)local_120->data);
                    pafVar108 = (__m256 *)
                                (local_108->cstep * local_f8 * local_108->elemsize +
                                (long)local_108->data);
                    pafVar106 = (__m256 *)
                                (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                                (long)local_120[1].data);
                    uVar82 = 0;
                    do {
                      _local_e0 = *(__m256 *)((long)local_128 + uVar82 * 0x20);
                      uVar83 = local_118 & 0xffffffff;
                      if (0 < (int)local_118) {
                        do {
                          local_80 = *pafVar106;
                          binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                          *pafVar108 = local_80;
                          pafVar106 = pafVar106 + 1;
                          pafVar108 = pafVar108 + 1;
                          uVar104 = (int)uVar83 - 1;
                          uVar83 = (ulong)uVar104;
                        } while (uVar104 != 0);
                      }
                      uVar82 = uVar82 + 1;
                      pvVar80 = local_130;
                    } while ((void *)uVar82 != local_130);
                  }
                  local_f8 = local_f8 + 1;
                } while (local_f8 != local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (((uVar85 == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
            local_110 = pMVar1;
            local_f0 = uVar82;
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                lVar98 = local_118 << 5;
                local_100 = 0;
                local_f8 = lVar98;
                do {
                  iVar79 = (int)local_100;
                  Mat::channel((Mat *)local_e0,local_120,iVar79);
                  auVar78 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar79);
                  auVar89 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar79);
                  auVar109 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)local_130) {
                    iVar79 = 0;
                    pvVar80 = local_130;
                    do {
                      if (0 < (int)local_118) {
                        local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                        lVar110 = 0;
                        do {
                          _local_e0 = *(__m256 *)((long)auVar78 + lVar110);
                          local_80 = *(__m256 *)((long)auVar89 + lVar110);
                          afVar254 = local_80;
                          binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                          *(__m256 *)((long)auVar109 + lVar110) = afVar254;
                          lVar110 = lVar110 + 0x20;
                        } while (lVar98 != lVar110);
                        auVar109 = (undefined1  [8])((long)auVar109 + lVar110);
                        auVar89 = (undefined1  [8])((long)auVar89 + lVar110);
                        pvVar80 = local_130;
                        iVar79 = (int)local_128;
                      }
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != (int)pvVar80);
                  }
                  uVar104 = (int)local_100 + 1;
                  local_100 = (ulong)uVar104;
                } while (uVar104 != (uint)local_f0);
                return 0;
              }
              return 0;
            }
          }
          else {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_e8) {
                local_130 = (void *)0x0;
                do {
                  iVar79 = (int)local_130;
                  Mat::channel((Mat *)local_e0,local_120,iVar79);
                  auVar78 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar79);
                  local_128 = (void *)local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar79);
                  auVar89 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)(uint)local_f0) {
                    lVar98 = 0;
                    iVar79 = (uint)local_f0;
                    do {
                      _local_e0 = *(__m256 *)((long)auVar78 + lVar98);
                      local_80 = *(__m256 *)((long)local_128 + lVar98);
                      afVar254 = local_80;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *(__m256 *)((long)auVar89 + lVar98) = afVar254;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar104 = (int)local_130 + 1;
                  local_130 = (void *)(ulong)uVar104;
                } while (uVar104 != (uint)local_e8);
                return 0;
              }
              return 0;
            }
          }
          return -100;
        }
        local_f0 = uVar82;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            lVar98 = local_100 << 5;
            local_130 = (void *)0x0;
            local_128 = (void *)lVar98;
            do {
              if (0 < (int)local_f8) {
                pvVar95 = (void *)(local_108->cstep * (long)local_130 * local_108->elemsize +
                                  (long)local_108->data);
                pvVar100 = (void *)(local_120->cstep * (long)local_130 * local_120->elemsize +
                                   (long)local_120->data);
                lVar110 = local_120[1].elemsize * local_120[1].cstep * (long)local_130;
                pvVar80 = local_120[1].data;
                iVar79 = 0;
                uVar82 = local_100;
                uVar83 = local_f8;
                do {
                  if (0 < (int)uVar82) {
                    lVar111 = 0;
                    do {
                      _local_e0 = *(__m256 *)((long)pvVar100 + lVar111);
                      local_80 = *(__m256 *)((long)pvVar80 + lVar111 + lVar110);
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *(__m256 *)((long)pvVar95 + lVar111) = local_80;
                      lVar111 = lVar111 + 0x20;
                    } while (lVar98 != lVar111);
                    pvVar95 = (void *)((long)pvVar95 + lVar111);
                    pvVar100 = (void *)((long)pvVar100 + lVar111);
                    uVar82 = local_100;
                    uVar83 = local_f8;
                  }
                  iVar79 = iVar79 + 1;
                } while (iVar79 != (int)uVar83);
              }
              local_130 = (void *)((long)local_130 + 1);
            } while (local_130 != (void *)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar8[1].dims == 3) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)uVar101) {
            local_f8 = 0;
            pvVar80 = local_130;
            local_f0 = uVar82;
            do {
              if (0 < (int)pvVar80) {
                pafVar108 = (__m256 *)
                            (local_108->cstep * local_f8 * local_108->elemsize +
                            (long)local_108->data);
                pafVar107 = (__m256 *)
                            (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                            (long)local_120[1].data);
                pafVar106 = (__m256 *)
                            ((long)local_120->w * local_f8 * local_120->elemsize +
                            (long)local_120->data);
                iVar79 = 0;
                do {
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                  _local_e0 = *pafVar106;
                  uVar82 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      local_80 = *pafVar107;
                      binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
                      *pafVar108 = local_80;
                      pafVar107 = pafVar107 + 1;
                      pafVar108 = pafVar108 + 1;
                      uVar104 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar104;
                    } while (uVar104 != 0);
                  }
                  pafVar106 = pafVar106 + 1;
                  iVar79 = (int)local_128 + 1;
                  pvVar80 = local_130;
                } while (iVar79 != (int)local_130);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = CONCAT44(local_f0._4_4_,uVar6 * uVar104);
      Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
      pvVar80 = pMVar9->data;
      if (pvVar80 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_120[1].dims != 1) {
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)(uint)local_f0) {
          pvVar95 = local_120->data;
          pvVar100 = local_120[1].data;
          lVar98 = 0;
          iVar79 = (uint)local_f0;
          do {
            _local_e0 = *(__m256 *)((long)pvVar95 + lVar98);
            pafVar106 = (__m256 *)((long)pvVar100 + lVar98);
            uVar271 = *(undefined8 *)*pafVar106;
            uVar270 = *(undefined8 *)(*pafVar106 + 2);
            uVar273 = *(undefined8 *)(*pafVar106 + 4);
            uVar274 = *(undefined8 *)(*pafVar106 + 6);
            local_80 = *pafVar106;
            binary_op_pow_pack8::operator()(&local_131,(__m256 *)local_e0,&local_80);
            puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
            *puVar90 = uVar271;
            puVar90[1] = uVar270;
            puVar90[2] = uVar273;
            puVar90[3] = uVar274;
            lVar98 = lVar98 + 0x20;
            iVar79 = iVar79 + -1;
          } while (iVar79 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(pMVar9,(int)local_100,(int)local_f8,sVar10,iVar79,opt->blob_allocator);
      puVar90 = (undefined8 *)pMVar9->data;
      if (puVar90 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep != 0) {
        if ((int)local_128 != 1 || local_120[1].w != 1) {
          if (0 < (int)local_f8) {
            pafVar106 = (__m256 *)local_120->data;
            local_140 = (__m256 *)local_120[1].data;
            local_128 = (void *)((ulong)local_128 & 0xffffffff00000000);
            do {
              _local_e0 = *local_140;
              uVar82 = local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  uVar271 = *(undefined8 *)*pafVar106;
                  uVar270 = *(undefined8 *)(*pafVar106 + 2);
                  uVar273 = *(undefined8 *)(*pafVar106 + 4);
                  uVar274 = *(undefined8 *)(*pafVar106 + 6);
                  local_80 = *pafVar106;
                  binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
                  *puVar90 = uVar271;
                  puVar90[1] = uVar270;
                  puVar90[2] = uVar273;
                  puVar90[3] = uVar274;
                  pafVar106 = pafVar106 + 1;
                  puVar90 = puVar90 + 4;
                  uVar104 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar104;
                } while (uVar104 != 0);
              }
              local_140 = local_140 + 1;
              iVar79 = (int)local_128 + 1;
              local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
            } while (iVar79 != (int)local_f8);
            return 0;
          }
          return 0;
        }
        local_e0._4_4_ = *pMVar1->data;
        local_e0._0_4_ = local_e0._4_4_;
        fStack_d8 = (float)local_e0._4_4_;
        fStack_d4 = (float)local_e0._4_4_;
        fStack_d0 = (float)local_e0._4_4_;
        fStack_cc = (float)local_e0._4_4_;
        fStack_c8 = (float)local_e0._4_4_;
        fStack_c4 = (float)local_e0._4_4_;
        if ((int)(uint)local_f0 < 1) {
          return 0;
        }
        pvVar80 = local_120->data;
        lVar98 = 0;
        iVar79 = (uint)local_f0;
        do {
          pafVar106 = (__m256 *)((long)pvVar80 + lVar98);
          uVar271 = *(undefined8 *)*pafVar106;
          uVar270 = *(undefined8 *)(*pafVar106 + 2);
          uVar273 = *(undefined8 *)(*pafVar106 + 4);
          uVar274 = *(undefined8 *)(*pafVar106 + 6);
          local_80 = *pafVar106;
          binary_op_pow_pack8::operator()(&local_131,&local_80,(__m256 *)local_e0);
          puVar3 = (undefined8 *)((long)puVar90 + lVar98);
          *puVar3 = uVar271;
          puVar3[1] = uVar270;
          puVar3[2] = uVar273;
          puVar3[3] = uVar274;
          lVar98 = lVar98 + 0x20;
          iVar79 = iVar79 + -1;
        } while (iVar79 != 0);
        return 0;
      }
      return -100;
    case 7:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      local_f0 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar224._4_4_ = uVar4;
                auVar224._0_4_ = uVar4;
                auVar224._8_4_ = uVar4;
                auVar224._12_4_ = uVar4;
                auVar224._16_4_ = uVar4;
                auVar224._20_4_ = uVar4;
                auVar224._24_4_ = uVar4;
                auVar224._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),auVar224);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                uVar4 = *pMVar8->data;
                auVar221._4_4_ = uVar4;
                auVar221._0_4_ = uVar4;
                auVar221._8_4_ = uVar4;
                auVar221._12_4_ = uVar4;
                auVar221._16_4_ = uVar4;
                auVar221._20_4_ = uVar4;
                auVar221._24_4_ = uVar4;
                auVar221._28_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar95 + lVar98),auVar221);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar200._4_4_ = uVar4;
                auVar200._0_4_ = uVar4;
                auVar200._8_4_ = uVar4;
                auVar200._12_4_ = uVar4;
                auVar200._16_4_ = uVar4;
                auVar200._20_4_ = uVar4;
                auVar200._24_4_ = uVar4;
                auVar200._28_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      auVar202 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83),
                                            auVar200);
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar202;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar100 + lVar98),
                                      *(undefined1 (*) [32])((long)pvVar95 + lVar98));
                *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar213._4_4_ = uVar4;
            auVar213._0_4_ = uVar4;
            auVar213._8_4_ = uVar4;
            auVar213._12_4_ = uVar4;
            auVar213._16_4_ = uVar4;
            auVar213._20_4_ = uVar4;
            auVar213._24_4_ = uVar4;
            auVar213._28_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(auVar213,*(undefined1 (*) [32])((long)pvVar95 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f0,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pauVar91 = (undefined1 (*) [32])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  uVar101 = uVar103;
                  do {
                    auVar243 = vsubps_avx(*pauVar91,auVar202);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < (int)local_130) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                auVar243 = vsubps_avx(*(undefined1 (*) [32])
                                       ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83),auVar202)
                ;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar243
                ;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar93 = (undefined1 (*) [32])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar91 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar202 = *pauVar91;
                      uVar101 = uVar103;
                      do {
                        auVar243 = vsubps_avx(*pauVar93,auVar202);
                        *pauVar86 = auVar243;
                        pauVar93 = pauVar93 + 1;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar91 = pauVar91 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)pvVar100 + lVar98),
                                    *(undefined1 (*) [32])((long)pvVar95 + lVar98));
              *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar93 = (undefined1 (*) [32])local_120->data;
              pauVar91 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar91;
                  uVar82 = uVar83;
                  do {
                    auVar243 = vsubps_avx(auVar202,*pauVar93);
                    *pauVar86 = auVar243;
                    pauVar93 = pauVar93 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar91 = pauVar91 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar238._4_4_ = uVar4;
            auVar238._0_4_ = uVar4;
            auVar238._8_4_ = uVar4;
            auVar238._12_4_ = uVar4;
            auVar238._16_4_ = uVar4;
            auVar238._20_4_ = uVar4;
            auVar238._24_4_ = uVar4;
            auVar238._28_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar202 = vsubps_avx(auVar238,*(undefined1 (*) [32])((long)pvVar80 + lVar98));
              *(undefined1 (*) [32])((long)*pauVar86 + lVar98) = auVar202;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      local_f8 = sVar10;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  iVar79 = (int)local_118;
                  do {
                    auVar243 = vsubps_avx(auVar202,*(undefined1 (*) [32])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar243;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            uVar4 = *local_110->data;
            auVar240._4_4_ = uVar4;
            auVar240._0_4_ = uVar4;
            auVar240._8_4_ = uVar4;
            auVar240._12_4_ = uVar4;
            auVar240._16_4_ = uVar4;
            auVar240._20_4_ = uVar4;
            auVar240._24_4_ = uVar4;
            auVar240._28_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar202 = vsubps_avx(auVar240,*(undefined1 (*) [32])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar91 = (undefined1 (*) [32])
                         (local_120->cstep * uVar82 * local_120->elemsize + (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  do {
                    auVar243 = vsubps_avx(auVar202,*pauVar91);
                    *pauVar86 = auVar243;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar243 = vsubps_avx(auVar202,*(undefined1 (*) [32])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar207._4_4_ = uVar4;
                  auVar207._0_4_ = uVar4;
                  auVar207._8_4_ = uVar4;
                  auVar207._12_4_ = uVar4;
                  auVar207._16_4_ = uVar4;
                  auVar207._20_4_ = uVar4;
                  auVar207._24_4_ = uVar4;
                  auVar207._28_4_ = uVar4;
                  auVar202 = vsubps_avx(auVar207,*(undefined1 (*) [32])
                                                  ((long)pvVar80 +
                                                  lVar98 * 8 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar8[1].data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar243 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83),
                                        auVar202);
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83) =
                       auVar243;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar231._4_4_ = uVar4;
                  auVar231._0_4_ = uVar4;
                  auVar231._8_4_ = uVar4;
                  auVar231._12_4_ = uVar4;
                  auVar231._16_4_ = uVar4;
                  auVar231._20_4_ = uVar4;
                  auVar231._24_4_ = uVar4;
                  auVar231._28_4_ = uVar4;
                  auVar202 = vsubps_avx(*(undefined1 (*) [32])
                                         ((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar83),
                                        auVar231);
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar202;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar243 = vsubps_avx(auVar202,*pauVar93);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar202 = vsubps_avx(*(undefined1 (*) [32])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84),
                                            *(undefined1 (*) [32])((long)pvVar100 + lVar98));
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar243 = vsubps_avx(*pauVar93,auVar202);
                      *pauVar86 = auVar243;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f0,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)auVar89 + lVar98),
                                            *(undefined1 (*) [32])((long)auVar78 + lVar98));
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                      lVar98 = lVar98 + 0x20;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              iVar81 = (int)local_118;
              do {
                auVar202 = vsubps_avx(*(undefined1 (*) [32])((long)auVar89 + lVar98),
                                      *(undefined1 (*) [32])((long)auVar78 + lVar98));
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar202;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar102 * uVar103);
      sVar11 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                auVar134._0_4_ = 1.0 / *pMVar8->data;
                auVar134._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  auVar386._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar386._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar386._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar386._12_4_ = auVar134._12_4_ * pfVar96[3];
                  auVar386._16_4_ = auVar134._0_4_ * pfVar96[4];
                  auVar386._20_4_ = auVar134._4_4_ * pfVar96[5];
                  auVar386._28_36_ = in_ZMM1._28_36_;
                  auVar386._24_4_ = auVar134._8_4_ * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar386._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar386._0_32_;
                  lVar98 = lVar98 + 0x20;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                auVar133._0_4_ = 1.0 / *pMVar8->data;
                auVar133._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar133,auVar133,0);
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  auVar385._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar385._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar385._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar385._12_4_ = auVar134._12_4_ * pfVar96[3];
                  auVar385._16_4_ = auVar134._0_4_ * pfVar96[4];
                  auVar385._20_4_ = auVar134._4_4_ * pfVar96[5];
                  auVar385._28_36_ = in_ZMM1._28_36_;
                  auVar385._24_4_ = auVar134._8_4_ * pfVar96[6];
                  in_ZMM1 = ZEXT3264(auVar385._0_32_);
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98) = auVar385._0_32_;
                  lVar98 = lVar98 + 0x20;
                  local_130._0_4_ = (int)local_130 + -1;
                } while ((int)local_130 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                auVar113._0_4_ = 1.0 / *pMVar8->data;
                auVar113._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar113,auVar113,0);
                uVar83 = 0;
                do {
                  if (0 < (int)local_130) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = (int)local_130;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar376._0_4_ = auVar134._0_4_ * *pfVar96;
                      auVar376._4_4_ = auVar134._4_4_ * pfVar96[1];
                      auVar376._8_4_ = auVar134._8_4_ * pfVar96[2];
                      auVar376._12_4_ = auVar134._12_4_ * pfVar96[3];
                      auVar376._16_4_ = auVar134._0_4_ * pfVar96[4];
                      auVar376._20_4_ = auVar134._4_4_ * pfVar96[5];
                      auVar376._28_36_ = in_ZMM1._28_36_;
                      auVar376._24_4_ = auVar134._8_4_ * pfVar96[6];
                      in_ZMM1 = ZEXT3264(auVar376._0_32_);
                      *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar376._0_32_;
                      lVar98 = lVar98 + 0x20;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
                auVar16 = vrcpps_avx(auVar202);
                auVar243 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
                auVar419._0_4_ = auVar243._0_4_ * auVar16._0_4_;
                auVar419._4_4_ = auVar243._4_4_ * auVar16._4_4_;
                auVar419._8_4_ = auVar243._8_4_ * auVar16._8_4_;
                auVar419._12_4_ = auVar243._12_4_ * auVar16._12_4_;
                auVar419._16_4_ = auVar243._16_4_ * auVar16._16_4_;
                auVar419._20_4_ = auVar243._20_4_ * auVar16._20_4_;
                auVar419._28_36_ = in_ZMM3._28_36_;
                auVar419._24_4_ = auVar243._24_4_ * auVar16._24_4_;
                auVar50._4_4_ = auVar202._4_4_ * auVar419._4_4_;
                auVar50._0_4_ = auVar202._0_4_ * auVar419._0_4_;
                auVar50._8_4_ = auVar202._8_4_ * auVar419._8_4_;
                auVar50._12_4_ = auVar202._12_4_ * auVar419._12_4_;
                auVar50._16_4_ = auVar202._16_4_ * auVar419._16_4_;
                auVar50._20_4_ = auVar202._20_4_ * auVar419._20_4_;
                auVar50._24_4_ = auVar202._24_4_ * auVar419._24_4_;
                auVar50._28_4_ = auVar202._28_4_;
                auVar202 = vsubps_avx(auVar243,auVar50);
                pfVar96 = (float *)((long)pvVar80 + lVar98);
                *pfVar96 = auVar419._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                pfVar96[1] = auVar419._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                pfVar96[2] = auVar419._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                pfVar96[3] = auVar419._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                pfVar96[4] = auVar419._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                pfVar96[5] = auVar419._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                pfVar96[6] = auVar419._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
                lVar98 = lVar98 + 0x20;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
                in_ZMM3 = ZEXT3264(auVar419._0_32_);
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *local_110->data;
            auVar217._4_4_ = fVar397;
            auVar217._0_4_ = fVar397;
            auVar217._8_4_ = fVar397;
            auVar217._12_4_ = fVar397;
            auVar217._16_4_ = fVar397;
            auVar217._20_4_ = fVar397;
            auVar217._24_4_ = fVar397;
            auVar217._28_4_ = fVar397;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
              auVar243 = vrcpps_avx(auVar202);
              auVar408._0_4_ = fVar397 * auVar243._0_4_;
              auVar408._4_4_ = fVar397 * auVar243._4_4_;
              auVar408._8_4_ = fVar397 * auVar243._8_4_;
              auVar408._12_4_ = fVar397 * auVar243._12_4_;
              auVar408._16_4_ = fVar397 * auVar243._16_4_;
              auVar408._20_4_ = fVar397 * auVar243._20_4_;
              auVar408._28_36_ = in_ZMM3._28_36_;
              auVar408._24_4_ = fVar397 * auVar243._24_4_;
              auVar34._4_4_ = auVar202._4_4_ * auVar408._4_4_;
              auVar34._0_4_ = auVar202._0_4_ * auVar408._0_4_;
              auVar34._8_4_ = auVar202._8_4_ * auVar408._8_4_;
              auVar34._12_4_ = auVar202._12_4_ * auVar408._12_4_;
              auVar34._16_4_ = auVar202._16_4_ * auVar408._16_4_;
              auVar34._20_4_ = auVar202._20_4_ * auVar408._20_4_;
              auVar34._24_4_ = auVar202._24_4_ * auVar408._24_4_;
              auVar34._28_4_ = auVar202._28_4_;
              auVar202 = vsubps_avx(auVar217,auVar34);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = auVar408._0_4_ + auVar243._0_4_ * auVar202._0_4_;
              pfVar96[1] = auVar408._4_4_ + auVar243._4_4_ * auVar202._4_4_;
              pfVar96[2] = auVar408._8_4_ + auVar243._8_4_ * auVar202._8_4_;
              pfVar96[3] = auVar408._12_4_ + auVar243._12_4_ * auVar202._12_4_;
              pfVar96[4] = auVar408._16_4_ + auVar243._16_4_ * auVar202._16_4_;
              pfVar96[5] = auVar408._20_4_ + auVar243._20_4_ * auVar202._20_4_;
              pfVar96[6] = auVar408._24_4_ + auVar243._24_4_ * auVar202._24_4_;
              pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
              lVar98 = lVar98 + 0x20;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
              in_ZMM3 = ZEXT3264(auVar408._0_32_);
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
          pauVar86 = (undefined1 (*) [32])pMVar9->data;
          if (pauVar86 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar93 = (undefined1 (*) [32])pMVar8->data;
              pfVar96 = (float *)pMVar8[1].data;
              uVar104 = 0;
              auVar215._8_4_ = 0x3f800000;
              auVar215._0_8_ = 0x3f8000003f800000;
              auVar215._12_4_ = 0x3f800000;
              auVar215._16_4_ = 0x3f800000;
              auVar215._20_4_ = 0x3f800000;
              auVar215._24_4_ = 0x3f800000;
              auVar215._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar103) {
                  auVar202 = *pauVar93;
                  auVar243 = vrcpps_avx(auVar202);
                  fVar397 = auVar243._0_4_;
                  fVar426 = auVar243._4_4_;
                  auVar33._4_4_ = auVar202._4_4_ * fVar426;
                  auVar33._0_4_ = auVar202._0_4_ * fVar397;
                  fVar427 = auVar243._8_4_;
                  auVar33._8_4_ = auVar202._8_4_ * fVar427;
                  fVar428 = auVar243._12_4_;
                  auVar33._12_4_ = auVar202._12_4_ * fVar428;
                  fVar429 = auVar243._16_4_;
                  auVar33._16_4_ = auVar202._16_4_ * fVar429;
                  fVar14 = auVar243._20_4_;
                  auVar33._20_4_ = auVar202._20_4_ * fVar14;
                  fVar15 = auVar243._24_4_;
                  auVar33._24_4_ = auVar202._24_4_ * fVar15;
                  auVar33._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar215,auVar33);
                  uVar101 = uVar103;
                  do {
                    auVar66._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                    auVar66._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                    auVar66._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                    auVar66._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                    auVar66._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                    auVar66._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                    auVar66._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                    auVar66._28_4_ = auVar243._28_4_;
                    *pauVar86 = auVar66;
                    pfVar96 = pfVar96 + 8;
                    pauVar86 = pauVar86 + 1;
                    uVar101 = uVar101 - 1;
                    auVar243 = auVar66;
                  } while (uVar101 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          auVar204._8_4_ = 0x3f800000;
          auVar204._0_8_ = 0x3f8000003f800000;
          auVar204._12_4_ = 0x3f800000;
          auVar204._16_4_ = 0x3f800000;
          auVar204._20_4_ = 0x3f800000;
          auVar204._24_4_ = 0x3f800000;
          auVar204._28_4_ = 0x3f800000;
          do {
            if (0 < (int)local_130) {
              auVar202 = *(undefined1 (*) [32])((long)pMVar8->data + uVar83 * 0x20);
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar8[1].cstep;
              auVar243 = vrcpps_avx(auVar202);
              fVar397 = auVar243._0_4_;
              fVar426 = auVar243._4_4_;
              auVar23._4_4_ = auVar202._4_4_ * fVar426;
              auVar23._0_4_ = auVar202._0_4_ * fVar397;
              fVar427 = auVar243._8_4_;
              auVar23._8_4_ = auVar202._8_4_ * fVar427;
              fVar428 = auVar243._12_4_;
              auVar23._12_4_ = auVar202._12_4_ * fVar428;
              fVar429 = auVar243._16_4_;
              auVar23._16_4_ = auVar202._16_4_ * fVar429;
              fVar14 = auVar243._20_4_;
              auVar23._20_4_ = auVar202._20_4_ * fVar14;
              fVar15 = auVar243._24_4_;
              auVar23._24_4_ = auVar202._24_4_ * fVar15;
              auVar23._28_4_ = auVar202._28_4_;
              auVar202 = vsubps_avx(auVar204,auVar23);
              sVar12 = pMVar9->elemsize;
              pvVar80 = pMVar9->data;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = (int)local_130;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar11 * sVar13 * uVar83);
                auVar63._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                auVar63._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                auVar63._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                auVar63._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                auVar63._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                auVar63._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                auVar63._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                auVar63._28_4_ = auVar243._28_4_;
                *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar12 * uVar83) = auVar63;
                lVar98 = lVar98 + 0x20;
                iVar79 = iVar79 + -1;
                auVar243 = auVar63;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_118 = CONCAT44(local_118._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              auVar202._8_4_ = 0x3f800000;
              auVar202._0_8_ = 0x3f8000003f800000;
              auVar202._12_4_ = 0x3f800000;
              auVar202._16_4_ = 0x3f800000;
              auVar202._20_4_ = 0x3f800000;
              auVar202._24_4_ = 0x3f800000;
              auVar202._28_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar102) {
                  pauVar86 = (undefined1 (*) [32])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar93 = (undefined1 (*) [32])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar243 = *pauVar93;
                      auVar16 = vrcpps_avx(auVar243);
                      fVar397 = auVar16._0_4_;
                      fVar426 = auVar16._4_4_;
                      auVar21._4_4_ = auVar243._4_4_ * fVar426;
                      auVar21._0_4_ = auVar243._0_4_ * fVar397;
                      fVar427 = auVar16._8_4_;
                      auVar21._8_4_ = auVar243._8_4_ * fVar427;
                      fVar428 = auVar16._12_4_;
                      auVar21._12_4_ = auVar243._12_4_ * fVar428;
                      fVar429 = auVar16._16_4_;
                      auVar21._16_4_ = auVar243._16_4_ * fVar429;
                      fVar14 = auVar16._20_4_;
                      auVar21._20_4_ = auVar243._20_4_ * fVar14;
                      fVar15 = auVar16._24_4_;
                      auVar21._24_4_ = auVar243._24_4_ * fVar15;
                      auVar21._28_4_ = auVar243._28_4_;
                      auVar243 = vsubps_avx(auVar202,auVar21);
                      uVar101 = uVar103;
                      do {
                        auVar62._4_4_ = (fVar426 + fVar426 * auVar243._4_4_) * pfVar96[1];
                        auVar62._0_4_ = (fVar397 + fVar397 * auVar243._0_4_) * *pfVar96;
                        auVar62._8_4_ = (fVar427 + fVar427 * auVar243._8_4_) * pfVar96[2];
                        auVar62._12_4_ = (fVar428 + fVar428 * auVar243._12_4_) * pfVar96[3];
                        auVar62._16_4_ = (fVar429 + fVar429 * auVar243._16_4_) * pfVar96[4];
                        auVar62._20_4_ = (fVar14 + fVar14 * auVar243._20_4_) * pfVar96[5];
                        auVar62._24_4_ = (fVar15 + fVar15 * auVar243._24_4_) * pfVar96[6];
                        auVar62._28_4_ = auVar16._28_4_;
                        *pauVar86 = auVar62;
                        pfVar96 = pfVar96 + 8;
                        pauVar86 = pauVar86 + 1;
                        uVar101 = uVar101 - 1;
                        auVar16 = auVar62;
                      } while (uVar101 != 0);
                    }
                    pauVar93 = pauVar93 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_118) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar202 = *(undefined1 (*) [32])((long)pvVar95 + lVar98);
              auVar16 = vrcpps_avx(auVar202);
              auVar243 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
              auVar403._0_4_ = auVar243._0_4_ * auVar16._0_4_;
              auVar403._4_4_ = auVar243._4_4_ * auVar16._4_4_;
              auVar403._8_4_ = auVar243._8_4_ * auVar16._8_4_;
              auVar403._12_4_ = auVar243._12_4_ * auVar16._12_4_;
              auVar403._16_4_ = auVar243._16_4_ * auVar16._16_4_;
              auVar403._20_4_ = auVar243._20_4_ * auVar16._20_4_;
              auVar403._28_36_ = in_ZMM3._28_36_;
              auVar403._24_4_ = auVar243._24_4_ * auVar16._24_4_;
              auVar26._4_4_ = auVar202._4_4_ * auVar403._4_4_;
              auVar26._0_4_ = auVar202._0_4_ * auVar403._0_4_;
              auVar26._8_4_ = auVar202._8_4_ * auVar403._8_4_;
              auVar26._12_4_ = auVar202._12_4_ * auVar403._12_4_;
              auVar26._16_4_ = auVar202._16_4_ * auVar403._16_4_;
              auVar26._20_4_ = auVar202._20_4_ * auVar403._20_4_;
              auVar26._24_4_ = auVar202._24_4_ * auVar403._24_4_;
              auVar26._28_4_ = auVar202._28_4_;
              auVar202 = vsubps_avx(auVar243,auVar26);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = auVar403._0_4_ + auVar16._0_4_ * auVar202._0_4_;
              pfVar96[1] = auVar403._4_4_ + auVar16._4_4_ * auVar202._4_4_;
              pfVar96[2] = auVar403._8_4_ + auVar16._8_4_ * auVar202._8_4_;
              pfVar96[3] = auVar403._12_4_ + auVar16._12_4_ * auVar202._12_4_;
              pfVar96[4] = auVar403._16_4_ + auVar16._16_4_ * auVar202._16_4_;
              pfVar96[5] = auVar403._20_4_ + auVar16._20_4_ * auVar202._20_4_;
              pfVar96[6] = auVar403._24_4_ + auVar16._24_4_ * auVar202._24_4_;
              pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
              in_ZMM3 = ZEXT3264(auVar403._0_32_);
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar86 = (undefined1 (*) [32])pMVar9->data;
        if (pauVar86 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar93 = (undefined1 (*) [32])local_120->data;
              pauVar91 = (undefined1 (*) [32])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar91;
                  uVar82 = uVar83;
                  auVar403 = in_ZMM3;
                  do {
                    auVar243 = *pauVar93;
                    auVar16 = vrcpps_avx(auVar243);
                    auVar421._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                    auVar421._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                    auVar421._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                    auVar421._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                    auVar421._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                    auVar421._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                    auVar421._28_36_ = auVar403._28_36_;
                    auVar421._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                    in_ZMM3 = ZEXT3264(auVar421._0_32_);
                    auVar54._4_4_ = auVar243._4_4_ * auVar421._4_4_;
                    auVar54._0_4_ = auVar243._0_4_ * auVar421._0_4_;
                    auVar54._8_4_ = auVar243._8_4_ * auVar421._8_4_;
                    auVar54._12_4_ = auVar243._12_4_ * auVar421._12_4_;
                    auVar54._16_4_ = auVar243._16_4_ * auVar421._16_4_;
                    auVar54._20_4_ = auVar243._20_4_ * auVar421._20_4_;
                    auVar54._24_4_ = auVar243._24_4_ * auVar421._24_4_;
                    auVar54._28_4_ = auVar243._28_4_;
                    auVar243 = vsubps_avx(auVar202,auVar54);
                    auVar372._0_4_ = auVar421._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                    auVar372._4_4_ = auVar421._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                    auVar372._8_4_ = auVar421._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                    auVar372._12_4_ = auVar421._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                    auVar372._16_4_ = auVar421._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                    auVar372._20_4_ = auVar421._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                    auVar372._24_4_ = auVar421._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                    auVar372._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                    *pauVar86 = auVar372;
                    pauVar93 = pauVar93 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                    auVar403 = in_ZMM3;
                  } while (uVar102 != 0);
                }
                pauVar91 = pauVar91 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar397 = *local_110->data;
            auVar243._4_4_ = fVar397;
            auVar243._0_4_ = fVar397;
            auVar243._8_4_ = fVar397;
            auVar243._12_4_ = fVar397;
            auVar243._16_4_ = fVar397;
            auVar243._20_4_ = fVar397;
            auVar243._24_4_ = fVar397;
            auVar243._28_4_ = fVar397;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar202 = *(undefined1 (*) [32])((long)pvVar80 + lVar98);
              auVar16 = vrcpps_avx(auVar202);
              auVar413._0_4_ = fVar397 * auVar16._0_4_;
              auVar413._4_4_ = fVar397 * auVar16._4_4_;
              auVar413._8_4_ = fVar397 * auVar16._8_4_;
              auVar413._12_4_ = fVar397 * auVar16._12_4_;
              auVar413._16_4_ = fVar397 * auVar16._16_4_;
              auVar413._20_4_ = fVar397 * auVar16._20_4_;
              auVar413._28_36_ = in_ZMM3._28_36_;
              auVar413._24_4_ = fVar397 * auVar16._24_4_;
              auVar42._4_4_ = auVar202._4_4_ * auVar413._4_4_;
              auVar42._0_4_ = auVar202._0_4_ * auVar413._0_4_;
              auVar42._8_4_ = auVar202._8_4_ * auVar413._8_4_;
              auVar42._12_4_ = auVar202._12_4_ * auVar413._12_4_;
              auVar42._16_4_ = auVar202._16_4_ * auVar413._16_4_;
              auVar42._20_4_ = auVar202._20_4_ * auVar413._20_4_;
              auVar42._24_4_ = auVar202._24_4_ * auVar413._24_4_;
              auVar42._28_4_ = auVar202._28_4_;
              auVar202 = vsubps_avx(auVar243,auVar42);
              pfVar96 = (float *)((long)*pauVar86 + lVar98);
              *pfVar96 = auVar413._0_4_ + auVar16._0_4_ * auVar202._0_4_;
              pfVar96[1] = auVar413._4_4_ + auVar16._4_4_ * auVar202._4_4_;
              pfVar96[2] = auVar413._8_4_ + auVar16._8_4_ * auVar202._8_4_;
              pfVar96[3] = auVar413._12_4_ + auVar16._12_4_ * auVar202._12_4_;
              pfVar96[4] = auVar413._16_4_ + auVar16._16_4_ * auVar202._16_4_;
              pfVar96[5] = auVar413._20_4_ + auVar16._20_4_ * auVar202._20_4_;
              pfVar96[6] = auVar413._24_4_ + auVar16._24_4_ * auVar202._24_4_;
              pfVar96[7] = in_ZMM3._28_4_ + auVar202._28_4_;
              lVar98 = lVar98 + 0x20;
              local_118._0_4_ = (int)local_118 + -1;
              in_ZMM3 = ZEXT3264(auVar413._0_32_);
            } while ((int)local_118 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims == 1) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_118) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar202 = *(undefined1 (*) [32])((long)local_110->data + uVar82 * 0x20);
                  pvVar80 = pMVar9->data;
                  sVar12 = local_120->cstep;
                  sVar13 = local_120->elemsize;
                  pvVar95 = local_120->data;
                  lVar98 = 0;
                  auVar403 = in_ZMM3;
                  iVar79 = (int)local_118;
                  do {
                    auVar243 = *(undefined1 (*) [32])
                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar16 = vrcpps_avx(auVar243);
                    auVar417._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                    auVar417._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                    auVar417._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                    auVar417._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                    auVar417._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                    auVar417._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                    auVar417._28_36_ = auVar403._28_36_;
                    auVar417._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                    in_ZMM3 = ZEXT3264(auVar417._0_32_);
                    auVar48._4_4_ = auVar243._4_4_ * auVar417._4_4_;
                    auVar48._0_4_ = auVar243._0_4_ * auVar417._0_4_;
                    auVar48._8_4_ = auVar243._8_4_ * auVar417._8_4_;
                    auVar48._12_4_ = auVar243._12_4_ * auVar417._12_4_;
                    auVar48._16_4_ = auVar243._16_4_ * auVar417._16_4_;
                    auVar48._20_4_ = auVar243._20_4_ * auVar417._20_4_;
                    auVar48._24_4_ = auVar243._24_4_ * auVar417._24_4_;
                    auVar48._28_4_ = auVar243._28_4_;
                    auVar243 = vsubps_avx(auVar202,auVar48);
                    auVar368._0_4_ = auVar417._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                    auVar368._4_4_ = auVar417._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                    auVar368._8_4_ = auVar417._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                    auVar368._12_4_ = auVar417._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                    auVar368._16_4_ = auVar417._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                    auVar368._20_4_ = auVar417._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                    auVar368._24_4_ = auVar417._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                    auVar368._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                    *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar368;
                    lVar98 = lVar98 + 0x20;
                    iVar79 = iVar79 + -1;
                    auVar403 = in_ZMM3;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar397 = *local_110->data;
            auVar245._4_4_ = fVar397;
            auVar245._0_4_ = fVar397;
            auVar245._8_4_ = fVar397;
            auVar245._12_4_ = fVar397;
            auVar245._16_4_ = fVar397;
            auVar245._20_4_ = fVar397;
            auVar245._24_4_ = fVar397;
            auVar245._28_4_ = fVar397;
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = local_120->cstep;
                sVar13 = local_120->elemsize;
                pvVar95 = local_120->data;
                lVar98 = 0;
                auVar403 = in_ZMM3;
                iVar79 = (int)local_118;
                do {
                  auVar202 = *(undefined1 (*) [32])
                              ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar243 = vrcpps_avx(auVar202);
                  auVar414._0_4_ = fVar397 * auVar243._0_4_;
                  auVar414._4_4_ = fVar397 * auVar243._4_4_;
                  auVar414._8_4_ = fVar397 * auVar243._8_4_;
                  auVar414._12_4_ = fVar397 * auVar243._12_4_;
                  auVar414._16_4_ = fVar397 * auVar243._16_4_;
                  auVar414._20_4_ = fVar397 * auVar243._20_4_;
                  auVar414._28_36_ = auVar403._28_36_;
                  auVar414._24_4_ = fVar397 * auVar243._24_4_;
                  in_ZMM3 = ZEXT3264(auVar414._0_32_);
                  auVar43._4_4_ = auVar202._4_4_ * auVar414._4_4_;
                  auVar43._0_4_ = auVar202._0_4_ * auVar414._0_4_;
                  auVar43._8_4_ = auVar202._8_4_ * auVar414._8_4_;
                  auVar43._12_4_ = auVar202._12_4_ * auVar414._12_4_;
                  auVar43._16_4_ = auVar202._16_4_ * auVar414._16_4_;
                  auVar43._20_4_ = auVar202._20_4_ * auVar414._20_4_;
                  auVar43._24_4_ = auVar202._24_4_ * auVar414._24_4_;
                  auVar43._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar245,auVar43);
                  auVar366._0_4_ = auVar414._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                  auVar366._4_4_ = auVar414._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                  auVar366._8_4_ = auVar414._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                  auVar366._12_4_ = auVar414._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                  auVar366._16_4_ = auVar414._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                  auVar366._20_4_ = auVar414._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                  auVar366._24_4_ = auVar414._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                  auVar366._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                  *(undefined1 (*) [32])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar366;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                  auVar403 = in_ZMM3;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar86 = (undefined1 (*) [32])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar93 = (undefined1 (*) [32])
                         ((long)local_120[1].w * uVar82 * local_120[1].elemsize +
                         (long)local_120[1].data);
              pauVar91 = (undefined1 (*) [32])
                         (local_120->cstep * uVar82 * local_120->elemsize + (long)local_120->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar202 = *pauVar93;
                  uVar84 = uVar83;
                  auVar403 = in_ZMM3;
                  do {
                    auVar243 = *pauVar91;
                    auVar16 = vrcpps_avx(auVar243);
                    auVar404._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                    auVar404._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                    auVar404._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                    auVar404._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                    auVar404._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                    auVar404._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                    auVar404._28_36_ = auVar403._28_36_;
                    auVar404._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                    in_ZMM3 = ZEXT3264(auVar404._0_32_);
                    auVar27._4_4_ = auVar243._4_4_ * auVar404._4_4_;
                    auVar27._0_4_ = auVar243._0_4_ * auVar404._0_4_;
                    auVar27._8_4_ = auVar243._8_4_ * auVar404._8_4_;
                    auVar27._12_4_ = auVar243._12_4_ * auVar404._12_4_;
                    auVar27._16_4_ = auVar243._16_4_ * auVar404._16_4_;
                    auVar27._20_4_ = auVar243._20_4_ * auVar404._20_4_;
                    auVar27._24_4_ = auVar243._24_4_ * auVar404._24_4_;
                    auVar27._28_4_ = auVar243._28_4_;
                    auVar243 = vsubps_avx(auVar202,auVar27);
                    auVar357._0_4_ = auVar404._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                    auVar357._4_4_ = auVar404._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                    auVar357._8_4_ = auVar404._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                    auVar357._12_4_ = auVar404._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                    auVar357._16_4_ = auVar404._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                    auVar357._20_4_ = auVar404._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                    auVar357._24_4_ = auVar404._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                    auVar357._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                    *pauVar86 = auVar357;
                    pauVar91 = pauVar91 + 1;
                    pauVar86 = pauVar86 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                    auVar403 = in_ZMM3;
                  } while (uVar102 != 0);
                }
                pauVar93 = pauVar93 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      local_f8 = sVar10;
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                auVar403 = in_ZMM3;
                iVar79 = (int)local_118;
                do {
                  auVar243 = *(undefined1 (*) [32])
                              ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar16 = vrcpps_avx(auVar243);
                  auVar398._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                  auVar398._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                  auVar398._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                  auVar398._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                  auVar398._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                  auVar398._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                  auVar398._28_36_ = auVar403._28_36_;
                  auVar398._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                  in_ZMM3 = ZEXT3264(auVar398._0_32_);
                  auVar18._4_4_ = auVar243._4_4_ * auVar398._4_4_;
                  auVar18._0_4_ = auVar243._0_4_ * auVar398._0_4_;
                  auVar18._8_4_ = auVar243._8_4_ * auVar398._8_4_;
                  auVar18._12_4_ = auVar243._12_4_ * auVar398._12_4_;
                  auVar18._16_4_ = auVar243._16_4_ * auVar398._16_4_;
                  auVar18._20_4_ = auVar243._20_4_ * auVar398._20_4_;
                  auVar18._24_4_ = auVar243._24_4_ * auVar398._24_4_;
                  auVar18._28_4_ = auVar243._28_4_;
                  auVar243 = vsubps_avx(auVar202,auVar18);
                  auVar349._0_4_ = auVar398._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                  auVar349._4_4_ = auVar398._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                  auVar349._8_4_ = auVar398._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                  auVar349._12_4_ = auVar398._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                  auVar349._16_4_ = auVar398._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                  auVar349._20_4_ = auVar398._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                  auVar349._24_4_ = auVar398._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                  auVar349._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar349;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                  auVar403 = in_ZMM3;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar99;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                auVar403 = in_ZMM3;
                iVar79 = (int)local_118;
                do {
                  auVar202 = *(undefined1 (*) [32])
                              ((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar82);
                  auVar243 = vrcpps_avx(auVar202);
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  auVar396._4_4_ = fVar397;
                  auVar396._0_4_ = fVar397;
                  auVar396._8_4_ = fVar397;
                  auVar396._12_4_ = fVar397;
                  auVar396._16_4_ = fVar397;
                  auVar396._20_4_ = fVar397;
                  auVar396._24_4_ = fVar397;
                  auVar396._28_4_ = fVar397;
                  auVar405._0_4_ = fVar397 * auVar243._0_4_;
                  auVar405._4_4_ = fVar397 * auVar243._4_4_;
                  auVar405._8_4_ = fVar397 * auVar243._8_4_;
                  auVar405._12_4_ = fVar397 * auVar243._12_4_;
                  auVar405._16_4_ = fVar397 * auVar243._16_4_;
                  auVar405._20_4_ = fVar397 * auVar243._20_4_;
                  auVar405._28_36_ = auVar403._28_36_;
                  auVar405._24_4_ = fVar397 * auVar243._24_4_;
                  in_ZMM3 = ZEXT3264(auVar405._0_32_);
                  auVar16._4_4_ = auVar202._4_4_ * auVar405._4_4_;
                  auVar16._0_4_ = auVar202._0_4_ * auVar405._0_4_;
                  auVar16._8_4_ = auVar202._8_4_ * auVar405._8_4_;
                  auVar16._12_4_ = auVar202._12_4_ * auVar405._12_4_;
                  auVar16._16_4_ = auVar202._16_4_ * auVar405._16_4_;
                  auVar16._20_4_ = auVar202._20_4_ * auVar405._20_4_;
                  auVar16._24_4_ = auVar202._24_4_ * auVar405._24_4_;
                  auVar16._28_4_ = auVar202._28_4_;
                  auVar202 = vsubps_avx(auVar396,auVar16);
                  auVar210._0_4_ = auVar405._0_4_ + auVar243._0_4_ * auVar202._0_4_;
                  auVar210._4_4_ = auVar405._4_4_ + auVar243._4_4_ * auVar202._4_4_;
                  auVar210._8_4_ = auVar405._8_4_ + auVar243._8_4_ * auVar202._8_4_;
                  auVar210._12_4_ = auVar405._12_4_ + auVar243._12_4_ * auVar202._12_4_;
                  auVar210._16_4_ = auVar405._16_4_ + auVar243._16_4_ * auVar202._16_4_;
                  auVar210._20_4_ = auVar405._20_4_ + auVar243._20_4_ * auVar202._20_4_;
                  auVar210._24_4_ = auVar405._24_4_ + auVar243._24_4_ * auVar202._24_4_;
                  auVar210._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar82) =
                       auVar210;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                  auVar403 = in_ZMM3;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            auVar211._8_4_ = 0x3f800000;
            auVar211._0_8_ = 0x3f8000003f800000;
            auVar211._12_4_ = 0x3f800000;
            auVar211._16_4_ = 0x3f800000;
            auVar211._20_4_ = 0x3f800000;
            auVar211._24_4_ = 0x3f800000;
            auVar211._28_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar8[1].cstep;
                auVar202 = *(undefined1 (*) [32])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                auVar243 = vrcpps_avx(auVar202);
                fVar397 = auVar243._0_4_;
                fVar426 = auVar243._4_4_;
                auVar31._4_4_ = auVar202._4_4_ * fVar426;
                auVar31._0_4_ = auVar202._0_4_ * fVar397;
                fVar427 = auVar243._8_4_;
                auVar31._8_4_ = auVar202._8_4_ * fVar427;
                fVar428 = auVar243._12_4_;
                auVar31._12_4_ = auVar202._12_4_ * fVar428;
                fVar429 = auVar243._16_4_;
                auVar31._16_4_ = auVar202._16_4_ * fVar429;
                fVar14 = auVar243._20_4_;
                auVar31._20_4_ = auVar202._20_4_ * fVar14;
                fVar15 = auVar243._24_4_;
                auVar31._24_4_ = auVar202._24_4_ * fVar15;
                auVar31._28_4_ = auVar202._28_4_;
                auVar202 = vsubps_avx(auVar211,auVar31);
                sVar12 = pMVar8[1].elemsize;
                pvVar80 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar11 * sVar12 * uVar83);
                  auVar65._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                  auVar65._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                  auVar65._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                  auVar65._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                  auVar65._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                  auVar65._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                  auVar65._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                  auVar65._28_4_ = auVar243._28_4_;
                  *(undefined1 (*) [32])((long)pvVar95 + lVar98 + sVar10 * sVar13 * uVar83) =
                       auVar65;
                  lVar98 = lVar98 + 0x20;
                  iVar79 = iVar79 + -1;
                  auVar243 = auVar65;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar95 + lVar98)));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 8 + sVar10 * sVar11 * uVar83);
                  auVar39._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar39._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar39._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar39._12_4_ = auVar134._12_4_ * pfVar96[3];
                  auVar39._16_4_ = auVar134._0_4_ * pfVar96[4];
                  auVar39._20_4_ = auVar134._4_4_ * pfVar96[5];
                  auVar39._24_4_ = auVar134._8_4_ * pfVar96[6];
                  auVar39._28_4_ = auVar134._12_4_;
                  *(undefined1 (*) [32])((long)pvVar100 + lVar98 * 8 + sVar12 * sVar13 * uVar83) =
                       auVar39;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_130 = (void *)uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar93 = (undefined1 (*) [32])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar99 * 0x20 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    auVar403 = in_ZMM3;
                    do {
                      auVar243 = *pauVar93;
                      auVar16 = vrcpps_avx(auVar243);
                      auVar412._0_4_ = auVar202._0_4_ * auVar16._0_4_;
                      auVar412._4_4_ = auVar202._4_4_ * auVar16._4_4_;
                      auVar412._8_4_ = auVar202._8_4_ * auVar16._8_4_;
                      auVar412._12_4_ = auVar202._12_4_ * auVar16._12_4_;
                      auVar412._16_4_ = auVar202._16_4_ * auVar16._16_4_;
                      auVar412._20_4_ = auVar202._20_4_ * auVar16._20_4_;
                      auVar412._28_36_ = auVar403._28_36_;
                      auVar412._24_4_ = auVar202._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar412._0_32_);
                      auVar41._4_4_ = auVar243._4_4_ * auVar412._4_4_;
                      auVar41._0_4_ = auVar243._0_4_ * auVar412._0_4_;
                      auVar41._8_4_ = auVar243._8_4_ * auVar412._8_4_;
                      auVar41._12_4_ = auVar243._12_4_ * auVar412._12_4_;
                      auVar41._16_4_ = auVar243._16_4_ * auVar412._16_4_;
                      auVar41._20_4_ = auVar243._20_4_ * auVar412._20_4_;
                      auVar41._24_4_ = auVar243._24_4_ * auVar412._24_4_;
                      auVar41._28_4_ = auVar243._28_4_;
                      auVar243 = vsubps_avx(auVar202,auVar41);
                      auVar364._0_4_ = auVar412._0_4_ + auVar16._0_4_ * auVar243._0_4_;
                      auVar364._4_4_ = auVar412._4_4_ + auVar16._4_4_ * auVar243._4_4_;
                      auVar364._8_4_ = auVar412._8_4_ + auVar16._8_4_ * auVar243._8_4_;
                      auVar364._12_4_ = auVar412._12_4_ + auVar16._12_4_ * auVar243._12_4_;
                      auVar364._16_4_ = auVar412._16_4_ + auVar16._16_4_ * auVar243._16_4_;
                      auVar364._20_4_ = auVar412._20_4_ + auVar16._20_4_ * auVar243._20_4_;
                      auVar364._24_4_ = auVar412._24_4_ + auVar16._24_4_ * auVar243._24_4_;
                      auVar364._28_4_ = auVar403._28_4_ + auVar243._28_4_;
                      *pauVar86 = auVar364;
                      pauVar93 = pauVar93 + 1;
                      pauVar86 = pauVar86 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                      auVar403 = in_ZMM3;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    auVar403 = in_ZMM3;
                    do {
                      auVar202 = *(undefined1 (*) [32])((long)pvVar100 + lVar98);
                      auVar16 = vrcpps_avx(auVar202);
                      auVar243 = *(undefined1 (*) [32])
                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar84);
                      auVar416._0_4_ = auVar243._0_4_ * auVar16._0_4_;
                      auVar416._4_4_ = auVar243._4_4_ * auVar16._4_4_;
                      auVar416._8_4_ = auVar243._8_4_ * auVar16._8_4_;
                      auVar416._12_4_ = auVar243._12_4_ * auVar16._12_4_;
                      auVar416._16_4_ = auVar243._16_4_ * auVar16._16_4_;
                      auVar416._20_4_ = auVar243._20_4_ * auVar16._20_4_;
                      auVar416._28_36_ = auVar403._28_36_;
                      auVar416._24_4_ = auVar243._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar416._0_32_);
                      auVar46._4_4_ = auVar202._4_4_ * auVar416._4_4_;
                      auVar46._0_4_ = auVar202._0_4_ * auVar416._0_4_;
                      auVar46._8_4_ = auVar202._8_4_ * auVar416._8_4_;
                      auVar46._12_4_ = auVar202._12_4_ * auVar416._12_4_;
                      auVar46._16_4_ = auVar202._16_4_ * auVar416._16_4_;
                      auVar46._20_4_ = auVar202._20_4_ * auVar416._20_4_;
                      auVar46._24_4_ = auVar202._24_4_ * auVar416._24_4_;
                      auVar46._28_4_ = auVar202._28_4_;
                      auVar202 = vsubps_avx(auVar243,auVar46);
                      auVar248._0_4_ = auVar416._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                      auVar248._4_4_ = auVar416._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                      auVar248._8_4_ = auVar416._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                      auVar248._12_4_ = auVar416._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                      auVar248._16_4_ = auVar416._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                      auVar248._20_4_ = auVar416._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                      auVar248._24_4_ = auVar416._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                      auVar248._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                      *(undefined1 (*) [32])((long)pvVar95 + lVar98) = auVar248;
                      lVar98 = lVar98 + 0x20;
                      auVar403 = in_ZMM3;
                    } while (uVar83 << 5 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            auVar250._8_4_ = 0x3f800000;
            auVar250._0_8_ = 0x3f8000003f800000;
            auVar250._12_4_ = 0x3f800000;
            auVar250._16_4_ = 0x3f800000;
            auVar250._20_4_ = 0x3f800000;
            auVar250._24_4_ = 0x3f800000;
            auVar250._28_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar86 = (undefined1 (*) [32])
                           (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar84 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar202 = *(undefined1 (*) [32])
                                ((long)pvVar80 + uVar84 * 0x20 + sVar10 * uVar83 * sVar11);
                    auVar243 = vrcpps_avx(auVar202);
                    fVar397 = auVar243._0_4_;
                    fVar426 = auVar243._4_4_;
                    auVar52._4_4_ = auVar202._4_4_ * fVar426;
                    auVar52._0_4_ = auVar202._0_4_ * fVar397;
                    fVar427 = auVar243._8_4_;
                    auVar52._8_4_ = auVar202._8_4_ * fVar427;
                    fVar428 = auVar243._12_4_;
                    auVar52._12_4_ = auVar202._12_4_ * fVar428;
                    fVar429 = auVar243._16_4_;
                    auVar52._16_4_ = auVar202._16_4_ * fVar429;
                    fVar14 = auVar243._20_4_;
                    auVar52._20_4_ = auVar202._20_4_ * fVar14;
                    fVar15 = auVar243._24_4_;
                    auVar52._24_4_ = auVar202._24_4_ * fVar15;
                    auVar52._28_4_ = auVar202._28_4_;
                    auVar202 = vsubps_avx(auVar250,auVar52);
                    uVar104 = uVar103;
                    do {
                      auVar69._4_4_ = (fVar426 + fVar426 * auVar202._4_4_) * pfVar96[1];
                      auVar69._0_4_ = (fVar397 + fVar397 * auVar202._0_4_) * *pfVar96;
                      auVar69._8_4_ = (fVar427 + fVar427 * auVar202._8_4_) * pfVar96[2];
                      auVar69._12_4_ = (fVar428 + fVar428 * auVar202._12_4_) * pfVar96[3];
                      auVar69._16_4_ = (fVar429 + fVar429 * auVar202._16_4_) * pfVar96[4];
                      auVar69._20_4_ = (fVar14 + fVar14 * auVar202._20_4_) * pfVar96[5];
                      auVar69._24_4_ = (fVar15 + fVar15 * auVar202._24_4_) * pfVar96[6];
                      auVar69._28_4_ = auVar243._28_4_;
                      *pauVar86 = auVar69;
                      pfVar96 = pfVar96 + 8;
                      pauVar86 = pauVar86 + 1;
                      uVar104 = uVar104 - 1;
                      auVar243 = auVar69;
                    } while (uVar104 != 0);
                  }
                  uVar84 = uVar84 + 1;
                } while (uVar84 != uVar102);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_130) {
            local_128 = (void *)(uVar84 << 5);
            iVar79 = 0;
            do {
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    auVar403 = in_ZMM3;
                    do {
                      auVar202 = *(undefined1 (*) [32])((long)auVar78 + lVar98);
                      auVar16 = vrcpps_avx(auVar202);
                      auVar243 = *(undefined1 (*) [32])((long)auVar89 + lVar98);
                      auVar423._0_4_ = auVar243._0_4_ * auVar16._0_4_;
                      auVar423._4_4_ = auVar243._4_4_ * auVar16._4_4_;
                      auVar423._8_4_ = auVar243._8_4_ * auVar16._8_4_;
                      auVar423._12_4_ = auVar243._12_4_ * auVar16._12_4_;
                      auVar423._16_4_ = auVar243._16_4_ * auVar16._16_4_;
                      auVar423._20_4_ = auVar243._20_4_ * auVar16._20_4_;
                      auVar423._28_36_ = auVar403._28_36_;
                      auVar423._24_4_ = auVar243._24_4_ * auVar16._24_4_;
                      in_ZMM3 = ZEXT3264(auVar423._0_32_);
                      auVar57._4_4_ = auVar202._4_4_ * auVar423._4_4_;
                      auVar57._0_4_ = auVar202._0_4_ * auVar423._0_4_;
                      auVar57._8_4_ = auVar202._8_4_ * auVar423._8_4_;
                      auVar57._12_4_ = auVar202._12_4_ * auVar423._12_4_;
                      auVar57._16_4_ = auVar202._16_4_ * auVar423._16_4_;
                      auVar57._20_4_ = auVar202._20_4_ * auVar423._20_4_;
                      auVar57._24_4_ = auVar202._24_4_ * auVar423._24_4_;
                      auVar57._28_4_ = auVar202._28_4_;
                      auVar202 = vsubps_avx(auVar243,auVar57);
                      auVar255._0_4_ = auVar423._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                      auVar255._4_4_ = auVar423._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                      auVar255._8_4_ = auVar423._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                      auVar255._12_4_ = auVar423._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                      auVar255._16_4_ = auVar423._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                      auVar255._20_4_ = auVar423._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                      auVar255._24_4_ = auVar423._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                      auVar255._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                      *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar255;
                      lVar98 = lVar98 + 0x20;
                      auVar403 = in_ZMM3;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_130);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_100) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_118) {
              lVar98 = 0;
              auVar403 = in_ZMM3;
              iVar81 = (int)local_118;
              do {
                auVar202 = *(undefined1 (*) [32])((long)auVar78 + lVar98);
                auVar16 = vrcpps_avx(auVar202);
                auVar243 = *(undefined1 (*) [32])((long)auVar89 + lVar98);
                auVar425._0_4_ = auVar243._0_4_ * auVar16._0_4_;
                auVar425._4_4_ = auVar243._4_4_ * auVar16._4_4_;
                auVar425._8_4_ = auVar243._8_4_ * auVar16._8_4_;
                auVar425._12_4_ = auVar243._12_4_ * auVar16._12_4_;
                auVar425._16_4_ = auVar243._16_4_ * auVar16._16_4_;
                auVar425._20_4_ = auVar243._20_4_ * auVar16._20_4_;
                auVar425._28_36_ = auVar403._28_36_;
                auVar425._24_4_ = auVar243._24_4_ * auVar16._24_4_;
                in_ZMM3 = ZEXT3264(auVar425._0_32_);
                auVar60._4_4_ = auVar202._4_4_ * auVar425._4_4_;
                auVar60._0_4_ = auVar202._0_4_ * auVar425._0_4_;
                auVar60._8_4_ = auVar202._8_4_ * auVar425._8_4_;
                auVar60._12_4_ = auVar202._12_4_ * auVar425._12_4_;
                auVar60._16_4_ = auVar202._16_4_ * auVar425._16_4_;
                auVar60._20_4_ = auVar202._20_4_ * auVar425._20_4_;
                auVar60._24_4_ = auVar202._24_4_ * auVar425._24_4_;
                auVar60._28_4_ = auVar202._28_4_;
                auVar202 = vsubps_avx(auVar243,auVar60);
                auVar258._0_4_ = auVar425._0_4_ + auVar16._0_4_ * auVar202._0_4_;
                auVar258._4_4_ = auVar425._4_4_ + auVar16._4_4_ * auVar202._4_4_;
                auVar258._8_4_ = auVar425._8_4_ + auVar16._8_4_ * auVar202._8_4_;
                auVar258._12_4_ = auVar425._12_4_ + auVar16._12_4_ * auVar202._12_4_;
                auVar258._16_4_ = auVar425._16_4_ + auVar16._16_4_ * auVar202._16_4_;
                auVar258._20_4_ = auVar425._20_4_ + auVar16._20_4_ * auVar202._20_4_;
                auVar258._24_4_ = auVar425._24_4_ + auVar16._24_4_ * auVar202._24_4_;
                auVar258._28_4_ = auVar403._28_4_ + auVar202._28_4_;
                *(undefined1 (*) [32])((long)auVar109 + lVar98) = auVar258;
                lVar98 = lVar98 + 0x20;
                iVar81 = iVar81 + -1;
                auVar403 = in_ZMM3;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_100);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  if (iVar81 == 4 || iVar79 == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_avx[-3])) {
    case 0:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 + *pfVar96;
                  pfVar97[1] = fVar397 + fVar426;
                  pfVar97[2] = fVar397 + fVar427;
                  pfVar97[3] = fVar397 + fVar428;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                fVar397 = *pMVar8->data;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 + *pfVar96;
                  pfVar97[1] = fVar397 + fVar426;
                  pfVar97[2] = fVar397 + fVar427;
                  pfVar97[3] = fVar397 + fVar428;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar287._0_4_ = fVar397 + *pfVar96;
                      auVar287._4_4_ = fVar397 + pfVar96[1];
                      auVar287._8_4_ = fVar397 + pfVar96[2];
                      auVar287._12_4_ = fVar397 + pfVar96[3];
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar287;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                pfVar96 = (float *)((long)pvVar100 + lVar98);
                fVar397 = pfVar96[1];
                fVar426 = pfVar96[2];
                fVar427 = pfVar96[3];
                pfVar97 = (float *)((long)pvVar95 + lVar98);
                fVar428 = pfVar97[1];
                fVar429 = pfVar97[2];
                fVar14 = pfVar97[3];
                pfVar2 = (float *)((long)pvVar80 + lVar98);
                *pfVar2 = *pfVar96 + *pfVar97;
                pfVar2[1] = fVar397 + fVar428;
                pfVar2[2] = fVar426 + fVar429;
                pfVar2[3] = fVar427 + fVar14;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *local_110->data;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              pfVar97 = (float *)((long)pvVar80 + lVar98);
              *pfVar97 = fVar397 + *pfVar96;
              pfVar97[1] = fVar397 + fVar426;
              pfVar97[2] = fVar397 + fVar427;
              pfVar97[3] = fVar397 + fVar428;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pfVar96 = (float *)pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar311._0_4_ = auVar134._0_4_ + *pfVar96;
                    auVar311._4_4_ = auVar134._4_4_ + pfVar96[1];
                    auVar311._8_4_ = auVar134._8_4_ + pfVar96[2];
                    auVar311._12_4_ = auVar134._12_4_ + pfVar96[3];
                    *pauVar87 = auVar311;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                auVar293._0_4_ = auVar134._0_4_ + *pfVar96;
                auVar293._4_4_ = auVar134._4_4_ + pfVar96[1];
                auVar293._8_4_ = auVar134._8_4_ + pfVar96[2];
                auVar293._12_4_ = auVar134._12_4_ + pfVar96[3];
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar293
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar94 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar94;
                      uVar101 = uVar103;
                      do {
                        auVar284._0_4_ = auVar134._0_4_ + *pfVar96;
                        auVar284._4_4_ = auVar134._4_4_ + pfVar96[1];
                        auVar284._8_4_ = auVar134._8_4_ + pfVar96[2];
                        auVar284._12_4_ = auVar134._12_4_ + pfVar96[3];
                        *pauVar87 = auVar284;
                        pfVar96 = pfVar96 + 4;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar94 = pauVar94 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar100 + lVar98);
              fVar397 = pfVar96[1];
              fVar426 = pfVar96[2];
              fVar427 = pfVar96[3];
              pfVar97 = (float *)((long)pvVar95 + lVar98);
              fVar428 = pfVar97[1];
              fVar429 = pfVar97[2];
              fVar14 = pfVar97[3];
              pfVar2 = (float *)((long)pvVar80 + lVar98);
              *pfVar2 = *pfVar96 + *pfVar97;
              pfVar2[1] = fVar397 + fVar428;
              pfVar2[2] = fVar426 + fVar429;
              pfVar2[3] = fVar427 + fVar14;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)local_120->data;
              pauVar94 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar82 = uVar83;
                  do {
                    auVar343._0_4_ = auVar134._0_4_ + *pfVar96;
                    auVar343._4_4_ = auVar134._4_4_ + pfVar96[1];
                    auVar343._8_4_ = auVar134._8_4_ + pfVar96[2];
                    auVar343._12_4_ = auVar134._12_4_ + pfVar96[3];
                    *pauVar87 = auVar343;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar397 = *local_110->data;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              pfVar97 = (float *)((long)*pauVar87 + lVar98);
              *pfVar97 = fVar397 + *pfVar96;
              pfVar97[1] = fVar397 + fVar426;
              pfVar97[2] = fVar397 + fVar427;
              pfVar97[3] = fVar397 + fVar428;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar332._0_4_ = auVar134._0_4_ + *pfVar96;
                    auVar332._4_4_ = auVar134._4_4_ + pfVar96[1];
                    auVar332._8_4_ = auVar134._8_4_ + pfVar96[2];
                    auVar332._12_4_ = auVar134._12_4_ + pfVar96[3];
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar332;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar397 = *local_110->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar325._0_4_ = fVar397 + *pfVar96;
                  auVar325._4_4_ = fVar397 + pfVar96[1];
                  auVar325._8_4_ = fVar397 + pfVar96[2];
                  auVar325._12_4_ = fVar397 + pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar325;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar96 = (float *)(pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar298._0_4_ = auVar134._0_4_ + *pfVar96;
                    auVar298._4_4_ = auVar134._4_4_ + pfVar96[1];
                    auVar298._8_4_ = auVar134._8_4_ + pfVar96[2];
                    auVar298._12_4_ = auVar134._12_4_ + pfVar96[3];
                    *pauVar87 = auVar298;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar275._0_4_ = auVar134._0_4_ + *pfVar96;
                  auVar275._4_4_ = auVar134._4_4_ + pfVar96[1];
                  auVar275._8_4_ = auVar134._8_4_ + pfVar96[2];
                  auVar275._12_4_ = auVar134._12_4_ + pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar275;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar82);
                  auVar128._0_4_ = fVar397 + *pfVar96;
                  auVar128._4_4_ = fVar397 + pfVar96[1];
                  auVar128._8_4_ = fVar397 + pfVar96[2];
                  auVar128._12_4_ = fVar397 + pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar128;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                  auVar306._0_4_ = auVar134._0_4_ + *pfVar96;
                  auVar306._4_4_ = auVar134._4_4_ + pfVar96[1];
                  auVar306._8_4_ = auVar134._8_4_ + pfVar96[2];
                  auVar306._12_4_ = auVar134._12_4_ + pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar306;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar83);
                  auVar162._0_4_ = fVar397 + *pfVar96;
                  auVar162._4_4_ = fVar397 + pfVar96[1];
                  auVar162._8_4_ = fVar397 + pfVar96[2];
                  auVar162._12_4_ = fVar397 + pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar162;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar320._0_4_ = auVar134._0_4_ + *pfVar96;
                      auVar320._4_4_ = auVar134._4_4_ + pfVar96[1];
                      auVar320._8_4_ = auVar134._8_4_ + pfVar96[2];
                      auVar320._12_4_ = auVar134._12_4_ + pfVar96[3];
                      *pauVar87 = auVar320;
                      pfVar96 = pfVar96 + 4;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                      pfVar97 = (float *)((long)pvVar100 + lVar98);
                      auVar180._0_4_ = *pfVar96 + *pfVar97;
                      auVar180._4_4_ = pfVar96[1] + pfVar97[1];
                      auVar180._8_4_ = pfVar96[2] + pfVar97[2];
                      auVar180._12_4_ = pfVar96[3] + pfVar97[3];
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar180;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120[1].cstep * uVar82 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar339._0_4_ = auVar134._0_4_ + *pfVar96;
                      auVar339._4_4_ = auVar134._4_4_ + pfVar96[1];
                      auVar339._8_4_ = auVar134._8_4_ + pfVar96[2];
                      auVar339._12_4_ = auVar134._12_4_ + pfVar96[3];
                      *pauVar87 = auVar339;
                      pfVar96 = pfVar96 + 4;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)auVar89 + lVar98);
                      pfVar97 = (float *)((long)auVar78 + lVar98);
                      auVar189._0_4_ = *pfVar96 + *pfVar97;
                      auVar189._4_4_ = pfVar96[1] + pfVar97[1];
                      auVar189._8_4_ = pfVar96[2] + pfVar97[2];
                      auVar189._12_4_ = pfVar96[3] + pfVar97[3];
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar189;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                pfVar96 = (float *)((long)auVar89 + lVar98);
                pfVar97 = (float *)((long)auVar78 + lVar98);
                auVar194._0_4_ = *pfVar96 + *pfVar97;
                auVar194._4_4_ = pfVar96[1] + pfVar97[1];
                auVar194._8_4_ = pfVar96[2] + pfVar97[2];
                auVar194._12_4_ = pfVar96[3] + pfVar97[3];
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar194;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 1:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar150._4_4_ = uVar4;
                auVar150._0_4_ = uVar4;
                auVar150._8_4_ = uVar4;
                auVar150._12_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar134 = vsubps_avx(auVar150,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                uVar4 = *pMVar8->data;
                auVar147._4_4_ = uVar4;
                auVar147._0_4_ = uVar4;
                auVar147._8_4_ = uVar4;
                auVar147._12_4_ = uVar4;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  auVar134 = vsubps_avx(auVar147,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar117._4_4_ = uVar4;
                auVar117._0_4_ = uVar4;
                auVar117._8_4_ = uVar4;
                auVar117._12_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      auVar134 = vsubps_avx(auVar117,*(undefined1 (*) [16])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar134;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [16])((long)pvVar100 + lVar98));
                *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar139._4_4_ = uVar4;
            auVar139._0_4_ = uVar4;
            auVar139._8_4_ = uVar4;
            auVar139._12_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),auVar139);
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pauVar92 = (undefined1 (*) [16])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar133 = vsubps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                auVar133 = vsubps_avx(auVar134,*(undefined1 (*) [16])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar133
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar92 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar92;
                      uVar101 = uVar103;
                      do {
                        auVar133 = vsubps_avx(auVar134,*pauVar94);
                        *pauVar87 = auVar133;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar92 = pauVar92 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [16])((long)pvVar100 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar94 = (undefined1 (*) [16])local_120->data;
              pauVar92 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar92;
                  uVar82 = uVar83;
                  do {
                    auVar133 = vsubps_avx(*pauVar94,auVar134);
                    *pauVar87 = auVar133;
                    pauVar94 = pauVar94 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar92 = pauVar92 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar170._4_4_ = uVar4;
            auVar170._0_4_ = uVar4;
            auVar170._8_4_ = uVar4;
            auVar170._12_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar80 + lVar98),auVar170);
              *(undefined1 (*) [16])((long)*pauVar87 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    auVar133 = vsubps_avx(*(undefined1 (*) [16])
                                           ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82),
                                          auVar134);
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar133;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar174._4_4_ = uVar4;
            auVar174._0_4_ = uVar4;
            auVar174._8_4_ = uVar4;
            auVar174._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82),
                                        auVar174);
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar92 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar133 = vsubps_avx(*pauVar92,auVar134);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar133 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82),
                                        auVar134);
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar302._4_4_ = uVar4;
                  auVar302._0_4_ = uVar4;
                  auVar302._8_4_ = uVar4;
                  auVar302._12_4_ = uVar4;
                  auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar82),
                                        auVar302);
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar133 = vsubps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar163._4_4_ = uVar4;
                  auVar163._0_4_ = uVar4;
                  auVar163._8_4_ = uVar4;
                  auVar163._12_4_ = uVar4;
                  auVar134 = vsubps_avx(auVar163,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar133 = vsubps_avx(*pauVar94,auVar134);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [16])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar82 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar133 = vsubps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [16])((long)auVar89 + lVar98));
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [16])((long)auVar89 + lVar98));
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 2:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 * *pfVar96;
                  pfVar97[1] = fVar397 * fVar426;
                  pfVar97[2] = fVar397 * fVar427;
                  pfVar97[3] = fVar397 * fVar428;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                fVar397 = *pMVar8->data;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar426 = pfVar96[1];
                  fVar427 = pfVar96[2];
                  fVar428 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = fVar397 * *pfVar96;
                  pfVar97[1] = fVar397 * fVar426;
                  pfVar97[2] = fVar397 * fVar427;
                  pfVar97[3] = fVar397 * fVar428;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar281._0_4_ = fVar397 * *pfVar96;
                      auVar281._4_4_ = fVar397 * pfVar96[1];
                      auVar281._8_4_ = fVar397 * pfVar96[2];
                      auVar281._12_4_ = fVar397 * pfVar96[3];
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar281;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                pfVar96 = (float *)((long)pvVar100 + lVar98);
                fVar397 = pfVar96[1];
                fVar426 = pfVar96[2];
                fVar427 = pfVar96[3];
                pfVar97 = (float *)((long)pvVar95 + lVar98);
                fVar428 = pfVar97[1];
                fVar429 = pfVar97[2];
                fVar14 = pfVar97[3];
                pfVar2 = (float *)((long)pvVar80 + lVar98);
                *pfVar2 = *pfVar96 * *pfVar97;
                pfVar2[1] = fVar397 * fVar428;
                pfVar2[2] = fVar426 * fVar429;
                pfVar2[3] = fVar427 * fVar14;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *local_110->data;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              pfVar97 = (float *)((long)pvVar80 + lVar98);
              *pfVar97 = fVar397 * *pfVar96;
              pfVar97[1] = fVar397 * fVar426;
              pfVar97[2] = fVar397 * fVar427;
              pfVar97[3] = fVar397 * fVar428;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pfVar96 = (float *)pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar308._0_4_ = auVar134._0_4_ * *pfVar96;
                    auVar308._4_4_ = auVar134._4_4_ * pfVar96[1];
                    auVar308._8_4_ = auVar134._8_4_ * pfVar96[2];
                    auVar308._12_4_ = auVar134._12_4_ * pfVar96[3];
                    *pauVar87 = auVar308;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                auVar290._0_4_ = auVar134._0_4_ * *pfVar96;
                auVar290._4_4_ = auVar134._4_4_ * pfVar96[1];
                auVar290._8_4_ = auVar134._8_4_ * pfVar96[2];
                auVar290._12_4_ = auVar134._12_4_ * pfVar96[3];
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar290
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pfVar96 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar94 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar94;
                      uVar101 = uVar103;
                      do {
                        auVar280._0_4_ = auVar134._0_4_ * *pfVar96;
                        auVar280._4_4_ = auVar134._4_4_ * pfVar96[1];
                        auVar280._8_4_ = auVar134._8_4_ * pfVar96[2];
                        auVar280._12_4_ = auVar134._12_4_ * pfVar96[3];
                        *pauVar87 = auVar280;
                        pfVar96 = pfVar96 + 4;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar94 = pauVar94 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar100 + lVar98);
              fVar397 = pfVar96[1];
              fVar426 = pfVar96[2];
              fVar427 = pfVar96[3];
              pfVar97 = (float *)((long)pvVar95 + lVar98);
              fVar428 = pfVar97[1];
              fVar429 = pfVar97[2];
              fVar14 = pfVar97[3];
              pfVar2 = (float *)((long)pvVar80 + lVar98);
              *pfVar2 = *pfVar96 * *pfVar97;
              pfVar2[1] = fVar397 * fVar428;
              pfVar2[2] = fVar426 * fVar429;
              pfVar2[3] = fVar427 * fVar14;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)local_120->data;
              pauVar94 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar82 = uVar83;
                  do {
                    auVar341._0_4_ = auVar134._0_4_ * *pfVar96;
                    auVar341._4_4_ = auVar134._4_4_ * pfVar96[1];
                    auVar341._8_4_ = auVar134._8_4_ * pfVar96[2];
                    auVar341._12_4_ = auVar134._12_4_ * pfVar96[3];
                    *pauVar87 = auVar341;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar397 = *local_110->data;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              fVar426 = pfVar96[1];
              fVar427 = pfVar96[2];
              fVar428 = pfVar96[3];
              pfVar97 = (float *)((long)*pauVar87 + lVar98);
              *pfVar97 = fVar397 * *pfVar96;
              pfVar97[1] = fVar397 * fVar426;
              pfVar97[2] = fVar397 * fVar427;
              pfVar97[3] = fVar397 * fVar428;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar330._0_4_ = auVar134._0_4_ * *pfVar96;
                    auVar330._4_4_ = auVar134._4_4_ * pfVar96[1];
                    auVar330._8_4_ = auVar134._8_4_ * pfVar96[2];
                    auVar330._12_4_ = auVar134._12_4_ * pfVar96[3];
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar330;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            fVar397 = *local_110->data;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar323._0_4_ = fVar397 * *pfVar96;
                  auVar323._4_4_ = fVar397 * pfVar96[1];
                  auVar323._8_4_ = fVar397 * pfVar96[2];
                  auVar323._12_4_ = fVar397 * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar323;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar96 = (float *)(pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar296._0_4_ = auVar134._0_4_ * *pfVar96;
                    auVar296._4_4_ = auVar134._4_4_ * pfVar96[1];
                    auVar296._8_4_ = auVar134._8_4_ * pfVar96[2];
                    auVar296._12_4_ = auVar134._12_4_ * pfVar96[3];
                    *pauVar87 = auVar296;
                    pfVar96 = pfVar96 + 4;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar276._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar276._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar276._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar276._12_4_ = auVar134._12_4_ * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar276;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar82);
                  auVar126._0_4_ = fVar397 * *pfVar96;
                  auVar126._4_4_ = fVar397 * pfVar96[1];
                  auVar126._8_4_ = fVar397 * pfVar96[2];
                  auVar126._12_4_ = fVar397 * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar126;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                  auVar303._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar303._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar303._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar303._12_4_ = auVar134._12_4_ * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar303;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar83);
                  auVar158._0_4_ = fVar397 * *pfVar96;
                  auVar158._4_4_ = fVar397 * pfVar96[1];
                  auVar158._8_4_ = fVar397 * pfVar96[2];
                  auVar158._12_4_ = fVar397 * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar158;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar318._0_4_ = auVar134._0_4_ * *pfVar96;
                      auVar318._4_4_ = auVar134._4_4_ * pfVar96[1];
                      auVar318._8_4_ = auVar134._8_4_ * pfVar96[2];
                      auVar318._12_4_ = auVar134._12_4_ * pfVar96[3];
                      *pauVar87 = auVar318;
                      pfVar96 = pfVar96 + 4;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                      pfVar97 = (float *)((long)pvVar100 + lVar98);
                      auVar178._0_4_ = *pfVar96 * *pfVar97;
                      auVar178._4_4_ = pfVar96[1] * pfVar97[1];
                      auVar178._8_4_ = pfVar96[2] * pfVar97[2];
                      auVar178._12_4_ = pfVar96[3] * pfVar97[3];
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar178;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar96 = (float *)(local_120[1].cstep * uVar82 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar336._0_4_ = auVar134._0_4_ * *pfVar96;
                      auVar336._4_4_ = auVar134._4_4_ * pfVar96[1];
                      auVar336._8_4_ = auVar134._8_4_ * pfVar96[2];
                      auVar336._12_4_ = auVar134._12_4_ * pfVar96[3];
                      *pauVar87 = auVar336;
                      pfVar96 = pfVar96 + 4;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      pfVar96 = (float *)((long)auVar89 + lVar98);
                      pfVar97 = (float *)((long)auVar78 + lVar98);
                      auVar187._0_4_ = *pfVar96 * *pfVar97;
                      auVar187._4_4_ = pfVar96[1] * pfVar97[1];
                      auVar187._8_4_ = pfVar96[2] * pfVar97[2];
                      auVar187._12_4_ = pfVar96[3] * pfVar97[3];
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar187;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                pfVar96 = (float *)((long)auVar89 + lVar98);
                pfVar97 = (float *)((long)auVar78 + lVar98);
                auVar192._0_4_ = *pfVar96 * *pfVar97;
                auVar192._4_4_ = pfVar96[1] * pfVar97[1];
                auVar192._8_4_ = pfVar96[2] * pfVar97[2];
                auVar192._12_4_ = pfVar96[3] * pfVar97[3];
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar192;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 3:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                fVar397 = *pMVar8->data;
                auVar148._4_4_ = fVar397;
                auVar148._0_4_ = fVar397;
                auVar148._8_4_ = fVar397;
                auVar148._12_4_ = fVar397;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
                  auVar133 = vrcpps_avx(auVar134);
                  fVar426 = fVar397 * auVar133._0_4_;
                  fVar427 = fVar397 * auVar133._4_4_;
                  fVar428 = fVar397 * auVar133._8_4_;
                  fVar429 = fVar397 * auVar133._12_4_;
                  auVar315._0_4_ = auVar134._0_4_ * fVar426;
                  auVar315._4_4_ = auVar134._4_4_ * fVar427;
                  auVar315._8_4_ = auVar134._8_4_ * fVar428;
                  auVar315._12_4_ = auVar134._12_4_ * fVar429;
                  auVar134 = vsubps_avx(auVar148,auVar315);
                  pfVar96 = (float *)((long)pvVar80 + lVar98);
                  *pfVar96 = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                  pfVar96[1] = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                  pfVar96[2] = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                  pfVar96[3] = fVar429 + auVar133._12_4_ * auVar134._12_4_;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                fVar397 = *pMVar8->data;
                auVar145._4_4_ = fVar397;
                auVar145._0_4_ = fVar397;
                auVar145._8_4_ = fVar397;
                auVar145._12_4_ = fVar397;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
                  auVar133 = vrcpps_avx(auVar134);
                  fVar426 = fVar397 * auVar133._0_4_;
                  fVar427 = fVar397 * auVar133._4_4_;
                  fVar428 = fVar397 * auVar133._8_4_;
                  fVar429 = fVar397 * auVar133._12_4_;
                  auVar314._0_4_ = auVar134._0_4_ * fVar426;
                  auVar314._4_4_ = auVar134._4_4_ * fVar427;
                  auVar314._8_4_ = auVar134._8_4_ * fVar428;
                  auVar314._12_4_ = auVar134._12_4_ * fVar429;
                  auVar134 = vsubps_avx(auVar145,auVar314);
                  pfVar96 = (float *)((long)pvVar80 + lVar98);
                  *pfVar96 = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                  pfVar96[1] = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                  pfVar96[2] = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                  pfVar96[3] = fVar429 + auVar133._12_4_ * auVar134._12_4_;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                fVar397 = *pMVar8->data;
                auVar115._4_4_ = fVar397;
                auVar115._0_4_ = fVar397;
                auVar115._8_4_ = fVar397;
                auVar115._12_4_ = fVar397;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      auVar134 = *(undefined1 (*) [16])
                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar133 = vrcpps_avx(auVar134);
                      fVar426 = fVar397 * auVar133._0_4_;
                      fVar427 = fVar397 * auVar133._4_4_;
                      fVar428 = fVar397 * auVar133._8_4_;
                      fVar429 = fVar397 * auVar133._12_4_;
                      auVar285._0_4_ = auVar134._0_4_ * fVar426;
                      auVar285._4_4_ = auVar134._4_4_ * fVar427;
                      auVar285._8_4_ = auVar134._8_4_ * fVar428;
                      auVar285._12_4_ = auVar134._12_4_ * fVar429;
                      auVar134 = vsubps_avx(auVar115,auVar285);
                      auVar286._0_4_ = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                      auVar286._4_4_ = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                      auVar286._8_4_ = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                      auVar286._12_4_ = fVar429 + auVar133._12_4_ * auVar134._12_4_;
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar286;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
                auVar133 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
                auVar113 = vrcpps_avx(auVar133);
                fVar397 = auVar134._0_4_ * auVar113._0_4_;
                fVar426 = auVar134._4_4_ * auVar113._4_4_;
                fVar427 = auVar134._8_4_ * auVar113._8_4_;
                fVar428 = auVar134._12_4_ * auVar113._12_4_;
                auVar335._0_4_ = auVar133._0_4_ * fVar397;
                auVar335._4_4_ = auVar133._4_4_ * fVar426;
                auVar335._8_4_ = auVar133._8_4_ * fVar427;
                auVar335._12_4_ = auVar133._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar134,auVar335);
                pfVar96 = (float *)((long)pvVar80 + lVar98);
                *pfVar96 = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                pfVar96[1] = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                pfVar96[2] = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                pfVar96[3] = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            auVar137._0_4_ = 1.0 / *local_110->data;
            auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar137,auVar137,0);
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              pfVar96 = (float *)((long)pvVar95 + lVar98);
              fVar397 = pfVar96[1];
              fVar426 = pfVar96[2];
              fVar427 = pfVar96[3];
              pfVar97 = (float *)((long)pvVar80 + lVar98);
              *pfVar97 = auVar134._0_4_ * *pfVar96;
              pfVar97[1] = auVar134._4_4_ * fVar397;
              pfVar97[2] = auVar134._8_4_ * fVar426;
              pfVar97[3] = auVar134._12_4_ * fVar427;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pauVar92 = (undefined1 (*) [16])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar133 = *pauVar92;
                    auVar113 = vrcpps_avx(auVar133);
                    fVar397 = auVar134._0_4_ * auVar113._0_4_;
                    fVar426 = auVar134._4_4_ * auVar113._4_4_;
                    fVar427 = auVar134._8_4_ * auVar113._8_4_;
                    fVar428 = auVar134._12_4_ * auVar113._12_4_;
                    auVar309._0_4_ = auVar133._0_4_ * fVar397;
                    auVar309._4_4_ = auVar133._4_4_ * fVar426;
                    auVar309._8_4_ = auVar133._8_4_ * fVar427;
                    auVar309._12_4_ = auVar133._12_4_ * fVar428;
                    auVar133 = vsubps_avx(auVar134,auVar309);
                    auVar310._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                    auVar310._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                    auVar310._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                    auVar310._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                    *pauVar87 = auVar310;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                auVar133 = *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83)
                ;
                auVar113 = vrcpps_avx(auVar133);
                fVar397 = auVar134._0_4_ * auVar113._0_4_;
                fVar426 = auVar134._4_4_ * auVar113._4_4_;
                fVar427 = auVar134._8_4_ * auVar113._8_4_;
                fVar428 = auVar134._12_4_ * auVar113._12_4_;
                auVar291._0_4_ = auVar133._0_4_ * fVar397;
                auVar291._4_4_ = auVar133._4_4_ * fVar426;
                auVar291._8_4_ = auVar133._8_4_ * fVar427;
                auVar291._12_4_ = auVar133._12_4_ * fVar428;
                auVar133 = vsubps_avx(auVar134,auVar291);
                auVar292._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                auVar292._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                auVar292._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                auVar292._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar292
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar92 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar92;
                      uVar101 = uVar103;
                      do {
                        auVar133 = *pauVar94;
                        auVar113 = vrcpps_avx(auVar133);
                        fVar397 = auVar134._0_4_ * auVar113._0_4_;
                        fVar426 = auVar134._4_4_ * auVar113._4_4_;
                        fVar427 = auVar134._8_4_ * auVar113._8_4_;
                        fVar428 = auVar134._12_4_ * auVar113._12_4_;
                        auVar282._0_4_ = auVar133._0_4_ * fVar397;
                        auVar282._4_4_ = auVar133._4_4_ * fVar426;
                        auVar282._8_4_ = auVar133._8_4_ * fVar427;
                        auVar282._12_4_ = auVar133._12_4_ * fVar428;
                        auVar133 = vsubps_avx(auVar134,auVar282);
                        auVar283._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                        auVar283._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                        auVar283._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                        auVar283._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                        *pauVar87 = auVar283;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar92 = pauVar92 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
              auVar133 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
              auVar113 = vrcpps_avx(auVar133);
              fVar397 = auVar134._0_4_ * auVar113._0_4_;
              fVar426 = auVar134._4_4_ * auVar113._4_4_;
              fVar427 = auVar134._8_4_ * auVar113._8_4_;
              fVar428 = auVar134._12_4_ * auVar113._12_4_;
              auVar295._0_4_ = auVar133._0_4_ * fVar397;
              auVar295._4_4_ = auVar133._4_4_ * fVar426;
              auVar295._8_4_ = auVar133._8_4_ * fVar427;
              auVar295._12_4_ = auVar133._12_4_ * fVar428;
              auVar134 = vsubps_avx(auVar134,auVar295);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = fVar397 + auVar113._0_4_ * auVar134._0_4_;
              pfVar96[1] = fVar426 + auVar113._4_4_ * auVar134._4_4_;
              pfVar96[2] = fVar427 + auVar113._8_4_ * auVar134._8_4_;
              pfVar96[3] = fVar428 + auVar113._12_4_ * auVar134._12_4_;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pfVar96 = (float *)pMVar9->data;
        if (pfVar96 == (float *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pfVar97 = (float *)local_120->data;
              pauVar87 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              auVar186._8_4_ = 0x3f800000;
              auVar186._0_8_ = 0x3f8000003f800000;
              auVar186._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar87;
                  auVar133 = vrcpps_avx(auVar134);
                  fVar397 = auVar133._0_4_;
                  auVar342._0_4_ = auVar134._0_4_ * fVar397;
                  fVar426 = auVar133._4_4_;
                  auVar342._4_4_ = auVar134._4_4_ * fVar426;
                  fVar427 = auVar133._8_4_;
                  auVar342._8_4_ = auVar134._8_4_ * fVar427;
                  fVar428 = auVar133._12_4_;
                  auVar342._12_4_ = auVar134._12_4_ * fVar428;
                  auVar134 = vsubps_avx(auVar186,auVar342);
                  uVar82 = uVar83;
                  do {
                    fVar429 = pfVar97[1];
                    fVar14 = pfVar97[2];
                    fVar15 = pfVar97[3];
                    *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                    pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                    pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                    pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                    pfVar97 = pfVar97 + 4;
                    pfVar96 = pfVar96 + 4;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            auVar168._0_4_ = 1.0 / *local_110->data;
            auVar168._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar168,auVar168,0);
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              pfVar97 = (float *)((long)pvVar80 + lVar98);
              fVar397 = pfVar97[1];
              fVar426 = pfVar97[2];
              fVar427 = pfVar97[3];
              pfVar2 = (float *)((long)pfVar96 + lVar98);
              *pfVar2 = auVar134._0_4_ * *pfVar97;
              pfVar2[1] = auVar134._4_4_ * fVar397;
              pfVar2[2] = auVar134._8_4_ * fVar426;
              pfVar2[3] = auVar134._12_4_ * fVar427;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              do {
                if (0 < (int)local_130) {
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar8->cstep;
                  auVar133 = vrcpps_avx(auVar134);
                  fVar397 = auVar133._0_4_;
                  auVar331._0_4_ = auVar134._0_4_ * fVar397;
                  fVar426 = auVar133._4_4_;
                  auVar331._4_4_ = auVar134._4_4_ * fVar426;
                  fVar427 = auVar133._8_4_;
                  auVar331._8_4_ = auVar134._8_4_ * fVar427;
                  fVar428 = auVar133._12_4_;
                  auVar331._12_4_ = auVar134._12_4_ * fVar428;
                  auVar134 = vsubps_avx(auVar183,auVar331);
                  sVar12 = pMVar9->elemsize;
                  pvVar80 = pMVar9->data;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar11 * sVar13 * uVar82);
                    fVar429 = pfVar96[1];
                    fVar14 = pfVar96[2];
                    fVar15 = pfVar96[3];
                    pfVar97 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar12 * uVar82);
                    *pfVar97 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar96;
                    pfVar97[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                    pfVar97[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                    pfVar97[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            auVar171._0_4_ = 1.0 / *pMVar8[1].data;
            auVar171._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar134 = vshufps_avx(auVar171,auVar171,0);
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar324._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar324._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar324._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar324._12_4_ = auVar134._12_4_ * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar324;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          auVar122._8_4_ = 0x3f800000;
          auVar122._0_8_ = 0x3f8000003f800000;
          auVar122._12_4_ = 0x3f800000;
          do {
            if (0 < (int)uVar6) {
              pfVar96 = (float *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar87 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pfVar97 = (float *)(pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar87;
                  auVar133 = vrcpps_avx(auVar134);
                  fVar397 = auVar133._0_4_;
                  auVar297._0_4_ = auVar134._0_4_ * fVar397;
                  fVar426 = auVar133._4_4_;
                  auVar297._4_4_ = auVar134._4_4_ * fVar426;
                  fVar427 = auVar133._8_4_;
                  auVar297._8_4_ = auVar134._8_4_ * fVar427;
                  fVar428 = auVar133._12_4_;
                  auVar297._12_4_ = auVar134._12_4_ * fVar428;
                  auVar134 = vsubps_avx(auVar122,auVar297);
                  uVar84 = uVar83;
                  do {
                    fVar429 = pfVar97[1];
                    fVar14 = pfVar97[2];
                    fVar15 = pfVar97[3];
                    *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                    pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                    pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                    pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                    pfVar97 = pfVar97 + 4;
                    pfVar96 = pfVar96 + 4;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = 0x3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar9->cstep;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                auVar133 = vrcpps_avx(auVar134);
                fVar397 = auVar133._0_4_;
                auVar277._0_4_ = auVar134._0_4_ * fVar397;
                fVar426 = auVar133._4_4_;
                auVar277._4_4_ = auVar134._4_4_ * fVar426;
                fVar427 = auVar133._8_4_;
                auVar277._8_4_ = auVar134._8_4_ * fVar427;
                fVar428 = auVar133._12_4_;
                auVar277._12_4_ = auVar134._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar112,auVar277);
                sVar12 = pMVar8->elemsize;
                pvVar80 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  pfVar96 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar12 * uVar82);
                  fVar429 = pfVar96[1];
                  fVar14 = pfVar96[2];
                  fVar15 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar95 + lVar98 + sVar11 * sVar13 * uVar82);
                  *pfVar97 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar96;
                  pfVar97[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                  pfVar97[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                  pfVar97[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar95 + lVar98)));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar82);
                  auVar301._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar301._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar301._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar301._12_4_ = auVar134._12_4_ * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar301;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar133 = *(undefined1 (*) [16])
                              ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                  auVar113 = vrcpps_avx(auVar133);
                  fVar397 = auVar134._0_4_ * auVar113._0_4_;
                  fVar426 = auVar134._4_4_ * auVar113._4_4_;
                  fVar427 = auVar134._8_4_ * auVar113._8_4_;
                  fVar428 = auVar134._12_4_ * auVar113._12_4_;
                  auVar304._0_4_ = auVar133._0_4_ * fVar397;
                  auVar304._4_4_ = auVar133._4_4_ * fVar426;
                  auVar304._8_4_ = auVar133._8_4_ * fVar427;
                  auVar304._12_4_ = auVar133._12_4_ * fVar428;
                  auVar133 = vsubps_avx(auVar134,auVar304);
                  auVar305._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                  auVar305._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                  auVar305._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                  auVar305._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar305;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  auVar159._4_4_ = fVar397;
                  auVar159._0_4_ = fVar397;
                  auVar159._8_4_ = fVar397;
                  auVar159._12_4_ = fVar397;
                  auVar134 = *(undefined1 (*) [16])
                              ((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar83);
                  auVar133 = vrcpps_avx(auVar134);
                  fVar426 = fVar397 * auVar133._0_4_;
                  fVar427 = fVar397 * auVar133._4_4_;
                  fVar428 = fVar397 * auVar133._8_4_;
                  fVar397 = fVar397 * auVar133._12_4_;
                  auVar316._0_4_ = auVar134._0_4_ * fVar426;
                  auVar316._4_4_ = auVar134._4_4_ * fVar427;
                  auVar316._8_4_ = auVar134._8_4_ * fVar428;
                  auVar316._12_4_ = auVar134._12_4_ * fVar397;
                  auVar134 = vsubps_avx(auVar159,auVar316);
                  auVar160._0_4_ = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                  auVar160._4_4_ = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                  auVar160._8_4_ = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                  auVar160._12_4_ = fVar397 + auVar133._12_4_ * auVar134._12_4_;
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar160;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            auVar165._8_4_ = 0x3f800000;
            auVar165._0_8_ = 0x3f8000003f800000;
            auVar165._12_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pfVar96 = (float *)(pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar97 = (float *)(local_120->cstep * uVar84 * local_120->elemsize +
                                   (long)local_120->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    auVar133 = vrcpps_avx(auVar134);
                    fVar397 = auVar133._0_4_;
                    auVar319._0_4_ = auVar134._0_4_ * fVar397;
                    fVar426 = auVar133._4_4_;
                    auVar319._4_4_ = auVar134._4_4_ * fVar426;
                    fVar427 = auVar133._8_4_;
                    auVar319._8_4_ = auVar134._8_4_ * fVar427;
                    fVar428 = auVar133._12_4_;
                    auVar319._12_4_ = auVar134._12_4_ * fVar428;
                    auVar134 = vsubps_avx(auVar165,auVar319);
                    uVar105 = uVar83;
                    do {
                      fVar429 = pfVar97[1];
                      fVar14 = pfVar97[2];
                      fVar15 = pfVar97[3];
                      *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                      pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                      pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                      pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                      pfVar97 = pfVar97 + 4;
                      pfVar96 = pfVar96 + 4;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
                      auVar133 = *(undefined1 (*) [16])
                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                      auVar113 = vrcpps_avx(auVar133);
                      fVar397 = auVar134._0_4_ * auVar113._0_4_;
                      fVar426 = auVar134._4_4_ * auVar113._4_4_;
                      fVar427 = auVar134._8_4_ * auVar113._8_4_;
                      fVar428 = auVar134._12_4_ * auVar113._12_4_;
                      auVar329._0_4_ = auVar133._0_4_ * fVar397;
                      auVar329._4_4_ = auVar133._4_4_ * fVar426;
                      auVar329._8_4_ = auVar133._8_4_ * fVar427;
                      auVar329._12_4_ = auVar133._12_4_ * fVar428;
                      auVar134 = vsubps_avx(auVar134,auVar329);
                      auVar179._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                      auVar179._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                      auVar179._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                      auVar179._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar179;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar82 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar133 = *pauVar94;
                      auVar113 = vrcpps_avx(auVar133);
                      fVar397 = auVar134._0_4_ * auVar113._0_4_;
                      fVar426 = auVar134._4_4_ * auVar113._4_4_;
                      fVar427 = auVar134._8_4_ * auVar113._8_4_;
                      fVar428 = auVar134._12_4_ * auVar113._12_4_;
                      auVar337._0_4_ = auVar133._0_4_ * fVar397;
                      auVar337._4_4_ = auVar133._4_4_ * fVar426;
                      auVar337._8_4_ = auVar133._8_4_ * fVar427;
                      auVar337._12_4_ = auVar133._12_4_ * fVar428;
                      auVar133 = vsubps_avx(auVar134,auVar337);
                      auVar338._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                      auVar338._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                      auVar338._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                      auVar338._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                      *pauVar87 = auVar338;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar101 == uVar7) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = *(undefined1 (*) [16])((long)auVar78 + lVar98);
                      auVar133 = *(undefined1 (*) [16])((long)auVar89 + lVar98);
                      auVar113 = vrcpps_avx(auVar133);
                      fVar397 = auVar134._0_4_ * auVar113._0_4_;
                      fVar426 = auVar134._4_4_ * auVar113._4_4_;
                      fVar427 = auVar134._8_4_ * auVar113._8_4_;
                      fVar428 = auVar134._12_4_ * auVar113._12_4_;
                      auVar346._0_4_ = auVar133._0_4_ * fVar397;
                      auVar346._4_4_ = auVar133._4_4_ * fVar426;
                      auVar346._8_4_ = auVar133._8_4_ * fVar427;
                      auVar346._12_4_ = auVar133._12_4_ * fVar428;
                      auVar134 = vsubps_avx(auVar134,auVar346);
                      auVar188._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                      auVar188._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                      auVar188._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                      auVar188._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar188;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = *(undefined1 (*) [16])((long)auVar78 + lVar98);
                auVar133 = *(undefined1 (*) [16])((long)auVar89 + lVar98);
                auVar113 = vrcpps_avx(auVar133);
                fVar397 = auVar134._0_4_ * auVar113._0_4_;
                fVar426 = auVar134._4_4_ * auVar113._4_4_;
                fVar427 = auVar134._8_4_ * auVar113._8_4_;
                fVar428 = auVar134._12_4_ * auVar113._12_4_;
                auVar347._0_4_ = auVar133._0_4_ * fVar397;
                auVar347._4_4_ = auVar133._4_4_ * fVar426;
                auVar347._8_4_ = auVar133._8_4_ * fVar427;
                auVar347._12_4_ = auVar133._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar134,auVar347);
                auVar193._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                auVar193._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                auVar193._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                auVar193._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar193;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 4:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar144._4_4_ = uVar4;
                auVar144._0_4_ = uVar4;
                auVar144._8_4_ = uVar4;
                auVar144._12_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar134 = vmaxps_avx(auVar144,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                uVar4 = *pMVar8->data;
                auVar143._4_4_ = uVar4;
                auVar143._0_4_ = uVar4;
                auVar143._8_4_ = uVar4;
                auVar143._12_4_ = uVar4;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  auVar134 = vmaxps_avx(auVar143,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar114._4_4_ = uVar4;
                auVar114._0_4_ = uVar4;
                auVar114._8_4_ = uVar4;
                auVar114._12_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      auVar134 = vmaxps_avx(auVar114,*(undefined1 (*) [16])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar134;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [16])((long)pvVar100 + lVar98));
                *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar136._4_4_ = uVar4;
            auVar136._0_4_ = uVar4;
            auVar136._8_4_ = uVar4;
            auVar136._12_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar134 = vmaxps_avx(auVar136,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pauVar92 = (undefined1 (*) [16])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar133 = vmaxps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                auVar133 = vmaxps_avx(auVar134,*(undefined1 (*) [16])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar133
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar92 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar92;
                      uVar101 = uVar103;
                      do {
                        auVar133 = vmaxps_avx(auVar134,*pauVar94);
                        *pauVar87 = auVar133;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar92 = pauVar92 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [16])((long)pvVar100 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar94 = (undefined1 (*) [16])local_120->data;
              pauVar92 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar92;
                  uVar82 = uVar83;
                  do {
                    auVar133 = vmaxps_avx(auVar134,*pauVar94);
                    *pauVar87 = auVar133;
                    pauVar94 = pauVar94 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar92 = pauVar92 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar166._4_4_ = uVar4;
            auVar166._0_4_ = uVar4;
            auVar166._8_4_ = uVar4;
            auVar166._12_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar134 = vmaxps_avx(auVar166,*(undefined1 (*) [16])((long)pvVar80 + lVar98));
              *(undefined1 (*) [16])((long)*pauVar87 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    auVar133 = vmaxps_avx(auVar134,*(undefined1 (*) [16])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar133;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar167._4_4_ = uVar4;
            auVar167._0_4_ = uVar4;
            auVar167._8_4_ = uVar4;
            auVar167._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = vmaxps_avx(auVar167,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar92 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar133 = vmaxps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar133 = vmaxps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar125._4_4_ = uVar4;
                  auVar125._0_4_ = uVar4;
                  auVar125._8_4_ = uVar4;
                  auVar125._12_4_ = uVar4;
                  auVar134 = vmaxps_avx(auVar125,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar133 = vmaxps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar157._4_4_ = uVar4;
                  auVar157._0_4_ = uVar4;
                  auVar157._8_4_ = uVar4;
                  auVar157._12_4_ = uVar4;
                  auVar134 = vmaxps_avx(auVar157,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar133 = vmaxps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [16])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar82 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar133 = vmaxps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = vmaxps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [16])((long)auVar89 + lVar98));
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = vmaxps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [16])((long)auVar89 + lVar98));
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 5:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar153._4_4_ = uVar4;
                auVar153._0_4_ = uVar4;
                auVar153._8_4_ = uVar4;
                auVar153._12_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar134 = vminps_avx(auVar153,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                uVar4 = *pMVar8->data;
                auVar151._4_4_ = uVar4;
                auVar151._0_4_ = uVar4;
                auVar151._8_4_ = uVar4;
                auVar151._12_4_ = uVar4;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  auVar134 = vminps_avx(auVar151,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar119._4_4_ = uVar4;
                auVar119._0_4_ = uVar4;
                auVar119._8_4_ = uVar4;
                auVar119._12_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      auVar134 = vminps_avx(auVar119,*(undefined1 (*) [16])
                                                      ((long)pvVar95 +
                                                      lVar98 + sVar12 * sVar13 * uVar83));
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar134;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = vminps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                      *(undefined1 (*) [16])((long)pvVar100 + lVar98));
                *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar141._4_4_ = uVar4;
            auVar141._0_4_ = uVar4;
            auVar141._8_4_ = uVar4;
            auVar141._12_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar134 = vminps_avx(auVar141,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pauVar92 = (undefined1 (*) [16])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar133 = vminps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                auVar133 = vminps_avx(auVar134,*(undefined1 (*) [16])
                                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83))
                ;
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar133
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar92 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar92;
                      uVar101 = uVar103;
                      do {
                        auVar133 = vminps_avx(auVar134,*pauVar94);
                        *pauVar87 = auVar133;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar92 = pauVar92 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = vminps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),
                                    *(undefined1 (*) [16])((long)pvVar100 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar94 = (undefined1 (*) [16])local_120->data;
              pauVar92 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar92;
                  uVar82 = uVar83;
                  do {
                    auVar133 = vminps_avx(auVar134,*pauVar94);
                    *pauVar87 = auVar133;
                    pauVar94 = pauVar94 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar92 = pauVar92 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar173._4_4_ = uVar4;
            auVar173._0_4_ = uVar4;
            auVar173._8_4_ = uVar4;
            auVar173._12_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar134 = vminps_avx(auVar173,*(undefined1 (*) [16])((long)pvVar80 + lVar98));
              *(undefined1 (*) [16])((long)*pauVar87 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    auVar133 = vminps_avx(auVar134,*(undefined1 (*) [16])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar133;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar176._4_4_ = uVar4;
            auVar176._0_4_ = uVar4;
            auVar176._8_4_ = uVar4;
            auVar176._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = vminps_avx(auVar176,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar92 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar133 = vminps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar133 = vminps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar129._4_4_ = uVar4;
                  auVar129._0_4_ = uVar4;
                  auVar129._8_4_ = uVar4;
                  auVar129._12_4_ = uVar4;
                  auVar134 = vminps_avx(auVar129,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar133 = vminps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar164._4_4_ = uVar4;
                  auVar164._0_4_ = uVar4;
                  auVar164._8_4_ = uVar4;
                  auVar164._12_4_ = uVar4;
                  auVar134 = vminps_avx(auVar164,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar83));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar133 = vminps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = vminps_avx(*(undefined1 (*) [16])((long)pvVar100 + lVar98),
                                            *(undefined1 (*) [16])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82));
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar82 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar133 = vminps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = vminps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                            *(undefined1 (*) [16])((long)auVar89 + lVar98));
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = vminps_avx(*(undefined1 (*) [16])((long)auVar78 + lVar98),
                                      *(undefined1 (*) [16])((long)auVar89 + lVar98));
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 6:
      uVar104 = pMVar8->w;
      local_100 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      iVar79 = pMVar8->elempack;
      uVar103 = pMVar8[1].w;
      local_118 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      local_130 = (void *)(ulong)uVar102;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      sVar11 = pMVar8[1].elemsize;
      iVar81 = pMVar8[1].elempack;
      iVar5 = pMVar8->dims;
      local_f0 = uVar82;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)local_118 < 1) {
                return 0;
              }
              pvVar95 = local_110->data;
              lVar98 = 0;
              uVar82 = local_118;
              do {
                pauVar87 = (undefined1 (*) [16])((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)(*pauVar87 + 8);
                local_80._0_16_ = *pauVar87;
                afVar430 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                      (__m128 *)local_80);
                puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
                *puVar90 = afVar430._0_8_;
                puVar90[1] = uVar271;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar88);
            Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              local_e0._4_4_ = *pMVar8->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)local_110 < 1) {
                return 0;
              }
              pvVar95 = pMVar1->data;
              lVar98 = 0;
              iVar79 = (int)local_110;
              do {
                pauVar87 = (undefined1 (*) [16])((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)(*pauVar87 + 8);
                local_80._0_16_ = *pauVar87;
                afVar430 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                      (__m128 *)local_80);
                puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
                *puVar90 = afVar430._0_8_;
                puVar90[1] = uVar271;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar88);
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              local_e0._4_4_ = *local_120->data;
              local_e0._0_4_ = local_e0._4_4_;
              fStack_d8 = (float)local_e0._4_4_;
              fStack_d4 = (float)local_e0._4_4_;
              if ((int)uVar101 < 1) {
                return 0;
              }
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_110) {
                  lVar98 = local_108->cstep * local_108->elemsize * (long)local_130;
                  pvVar80 = local_108->data;
                  local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize * (long)local_130
                                      + (long)local_120[1].data);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    auVar272 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar110)
                                                 + 8));
                    local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar110);
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar260._0_8_ = afVar430._0_8_;
                    auVar260._8_56_ = auVar272;
                    *(undefined1 (*) [16])((long)pvVar80 + lVar110 + lVar98) = auVar260._0_16_;
                    lVar110 = lVar110 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          afVar254 = _local_e0;
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 == 1 && pMVar8[1].w == 1) {
            local_e0._4_4_ = *pMVar1->data;
            local_e0._0_4_ = local_e0._4_4_;
            fStack_d8 = (float)local_e0._4_4_;
            _fStack_d0 = afVar254._16_16_;
            fStack_d4 = (float)local_e0._4_4_;
            if (0 < (int)local_100) {
              pvVar95 = pMVar8->data;
              lVar98 = 0;
              uVar82 = local_100;
              do {
                pauVar87 = (undefined1 (*) [16])((long)pvVar95 + lVar98);
                uVar271 = *(undefined8 *)(*pauVar87 + 8);
                local_80._0_16_ = *pauVar87;
                afVar430 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                      (__m128 *)local_e0);
                *(undefined8 *)((long)pvVar80 + lVar98) = afVar430._0_8_;
                ((undefined8 *)((long)pvVar80 + lVar98))[1] = uVar271;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar82 - 1;
                uVar82 = (ulong)uVar104;
              } while (uVar104 != 0);
            }
          }
          else {
            if ((int)local_100 < 1) {
              return 0;
            }
            pvVar95 = pMVar8->data;
            pvVar100 = pMVar8[1].data;
            lVar98 = 0;
            uVar82 = local_100;
            do {
              _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar95 + lVar98);
              pauVar87 = (undefined1 (*) [16])((long)pvVar100 + lVar98);
              uVar271 = *(undefined8 *)(*pauVar87 + 8);
              local_80._0_16_ = *pauVar87;
              afVar430 = binary_op_pow_pack4::operator()
                                   ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                    (__m128 *)local_80);
              *(undefined8 *)((long)pvVar80 + lVar98) = afVar430._0_8_;
              ((undefined8 *)((long)pvVar80 + lVar98))[1] = uVar271;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar82 - 1;
              uVar82 = (ulong)uVar104;
            } while (uVar104 != 0);
          }
        }
        else {
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,sVar11,iVar81,opt->blob_allocator);
            puVar90 = (undefined8 *)pMVar9->data;
            if (puVar90 == (undefined8 *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)local_130) {
                local_140 = (__m256 *)pMVar8->data;
                pauVar87 = (undefined1 (*) [16])pMVar8[1].data;
                local_128 = (void *)((ulong)local_128._4_4_ << 0x20);
                do {
                  _local_e0 = (__m128)*(undefined1 (*) [16])local_140;
                  uVar82 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      uVar271 = *(undefined8 *)(*pauVar87 + 8);
                      local_80._0_16_ = *pauVar87;
                      afVar430 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      *puVar90 = afVar430._0_8_;
                      puVar90[1] = uVar271;
                      pauVar87 = pauVar87 + 1;
                      puVar90 = puVar90 + 2;
                      uVar104 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar104;
                    } while (uVar104 != 0);
                  }
                  local_140 = (__m256 *)((long)local_140 + 0x10);
                  iVar79 = (int)local_128 + 1;
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                } while (iVar79 != (int)local_130);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            local_110 = (pointer)CONCAT44(local_110._4_4_,iVar88);
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (local_108->data == (void *)0x0) {
              return -100;
            }
            if ((long)local_108->c * local_108->cstep != 0) {
              if (0 < (int)uVar101) {
                local_130 = (void *)0x0;
                do {
                  _local_e0 = (__m128)*(undefined1 (*) [16])
                                       ((long)local_120->data + (long)local_130 * 0x10);
                  if (0 < (int)local_110) {
                    lVar110 = local_108->cstep * local_108->elemsize * (long)local_130;
                    pvVar80 = local_108->data;
                    local_128 = (void *)(local_120[1].cstep * local_120[1].elemsize *
                                         (long)local_130 + (long)local_120[1].data);
                    lVar98 = 0;
                    iVar79 = (int)local_110;
                    do {
                      uVar271 = *(undefined8 *)
                                 (*(undefined1 (*) [16])((long)local_128 + lVar98) + 8);
                      local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar98);
                      afVar430 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      puVar90 = (undefined8 *)((long)pvVar80 + lVar98 + lVar110);
                      *puVar90 = afVar430._0_8_;
                      puVar90[1] = uVar271;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  local_130 = (void *)((long)local_130 + 1);
                } while (local_130 != (void *)local_f0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        return 0;
      }
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_f8 = (ulong)uVar6;
      if (iVar5 != 2) {
        if (iVar5 != 3) {
          return 0;
        }
        local_e8 = CONCAT44(local_e8._4_4_,uVar6 * uVar104);
        uVar7 = pMVar8->c;
        local_60 = (ulong)uVar7;
        if (pMVar8[1].dims != 3) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          afVar254 = _local_e0;
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep == 0) {
            return -100;
          }
          iVar79 = (int)local_60;
          if (local_120[1].dims != 1) {
            if (local_120[1].dims != 2) {
              return 0;
            }
            if (0 < iVar79) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  pauVar92 = (undefined1 (*) [16])
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pauVar87 = (undefined1 (*) [16])
                             ((long)local_120[1].w * (long)local_130 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  iVar79 = 0;
                  do {
                    local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                    _local_e0 = (__m128)*pauVar87;
                    uVar82 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        auVar272 = ZEXT856(*(ulong *)(*pauVar94 + 8));
                        local_80._0_16_ = *pauVar94;
                        afVar430 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                              (__m128 *)local_e0);
                        auVar261._0_8_ = afVar430._0_8_;
                        auVar261._8_56_ = auVar272;
                        *pauVar92 = auVar261._0_16_;
                        pauVar94 = pauVar94 + 1;
                        pauVar92 = pauVar92 + 1;
                        uVar104 = (int)uVar82 - 1;
                        uVar82 = (ulong)uVar104;
                      } while (uVar104 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    iVar79 = (int)local_128 + 1;
                  } while (iVar79 != (int)local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < iVar79) {
              local_130 = (void *)0x0;
              do {
                pvVar80 = local_120->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120[1].data + (long)local_130 * 0x10);
                if (0 < (int)(uint)local_e8) {
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * (long)local_130 +
                                      (long)local_108->data);
                  lVar98 = local_120->cstep * local_120->elemsize * (long)local_130;
                  lVar110 = 0;
                  iVar79 = (uint)local_e8;
                  do {
                    pauVar87 = (undefined1 (*) [16])((long)pvVar80 + lVar110 + lVar98);
                    uVar271 = *(undefined8 *)(*pauVar87 + 8);
                    local_80._0_16_ = *pauVar87;
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                          (__m128 *)local_e0);
                    *(undefined8 *)((long)local_128 + lVar110) = afVar430._0_8_;
                    ((undefined8 *)((long)local_128 + lVar110))[1] = uVar271;
                    lVar110 = lVar110 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          local_e0._4_4_ = *pMVar1->data;
          local_e0._0_4_ = local_e0._4_4_;
          fStack_d8 = (float)local_e0._4_4_;
          fStack_d4 = (float)local_e0._4_4_;
          _fStack_d0 = afVar254._16_16_;
          if (iVar79 < 1) {
            return 0;
          }
          local_130 = (void *)0x0;
          do {
            if (0 < (int)(uint)local_e8) {
              lVar98 = local_108->cstep * local_108->elemsize * (long)local_130;
              pvVar80 = local_108->data;
              local_128 = (void *)(local_120->cstep * local_120->elemsize * (long)local_130 +
                                  (long)local_120->data);
              lVar110 = 0;
              iVar79 = (uint)local_e8;
              do {
                auVar272 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar110) + 8)
                                  );
                local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar110);
                afVar430 = binary_op_pow_pack4::operator()
                                     ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                      (__m128 *)local_e0);
                auVar265._0_8_ = afVar430._0_8_;
                auVar265._8_56_ = auVar272;
                *(undefined1 (*) [16])((long)pvVar80 + lVar110 + lVar98) = auVar265._0_16_;
                lVar110 = lVar110 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            local_130 = (void *)((long)local_130 + 1);
          } while (local_130 != (void *)local_60);
          return 0;
        }
        if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_60) {
              local_130 = (void *)0x0;
              do {
                pvVar80 = local_120->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120[1].data +
                                     local_120[1].cstep * (long)local_130 * local_120[1].elemsize);
                if (0 < (int)(uint)local_e8) {
                  lVar98 = local_120->cstep * local_120->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_108->data +
                                      local_108->cstep * local_108->elemsize * (long)local_130);
                  lVar110 = 0;
                  iVar79 = (uint)local_e8;
                  do {
                    pauVar87 = (undefined1 (*) [16])((long)pvVar80 + lVar110 + lVar98);
                    uVar271 = *(undefined8 *)(*pauVar87 + 8);
                    local_80._0_16_ = *pauVar87;
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                          (__m128 *)local_e0);
                    *(undefined8 *)((long)local_128 + lVar110) = afVar430._0_8_;
                    ((undefined8 *)((long)local_128 + lVar110))[1] = uVar271;
                    lVar110 = lVar110 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_60);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_60) {
              local_118 = 0;
              do {
                if (0 < (int)(uint)local_e8) {
                  lVar98 = local_120->cstep * local_120->elemsize * local_118;
                  pvVar80 = local_120->data;
                  local_130 = local_120[1].data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar110 = 0;
                  iVar79 = (uint)local_e8;
                  do {
                    _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar80 + lVar110 * 4 + lVar98)
                    ;
                    uVar4 = *(undefined4 *)((long)local_130 + lVar110);
                    auVar130._4_4_ = uVar4;
                    auVar130._0_4_ = uVar4;
                    auVar130._8_4_ = uVar4;
                    auVar130._12_4_ = uVar4;
                    auVar272 = ZEXT856(auVar130._8_8_);
                    local_80[0] = (float)uVar4;
                    local_80[1] = (float)uVar4;
                    local_80[2] = (float)uVar4;
                    local_80[3] = (float)uVar4;
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar262._0_8_ = afVar430._0_8_;
                    auVar262._8_56_ = auVar272;
                    *(undefined1 (*) [16])((long)local_128 + lVar110 * 4) = auVar262._0_16_;
                    lVar110 = lVar110 + 4;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_60);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        local_110 = (pointer)CONCAT44(local_110._4_4_,iVar88);
        if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)uVar101) {
              local_130 = (void *)0x0;
              do {
                pvVar80 = local_108->data;
                _local_e0 = (__m128)*(undefined1 (*) [16])
                                     ((long)local_120->data +
                                     local_120->cstep * (long)local_130 * local_120->elemsize);
                if (0 < (int)local_110) {
                  lVar98 = local_108->cstep * local_108->elemsize * (long)local_130;
                  local_128 = (void *)((long)local_120[1].data +
                                      local_120[1].cstep * local_120[1].elemsize * (long)local_130);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    uVar271 = *(undefined8 *)(*(undefined1 (*) [16])((long)local_128 + lVar110) + 8)
                    ;
                    local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar110);
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    puVar90 = (undefined8 *)((long)pvVar80 + lVar110 + lVar98);
                    *puVar90 = afVar430._0_8_;
                    puVar90[1] = uVar271;
                    lVar110 = lVar110 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((uVar103 == uVar104) && (iVar79 == 1 && (uVar7 == 1 && uVar6 == uVar102))) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_118 = 0;
              do {
                if (0 < (int)local_110) {
                  lVar98 = local_120[1].cstep * local_120[1].elemsize * local_118;
                  pvVar80 = local_120[1].data;
                  local_130 = local_120->data;
                  local_128 = (void *)(local_108->cstep * local_108->elemsize * local_118 +
                                      (long)local_108->data);
                  lVar110 = 0;
                  iVar79 = (int)local_110;
                  do {
                    afVar254 = _local_e0;
                    local_e0._4_4_ = *(float *)((long)local_130 + lVar110);
                    local_e0._0_4_ = local_e0._4_4_;
                    fStack_d8 = (float)local_e0._4_4_;
                    _fStack_d0 = afVar254._16_16_;
                    fStack_d4 = (float)local_e0._4_4_;
                    pauVar87 = (undefined1 (*) [16])((long)pvVar80 + lVar110 * 4 + lVar98);
                    auVar272 = ZEXT856(*(ulong *)(*pauVar87 + 8));
                    local_80._0_16_ = *pauVar87;
                    afVar430 = binary_op_pow_pack4::operator()
                                         ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                          (__m128 *)local_80);
                    auVar263._0_8_ = afVar430._0_8_;
                    auVar263._8_56_ = auVar272;
                    *(undefined1 (*) [16])((long)local_128 + lVar110 * 4) = auVar263._0_16_;
                    lVar110 = lVar110 + 4;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                local_118 = local_118 + 1;
              } while (local_118 != local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
          Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
          if (local_108->data == (void *)0x0) {
            return -100;
          }
          if ((long)local_108->c * local_108->cstep != 0) {
            if (0 < (int)(uint)local_f0) {
              local_130 = (void *)0x0;
              do {
                if (0 < (int)local_f8) {
                  local_128 = (void *)(local_120[1].cstep * (long)local_130 * local_120[1].elemsize
                                      + (long)local_120[1].data);
                  pauVar87 = (undefined1 (*) [16])
                             (local_108->cstep * (long)local_130 * local_108->elemsize +
                             (long)local_108->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120->cstep * (long)local_130 * local_120->elemsize +
                             (long)local_120->data);
                  uVar82 = 0;
                  do {
                    _local_e0 = (__m128)*(undefined1 (*) [16])((long)local_128 + uVar82 * 0x10);
                    uVar83 = local_100 & 0xffffffff;
                    if (0 < (int)local_100) {
                      do {
                        auVar272 = ZEXT856(*(ulong *)(*pauVar94 + 8));
                        local_80._0_16_ = *pauVar94;
                        afVar430 = binary_op_pow_pack4::operator()
                                             ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                              (__m128 *)local_e0);
                        auVar264._0_8_ = afVar430._0_8_;
                        auVar264._8_56_ = auVar272;
                        *pauVar87 = auVar264._0_16_;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar104 = (int)uVar83 - 1;
                        uVar83 = (ulong)uVar104;
                      } while (uVar104 != 0);
                    }
                    uVar82 = uVar82 + 1;
                  } while (uVar82 != local_f8);
                }
                local_130 = (void *)((long)local_130 + 1);
              } while (local_130 != (void *)local_f0);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (((uVar102 != 1 || (uVar103 ^ uVar104) != 0) || uVar101 != uVar7) || uVar6 == 1) {
          if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                local_f8 = 0;
                do {
                  if (0 < (int)local_130) {
                    local_128 = (void *)(local_120->cstep * local_f8 * local_120->elemsize +
                                        (long)local_120->data);
                    pauVar94 = (undefined1 (*) [16])
                               (local_108->cstep * local_f8 * local_108->elemsize +
                               (long)local_108->data);
                    pauVar87 = (undefined1 (*) [16])
                               (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                               (long)local_120[1].data);
                    uVar82 = 0;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)local_128 + uVar82 * 0x10);
                      uVar83 = local_118 & 0xffffffff;
                      if (0 < (int)local_118) {
                        do {
                          auVar272 = ZEXT856(*(ulong *)(*pauVar87 + 8));
                          local_80._0_16_ = *pauVar87;
                          afVar430 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0
                                                ,(__m128 *)local_80);
                          auVar267._0_8_ = afVar430._0_8_;
                          auVar267._8_56_ = auVar272;
                          *pauVar94 = auVar267._0_16_;
                          pauVar87 = pauVar87 + 1;
                          pauVar94 = pauVar94 + 1;
                          uVar104 = (int)uVar83 - 1;
                          uVar83 = (ulong)uVar104;
                        } while (uVar104 != 0);
                      }
                      uVar82 = uVar82 + 1;
                    } while ((void *)uVar82 != local_130);
                  }
                  local_f8 = local_f8 + 1;
                } while (local_f8 != local_f0);
                return 0;
              }
              return 0;
            }
          }
          else if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_f0) {
                local_f8 = local_118 << 4;
                local_100 = 0;
                do {
                  iVar79 = (int)local_100;
                  Mat::channel((Mat *)local_e0,local_120,iVar79);
                  auVar78 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar79);
                  auVar89 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar79);
                  auVar109 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)local_130) {
                    iVar79 = 0;
                    pvVar80 = local_130;
                    do {
                      uVar82 = local_f8;
                      if (0 < (int)local_118) {
                        local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                        lVar98 = 0;
                        do {
                          _local_e0 = (__m128)*(undefined1 (*) [16])((long)auVar78 + lVar98);
                          auVar272 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])
                                                         ((long)auVar89 + lVar98) + 8));
                          local_80._0_16_ = *(undefined1 (*) [16])((long)auVar89 + lVar98);
                          afVar430 = binary_op_pow_pack4::operator()
                                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0
                                                ,(__m128 *)local_80);
                          auVar268._0_8_ = afVar430._0_8_;
                          auVar268._8_56_ = auVar272;
                          *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar268._0_16_;
                          lVar98 = lVar98 + 0x10;
                        } while (uVar82 != lVar98);
                        auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                        auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                        pvVar80 = local_130;
                        iVar79 = (int)local_128;
                      }
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != (int)pvVar80);
                  }
                  uVar104 = (int)local_100 + 1;
                  local_100 = (ulong)uVar104;
                } while (uVar104 != (uint)local_f0);
                return 0;
              }
              return 0;
            }
          }
          else {
            local_110 = pMVar1;
            Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
            if (pMVar9->data != (void *)0x0) {
              if ((long)local_108->c * local_108->cstep == 0) {
                return -100;
              }
              if (0 < (int)(uint)local_60) {
                local_130 = (void *)0x0;
                do {
                  iVar79 = (int)local_130;
                  Mat::channel((Mat *)local_e0,local_120,iVar79);
                  auVar78 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_110,iVar79);
                  local_128 = (void *)local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  Mat::channel((Mat *)local_e0,local_108,iVar79);
                  auVar89 = local_e0;
                  Mat::~Mat((Mat *)local_e0);
                  if (0 < (int)(uint)local_e8) {
                    lVar98 = 0;
                    iVar79 = (uint)local_e8;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)auVar78 + lVar98);
                      auVar272 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)local_128 + lVar98)
                                                   + 8));
                      local_80._0_16_ = *(undefined1 (*) [16])((long)local_128 + lVar98);
                      afVar430 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar269._0_8_ = afVar430._0_8_;
                      auVar269._8_56_ = auVar272;
                      *(undefined1 (*) [16])((long)auVar89 + lVar98) = auVar269._0_16_;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar104 = (int)local_130 + 1;
                  local_130 = (void *)(ulong)uVar104;
                } while (uVar104 != (uint)local_60);
                return 0;
              }
              return 0;
            }
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            lVar98 = local_100 << 4;
            local_130 = (void *)0x0;
            local_128 = (void *)lVar98;
            do {
              if (0 < (int)local_f8) {
                pvVar95 = (void *)(local_108->cstep * (long)local_130 * local_108->elemsize +
                                  (long)local_108->data);
                pvVar100 = (void *)(local_120->cstep * (long)local_130 * local_120->elemsize +
                                   (long)local_120->data);
                lVar110 = local_120[1].elemsize * local_120[1].cstep * (long)local_130;
                pvVar80 = local_120[1].data;
                iVar79 = 0;
                uVar82 = local_100;
                uVar83 = local_f8;
                do {
                  if (0 < (int)uVar82) {
                    lVar111 = 0;
                    do {
                      _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar100 + lVar111);
                      pauVar87 = (undefined1 (*) [16])((long)pvVar80 + lVar111 + lVar110);
                      auVar272 = ZEXT856(*(ulong *)(*pauVar87 + 8));
                      local_80._0_16_ = *pauVar87;
                      afVar430 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar266._0_8_ = afVar430._0_8_;
                      auVar266._8_56_ = auVar272;
                      *(undefined1 (*) [16])((long)pvVar95 + lVar111) = auVar266._0_16_;
                      lVar111 = lVar111 + 0x10;
                    } while (lVar98 != lVar111);
                    pvVar95 = (void *)((long)pvVar95 + lVar111);
                    pvVar100 = (void *)((long)pvVar100 + lVar111);
                    uVar82 = local_100;
                    uVar83 = local_f8;
                  }
                  iVar79 = iVar79 + 1;
                } while (iVar79 != (int)uVar83);
              }
              local_130 = (void *)((long)local_130 + 1);
            } while (local_130 != (void *)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (pMVar8[1].dims == 3) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,sVar11,iVar81,opt->blob_allocator);
        if (local_108->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)uVar101) {
            local_f8 = 0;
            do {
              if (0 < (int)local_130) {
                pauVar94 = (undefined1 (*) [16])
                           (local_108->cstep * local_f8 * local_108->elemsize +
                           (long)local_108->data);
                pauVar92 = (undefined1 (*) [16])
                           (local_120[1].cstep * local_f8 * local_120[1].elemsize +
                           (long)local_120[1].data);
                pauVar87 = (undefined1 (*) [16])
                           ((long)local_120->w * local_f8 * local_120->elemsize +
                           (long)local_120->data);
                iVar79 = 0;
                do {
                  local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
                  _local_e0 = (__m128)*pauVar87;
                  uVar82 = local_118 & 0xffffffff;
                  if (0 < (int)local_118) {
                    do {
                      auVar272 = ZEXT856(*(ulong *)(*pauVar92 + 8));
                      local_80._0_16_ = *pauVar92;
                      afVar430 = binary_op_pow_pack4::operator()
                                           ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                            (__m128 *)local_80);
                      auVar259._0_8_ = afVar430._0_8_;
                      auVar259._8_56_ = auVar272;
                      *pauVar94 = auVar259._0_16_;
                      pauVar92 = pauVar92 + 1;
                      pauVar94 = pauVar94 + 1;
                      uVar104 = (int)uVar82 - 1;
                      uVar82 = (ulong)uVar104;
                    } while (uVar104 != 0);
                  }
                  pauVar87 = pauVar87 + 1;
                  iVar79 = (int)local_128 + 1;
                } while (iVar79 != (int)local_130);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = CONCAT44(local_e8._4_4_,uVar6 * uVar104);
      Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
      pvVar80 = pMVar9->data;
      if (pvVar80 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_120[1].dims != 1) {
        if (local_120[1].dims != 2) {
          return 0;
        }
        if (0 < (int)(uint)local_e8) {
          pvVar95 = local_120->data;
          pvVar100 = local_120[1].data;
          lVar98 = 0;
          iVar79 = (uint)local_e8;
          do {
            _local_e0 = (__m128)*(undefined1 (*) [16])((long)pvVar95 + lVar98);
            pauVar87 = (undefined1 (*) [16])((long)pvVar100 + lVar98);
            uVar271 = *(undefined8 *)(*pauVar87 + 8);
            local_80._0_16_ = *pauVar87;
            afVar430 = binary_op_pow_pack4::operator()
                                 ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_e0,
                                  (__m128 *)local_80);
            puVar90 = (undefined8 *)((long)pvVar80 + lVar98);
            *puVar90 = afVar430._0_8_;
            puVar90[1] = uVar271;
            lVar98 = lVar98 + 0x10;
            iVar79 = iVar79 + -1;
          } while (iVar79 != 0);
          return 0;
        }
        return 0;
      }
      Mat::create(pMVar9,(int)local_100,(int)local_f8,sVar10,iVar79,opt->blob_allocator);
      afVar254 = _local_e0;
      puVar90 = (undefined8 *)pMVar9->data;
      if (puVar90 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep != 0) {
        if ((int)local_128 != 1 || local_120[1].w != 1) {
          if (0 < (int)local_f8) {
            pauVar87 = (undefined1 (*) [16])local_120->data;
            local_140 = (__m256 *)local_120[1].data;
            local_128 = (void *)((ulong)local_128 & 0xffffffff00000000);
            do {
              _local_e0 = (__m128)*(undefined1 (*) [16])local_140;
              uVar82 = local_100 & 0xffffffff;
              if (0 < (int)local_100) {
                do {
                  uVar271 = *(undefined8 *)(*pauVar87 + 8);
                  local_80._0_16_ = *pauVar87;
                  afVar430 = binary_op_pow_pack4::operator()
                                       ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                        (__m128 *)local_e0);
                  *puVar90 = afVar430._0_8_;
                  puVar90[1] = uVar271;
                  pauVar87 = pauVar87 + 1;
                  puVar90 = puVar90 + 2;
                  uVar104 = (int)uVar82 - 1;
                  uVar82 = (ulong)uVar104;
                } while (uVar104 != 0);
              }
              local_140 = (__m256 *)((long)local_140 + 0x10);
              iVar79 = (int)local_128 + 1;
              local_128 = (void *)CONCAT44(local_128._4_4_,iVar79);
            } while (iVar79 != (int)local_f8);
            return 0;
          }
          return 0;
        }
        local_e0._4_4_ = *pMVar1->data;
        local_e0._0_4_ = local_e0._4_4_;
        fStack_d8 = (float)local_e0._4_4_;
        _fStack_d0 = afVar254._16_16_;
        fStack_d4 = (float)local_e0._4_4_;
        if ((int)(uint)local_e8 < 1) {
          return 0;
        }
        pvVar80 = local_120->data;
        lVar98 = 0;
        iVar79 = (uint)local_e8;
        do {
          pauVar87 = (undefined1 (*) [16])((long)pvVar80 + lVar98);
          uVar271 = *(undefined8 *)(*pauVar87 + 8);
          local_80._0_16_ = *pauVar87;
          afVar430 = binary_op_pow_pack4::operator()
                               ((binary_op_pow_pack4 *)&local_131,(__m128 *)local_80,
                                (__m128 *)local_e0);
          *(undefined8 *)((long)puVar90 + lVar98) = afVar430._0_8_;
          ((undefined8 *)((long)puVar90 + lVar98))[1] = uVar271;
          lVar98 = lVar98 + 0x10;
          iVar79 = iVar79 + -1;
        } while (iVar79 != 0);
        return 0;
      }
      return -100;
    case 7:
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_f8 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                uVar4 = *pMVar8->data;
                auVar149._4_4_ = uVar4;
                auVar149._0_4_ = uVar4;
                auVar149._8_4_ = uVar4;
                auVar149._12_4_ = uVar4;
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),auVar149);
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                uVar4 = *pMVar8->data;
                auVar146._4_4_ = uVar4;
                auVar146._0_4_ = uVar4;
                auVar146._8_4_ = uVar4;
                auVar146._12_4_ = uVar4;
                pvVar95 = local_110->data;
                lVar98 = 0;
                do {
                  auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar95 + lVar98),auVar146);
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                uVar4 = *pMVar8->data;
                auVar116._4_4_ = uVar4;
                auVar116._0_4_ = uVar4;
                auVar116._8_4_ = uVar4;
                auVar116._12_4_ = uVar4;
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                             ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83),
                                            auVar116);
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar134;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if (iVar81 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar100 + lVar98),
                                      *(undefined1 (*) [16])((long)pvVar95 + lVar98));
                *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            uVar4 = *local_110->data;
            auVar138._4_4_ = uVar4;
            auVar138._0_4_ = uVar4;
            auVar138._8_4_ = uVar4;
            auVar138._12_4_ = uVar4;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(auVar138,*(undefined1 (*) [16])((long)pvVar95 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_f8,iVar81,opt->blob_allocator);
          pauVar87 = (undefined1 (*) [16])pMVar9->data;
          if (pauVar87 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar94 = (undefined1 (*) [16])pMVar8->data;
              pauVar92 = (undefined1 (*) [16])pMVar8[1].data;
              uVar104 = 0;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar94;
                  uVar101 = uVar103;
                  do {
                    auVar133 = vsubps_avx(*pauVar92,auVar134);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          do {
            if (0 < iVar88) {
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar9->elemsize;
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              pvVar80 = pMVar9->data;
              sVar12 = pMVar8[1].cstep;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                auVar133 = vsubps_avx(*(undefined1 (*) [16])
                                       ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83),auVar134)
                ;
                *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) = auVar133
                ;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      local_118 = CONCAT44(local_118._4_4_,iVar88);
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar6 = pMVar8->h;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              do {
                if (0 < (int)uVar102) {
                  pauVar87 = (undefined1 (*) [16])
                             (pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data);
                  pauVar94 = (undefined1 (*) [16])
                             (local_120[1].cstep * uVar83 * local_120[1].elemsize +
                             (long)local_120[1].data);
                  pauVar92 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar92;
                      uVar101 = uVar103;
                      do {
                        auVar133 = vsubps_avx(*pauVar94,auVar134);
                        *pauVar87 = auVar133;
                        pauVar94 = pauVar94 + 1;
                        pauVar87 = pauVar87 + 1;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar92 = pauVar92 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)pvVar100 + lVar98),
                                    *(undefined1 (*) [16])((long)pvVar95 + lVar98));
              *(undefined1 (*) [16])((long)pvVar80 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)uVar6) {
              pauVar94 = (undefined1 (*) [16])local_120->data;
              pauVar92 = (undefined1 (*) [16])local_120[1].data;
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar92;
                  uVar82 = uVar83;
                  do {
                    auVar133 = vsubps_avx(auVar134,*pauVar94);
                    *pauVar87 = auVar133;
                    pauVar94 = pauVar94 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar92 = pauVar92 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            uVar4 = *local_110->data;
            auVar169._4_4_ = uVar4;
            auVar169._0_4_ = uVar4;
            auVar169._8_4_ = uVar4;
            auVar169._12_4_ = uVar4;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar134 = vsubps_avx(auVar169,*(undefined1 (*) [16])((long)pvVar80 + lVar98));
              *(undefined1 (*) [16])((long)*pauVar87 + lVar98) = auVar134;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)local_118) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    auVar133 = vsubps_avx(auVar134,*(undefined1 (*) [16])
                                                    ((long)pvVar95 +
                                                    lVar98 + sVar12 * sVar13 * uVar82));
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar133;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_118) {
            uVar4 = *local_110->data;
            auVar172._4_4_ = uVar4;
            auVar172._0_4_ = uVar4;
            auVar172._8_4_ = uVar4;
            auVar172._12_4_ = uVar4;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = vsubps_avx(auVar172,*(undefined1 (*) [16])
                                                  ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_118);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)local_118) {
          uVar82 = 0;
          do {
            if (0 < (int)uVar6) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar92 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              uVar103 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar133 = vsubps_avx(auVar134,*pauVar92);
                    *pauVar87 = auVar133;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar102 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar102;
                  } while (uVar102 != 0);
                }
                pauVar94 = pauVar94 + 1;
                uVar103 = uVar103 + 1;
              } while (uVar103 != uVar6);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != local_118);
          return 0;
        }
        return 0;
      }
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar133 = vsubps_avx(auVar134,*(undefined1 (*) [16])
                                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82
                                                  ));
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = sVar10;
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar127._4_4_ = uVar4;
                  auVar127._0_4_ = uVar4;
                  auVar127._8_4_ = uVar4;
                  auVar127._12_4_ = uVar4;
                  auVar134 = vsubps_avx(auVar127,*(undefined1 (*) [16])
                                                  ((long)pvVar80 +
                                                  lVar98 * 4 + sVar10 * sVar11 * uVar82));
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8[1].cstep;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  auVar133 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83),
                                        auVar134);
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                       auVar133;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar103 == uVar104) && (iVar79 == 1)) && ((uVar102 == uVar6 && (uVar7 == 1)))) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_118;
                do {
                  uVar4 = *(undefined4 *)((long)pvVar95 + lVar98);
                  auVar161._4_4_ = uVar4;
                  auVar161._0_4_ = uVar4;
                  auVar161._8_4_ = uVar4;
                  auVar161._12_4_ = uVar4;
                  auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                         ((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar83),
                                        auVar161);
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar134;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_100 = uVar82;
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].cstep;
                sVar11 = local_120[1].elemsize;
                pvVar80 = local_120[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120->cstep * uVar84 * local_120->elemsize + (long)local_120->data)
                ;
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar133 = vsubps_avx(auVar134,*pauVar94);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != uVar6);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar6) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                uVar103 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = vsubps_avx(*(undefined1 (*) [16])
                                             ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82),
                                            *(undefined1 (*) [16])((long)pvVar100 + lVar98));
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  uVar103 = uVar103 + 1;
                } while (uVar103 != uVar6);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)local_100) {
            uVar82 = 0;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (local_120[1].cstep * uVar82 * local_120[1].elemsize +
                           (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    uVar104 = uVar103;
                    do {
                      auVar133 = vsubps_avx(*pauVar94,auVar134);
                      *pauVar87 = auVar133;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        local_118 = uVar99;
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_f8,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)local_100) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)auVar89 + lVar98),
                                            *(undefined1 (*) [16])((long)auVar78 + lVar98));
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_100);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_118 = uVar99;
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)local_118) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = vsubps_avx(*(undefined1 (*) [16])((long)auVar89 + lVar98),
                                      *(undefined1 (*) [16])((long)auVar78 + lVar98));
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar134;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (int)local_118);
          return 0;
        }
        return 0;
      }
      return -100;
    case 8:
      local_128 = (void *)CONCAT44(local_128._4_4_,iVar81);
      uVar104 = pMVar8->w;
      uVar83 = (ulong)uVar104;
      sVar10 = pMVar8->elemsize;
      uVar103 = pMVar8[1].w;
      uVar84 = (ulong)uVar103;
      uVar102 = pMVar8[1].h;
      uVar101 = pMVar8[1].c;
      uVar82 = (ulong)uVar101;
      iVar88 = uVar102 * uVar103;
      local_100 = pMVar8[1].elemsize;
      iVar5 = pMVar8->dims;
      if (iVar5 == 1) {
        if (iVar79 == 1 && uVar104 == 1) {
          iVar5 = pMVar8[1].dims;
          if (iVar5 == 1) {
            Mat::create(pMVar9,uVar103,local_100,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar103) {
                auVar154._0_4_ = 1.0 / *pMVar8->data;
                auVar154._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar154,auVar154,0);
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar397 = pfVar96[1];
                  fVar426 = pfVar96[2];
                  fVar427 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = auVar134._0_4_ * *pfVar96;
                  pfVar97[1] = auVar134._4_4_ * fVar397;
                  pfVar97[2] = auVar134._8_4_ * fVar426;
                  pfVar97[3] = auVar134._12_4_ * fVar427;
                  lVar98 = lVar98 + 0x10;
                  uVar104 = (int)uVar84 - 1;
                  uVar84 = (ulong)uVar104;
                } while (uVar104 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 2) {
            Mat::create(pMVar9,uVar103,uVar102,local_100,iVar81,opt->blob_allocator);
            pvVar80 = pMVar9->data;
            if (pvVar80 == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < iVar88) {
                auVar152._0_4_ = 1.0 / *pMVar8->data;
                auVar152._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar152,auVar152,0);
                pvVar95 = pMVar1->data;
                lVar98 = 0;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98);
                  fVar397 = pfVar96[1];
                  fVar426 = pfVar96[2];
                  fVar427 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98);
                  *pfVar97 = auVar134._0_4_ * *pfVar96;
                  pfVar97[1] = auVar134._4_4_ * fVar397;
                  pfVar97[2] = auVar134._8_4_ * fVar426;
                  pfVar97[3] = auVar134._12_4_ * fVar427;
                  lVar98 = lVar98 + 0x10;
                  iVar88 = iVar88 + -1;
                } while (iVar88 != 0);
                return 0;
              }
              return 0;
            }
            return -100;
          }
          if (iVar5 == 3) {
            Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
            if (pMVar9->data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar9->c * pMVar9->cstep != 0) {
              if (0 < (int)uVar101) {
                auVar120._0_4_ = 1.0 / *pMVar8->data;
                auVar120._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar134 = vshufps_avx(auVar120,auVar120,0);
                uVar83 = 0;
                do {
                  if (0 < iVar88) {
                    sVar10 = pMVar9->cstep;
                    sVar11 = pMVar9->elemsize;
                    pvVar80 = pMVar9->data;
                    sVar12 = pMVar8[1].cstep;
                    sVar13 = pMVar8[1].elemsize;
                    pvVar95 = pMVar8[1].data;
                    lVar98 = 0;
                    iVar79 = iVar88;
                    do {
                      pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar83);
                      auVar289._0_4_ = auVar134._0_4_ * *pfVar96;
                      auVar289._4_4_ = auVar134._4_4_ * pfVar96[1];
                      auVar289._8_4_ = auVar134._8_4_ * pfVar96[2];
                      auVar289._12_4_ = auVar134._12_4_ * pfVar96[3];
                      *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar83) =
                           auVar289;
                      lVar98 = lVar98 + 0x10;
                      iVar79 = iVar79 + -1;
                    } while (iVar79 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar82);
                return 0;
              }
              return 0;
            }
            return -100;
          }
        }
        iVar5 = pMVar8[1].dims;
        if (iVar5 == 1) {
          Mat::create(pMVar9,uVar104,sVar10,iVar79,opt->blob_allocator);
          pvVar80 = pMVar9->data;
          if (pvVar80 == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep == 0) {
            return -100;
          }
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar104) {
              pvVar95 = pMVar8->data;
              pvVar100 = pMVar8[1].data;
              lVar98 = 0;
              do {
                auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
                auVar113 = vrcpps_avx(auVar134);
                auVar133 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
                fVar397 = auVar133._0_4_ * auVar113._0_4_;
                fVar426 = auVar133._4_4_ * auVar113._4_4_;
                fVar427 = auVar133._8_4_ * auVar113._8_4_;
                fVar428 = auVar133._12_4_ * auVar113._12_4_;
                auVar184._0_4_ = auVar134._0_4_ * fVar397;
                auVar184._4_4_ = auVar134._4_4_ * fVar426;
                auVar184._8_4_ = auVar134._8_4_ * fVar427;
                auVar184._12_4_ = auVar134._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar133,auVar184);
                pfVar96 = (float *)((long)pvVar80 + lVar98);
                *pfVar96 = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                pfVar96[1] = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                pfVar96[2] = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                pfVar96[3] = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                lVar98 = lVar98 + 0x10;
                uVar104 = (int)uVar83 - 1;
                uVar83 = (ulong)uVar104;
              } while (uVar104 != 0);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar104) {
            fVar397 = *pMVar1->data;
            auVar142._4_4_ = fVar397;
            auVar142._0_4_ = fVar397;
            auVar142._8_4_ = fVar397;
            auVar142._12_4_ = fVar397;
            pvVar95 = pMVar8->data;
            lVar98 = 0;
            do {
              auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
              auVar133 = vrcpps_avx(auVar134);
              fVar426 = fVar397 * auVar133._0_4_;
              fVar427 = fVar397 * auVar133._4_4_;
              fVar428 = fVar397 * auVar133._8_4_;
              fVar429 = fVar397 * auVar133._12_4_;
              auVar313._0_4_ = auVar134._0_4_ * fVar426;
              auVar313._4_4_ = auVar134._4_4_ * fVar427;
              auVar313._8_4_ = auVar134._8_4_ * fVar428;
              auVar313._12_4_ = auVar134._12_4_ * fVar429;
              auVar134 = vsubps_avx(auVar142,auVar313);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = fVar426 + auVar133._0_4_ * auVar134._0_4_;
              pfVar96[1] = fVar427 + auVar133._4_4_ * auVar134._4_4_;
              pfVar96[2] = fVar428 + auVar133._8_4_ * auVar134._8_4_;
              pfVar96[3] = fVar429 + auVar133._12_4_ * auVar134._12_4_;
              lVar98 = lVar98 + 0x10;
              uVar104 = (int)uVar83 - 1;
              uVar83 = (ulong)uVar104;
            } while (uVar104 != 0);
            return 0;
          }
          return 0;
        }
        if (iVar5 == 2) {
          Mat::create(pMVar9,uVar103,uVar102,local_100,iVar81,opt->blob_allocator);
          pfVar96 = (float *)pMVar9->data;
          if (pfVar96 == (float *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar102) {
              pauVar87 = (undefined1 (*) [16])pMVar8->data;
              pfVar97 = (float *)pMVar8[1].data;
              uVar104 = 0;
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar103) {
                  auVar134 = *pauVar87;
                  auVar133 = vrcpps_avx(auVar134);
                  fVar397 = auVar133._0_4_;
                  auVar312._0_4_ = auVar134._0_4_ * fVar397;
                  fVar426 = auVar133._4_4_;
                  auVar312._4_4_ = auVar134._4_4_ * fVar426;
                  fVar427 = auVar133._8_4_;
                  auVar312._8_4_ = auVar134._8_4_ * fVar427;
                  fVar428 = auVar133._12_4_;
                  auVar312._12_4_ = auVar134._12_4_ * fVar428;
                  auVar134 = vsubps_avx(auVar140,auVar312);
                  uVar101 = uVar103;
                  do {
                    fVar429 = pfVar97[1];
                    fVar14 = pfVar97[2];
                    fVar15 = pfVar97[3];
                    *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                    pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                    pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                    pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                    pfVar97 = pfVar97 + 4;
                    pfVar96 = pfVar96 + 4;
                    uVar101 = uVar101 - 1;
                  } while (uVar101 != 0);
                }
                pauVar87 = pauVar87 + 1;
                uVar104 = uVar104 + 1;
              } while (uVar104 != uVar102);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        if (iVar5 != 3) {
          return 0;
        }
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (0 < (int)uVar101) {
          uVar83 = 0;
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          do {
            if (0 < iVar88) {
              auVar134 = *(undefined1 (*) [16])((long)pMVar8->data + uVar83 * 0x10);
              sVar10 = pMVar9->cstep;
              sVar11 = pMVar8[1].cstep;
              auVar133 = vrcpps_avx(auVar134);
              fVar397 = auVar133._0_4_;
              auVar294._0_4_ = auVar134._0_4_ * fVar397;
              fVar426 = auVar133._4_4_;
              auVar294._4_4_ = auVar134._4_4_ * fVar426;
              fVar427 = auVar133._8_4_;
              auVar294._8_4_ = auVar134._8_4_ * fVar427;
              fVar428 = auVar133._12_4_;
              auVar294._12_4_ = auVar134._12_4_ * fVar428;
              auVar134 = vsubps_avx(auVar121,auVar294);
              sVar12 = pMVar9->elemsize;
              pvVar80 = pMVar9->data;
              sVar13 = pMVar8[1].elemsize;
              pvVar95 = pMVar8[1].data;
              lVar98 = 0;
              iVar79 = iVar88;
              do {
                pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar11 * sVar13 * uVar83);
                fVar429 = pfVar96[1];
                fVar14 = pfVar96[2];
                fVar15 = pfVar96[3];
                pfVar97 = (float *)((long)pvVar80 + lVar98 + sVar10 * sVar12 * uVar83);
                *pfVar97 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar96;
                pfVar97[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                pfVar97[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                pfVar97[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                lVar98 = lVar98 + 0x10;
                iVar79 = iVar79 + -1;
              } while (iVar79 != 0);
            }
            uVar83 = uVar83 + 1;
          } while (uVar83 != uVar82);
          return 0;
        }
        return 0;
      }
      uVar6 = pMVar8->h;
      local_118 = (ulong)uVar6;
      local_130 = (void *)CONCAT44(local_130._4_4_,uVar6 * uVar104);
      if (iVar5 == 2) {
        if (pMVar8[1].dims == 3) {
          Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
          if (pMVar9->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar9->c * pMVar9->cstep != 0) {
            if (0 < (int)uVar101) {
              uVar83 = 0;
              auVar118._8_4_ = 0x3f800000;
              auVar118._0_8_ = 0x3f8000003f800000;
              auVar118._12_4_ = 0x3f800000;
              do {
                if (0 < (int)uVar102) {
                  pfVar96 = (float *)(pMVar9->cstep * uVar83 * pMVar9->elemsize + (long)pMVar9->data
                                     );
                  pfVar97 = (float *)(local_120[1].cstep * uVar83 * local_120[1].elemsize +
                                     (long)local_120[1].data);
                  pauVar87 = (undefined1 (*) [16])
                             ((long)local_120->w * uVar83 * local_120->elemsize +
                             (long)local_120->data);
                  uVar104 = 0;
                  do {
                    if (0 < (int)uVar103) {
                      auVar134 = *pauVar87;
                      auVar133 = vrcpps_avx(auVar134);
                      fVar397 = auVar133._0_4_;
                      auVar288._0_4_ = auVar134._0_4_ * fVar397;
                      fVar426 = auVar133._4_4_;
                      auVar288._4_4_ = auVar134._4_4_ * fVar426;
                      fVar427 = auVar133._8_4_;
                      auVar288._8_4_ = auVar134._8_4_ * fVar427;
                      fVar428 = auVar133._12_4_;
                      auVar288._12_4_ = auVar134._12_4_ * fVar428;
                      auVar134 = vsubps_avx(auVar118,auVar288);
                      uVar101 = uVar103;
                      do {
                        fVar429 = pfVar97[1];
                        fVar14 = pfVar97[2];
                        fVar15 = pfVar97[3];
                        *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                        pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                        pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                        pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                        pfVar97 = pfVar97 + 4;
                        pfVar96 = pfVar96 + 4;
                        uVar101 = uVar101 - 1;
                      } while (uVar101 != 0);
                    }
                    pauVar87 = pauVar87 + 1;
                    uVar104 = uVar104 + 1;
                  } while (uVar104 != uVar102);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar82);
              return 0;
            }
            return 0;
          }
          return -100;
        }
        Mat::create(pMVar9,uVar104,uVar6,sVar10,iVar79,opt->blob_allocator);
        pvVar80 = pMVar9->data;
        if (pvVar80 == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (local_120[1].dims != 1) {
          if (local_120[1].dims != 2) {
            return 0;
          }
          if (0 < (int)local_130) {
            pvVar95 = local_120->data;
            pvVar100 = local_120[1].data;
            lVar98 = 0;
            do {
              auVar134 = *(undefined1 (*) [16])((long)pvVar95 + lVar98);
              auVar113 = vrcpps_avx(auVar134);
              auVar133 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
              fVar397 = auVar133._0_4_ * auVar113._0_4_;
              fVar426 = auVar133._4_4_ * auVar113._4_4_;
              fVar427 = auVar133._8_4_ * auVar113._8_4_;
              fVar428 = auVar133._12_4_ * auVar113._12_4_;
              auVar123._0_4_ = auVar134._0_4_ * fVar397;
              auVar123._4_4_ = auVar134._4_4_ * fVar426;
              auVar123._8_4_ = auVar134._8_4_ * fVar427;
              auVar123._12_4_ = auVar134._12_4_ * fVar428;
              auVar134 = vsubps_avx(auVar133,auVar123);
              pfVar96 = (float *)((long)pvVar80 + lVar98);
              *pfVar96 = fVar397 + auVar113._0_4_ * auVar134._0_4_;
              pfVar96[1] = fVar426 + auVar113._4_4_ * auVar134._4_4_;
              pfVar96[2] = fVar427 + auVar113._8_4_ * auVar134._8_4_;
              pfVar96[3] = fVar428 + auVar113._12_4_ * auVar134._12_4_;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        Mat::create(pMVar9,uVar104,(int)local_118,sVar10,iVar79,opt->blob_allocator);
        pauVar87 = (undefined1 (*) [16])pMVar9->data;
        if (pauVar87 == (undefined1 (*) [16])0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if ((int)local_128 != 1 || local_120[1].w != 1) {
            if (0 < (int)local_118) {
              pauVar94 = (undefined1 (*) [16])local_120->data;
              pauVar92 = (undefined1 (*) [16])local_120[1].data;
              iVar79 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar92;
                  uVar82 = uVar83;
                  do {
                    auVar133 = *pauVar94;
                    auVar113 = vrcpps_avx(auVar133);
                    fVar397 = auVar134._0_4_ * auVar113._0_4_;
                    fVar426 = auVar134._4_4_ * auVar113._4_4_;
                    fVar427 = auVar134._8_4_ * auVar113._8_4_;
                    fVar428 = auVar134._12_4_ * auVar113._12_4_;
                    auVar344._0_4_ = auVar133._0_4_ * fVar397;
                    auVar344._4_4_ = auVar133._4_4_ * fVar426;
                    auVar344._8_4_ = auVar133._8_4_ * fVar427;
                    auVar344._12_4_ = auVar133._12_4_ * fVar428;
                    auVar133 = vsubps_avx(auVar134,auVar344);
                    auVar345._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                    auVar345._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                    auVar345._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                    auVar345._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                    *pauVar87 = auVar345;
                    pauVar94 = pauVar94 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar103 = (int)uVar82 - 1;
                    uVar82 = (ulong)uVar103;
                  } while (uVar103 != 0);
                }
                pauVar92 = pauVar92 + 1;
                iVar79 = iVar79 + 1;
              } while (iVar79 != (int)local_118);
              return 0;
            }
            return 0;
          }
          if (0 < (int)local_130) {
            fVar397 = *pMVar1->data;
            auVar175._4_4_ = fVar397;
            auVar175._0_4_ = fVar397;
            auVar175._8_4_ = fVar397;
            auVar175._12_4_ = fVar397;
            pvVar80 = local_120->data;
            lVar98 = 0;
            do {
              auVar134 = *(undefined1 (*) [16])((long)pvVar80 + lVar98);
              auVar133 = vrcpps_avx(auVar134);
              fVar426 = fVar397 * auVar133._0_4_;
              fVar427 = fVar397 * auVar133._4_4_;
              fVar428 = fVar397 * auVar133._8_4_;
              fVar429 = fVar397 * auVar133._12_4_;
              auVar326._0_4_ = auVar134._0_4_ * fVar426;
              auVar326._4_4_ = auVar134._4_4_ * fVar427;
              auVar326._8_4_ = auVar134._8_4_ * fVar428;
              auVar326._12_4_ = auVar134._12_4_ * fVar429;
              auVar134 = vsubps_avx(auVar175,auVar326);
              pfVar96 = (float *)((long)*pauVar87 + lVar98);
              *pfVar96 = fVar426 + auVar133._0_4_ * auVar134._0_4_;
              pfVar96[1] = fVar427 + auVar133._4_4_ * auVar134._4_4_;
              pfVar96[2] = fVar428 + auVar133._8_4_ * auVar134._8_4_;
              pfVar96[3] = fVar429 + auVar133._12_4_ * auVar134._12_4_;
              lVar98 = lVar98 + 0x10;
              local_130._0_4_ = (int)local_130 + -1;
            } while ((int)local_130 != 0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if (iVar5 != 3) {
        return 0;
      }
      uVar7 = pMVar8->c;
      uVar99 = (ulong)uVar7;
      if (pMVar8[1].dims != 3) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep == 0) {
          return -100;
        }
        if (pMVar8[1].dims == 1) {
          if ((int)local_128 != 1 || pMVar8[1].w != 1) {
            if (0 < (int)uVar7) {
              uVar82 = 0;
              do {
                if (0 < (int)local_130) {
                  sVar10 = pMVar9->cstep;
                  sVar11 = pMVar9->elemsize;
                  auVar134 = *(undefined1 (*) [16])((long)local_110->data + uVar82 * 0x10);
                  pvVar80 = pMVar9->data;
                  sVar12 = pMVar8->cstep;
                  sVar13 = pMVar8->elemsize;
                  pvVar95 = pMVar8->data;
                  lVar98 = 0;
                  iVar79 = (int)local_130;
                  do {
                    auVar133 = *(undefined1 (*) [16])
                                ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                    auVar113 = vrcpps_avx(auVar133);
                    fVar397 = auVar134._0_4_ * auVar113._0_4_;
                    fVar426 = auVar134._4_4_ * auVar113._4_4_;
                    fVar427 = auVar134._8_4_ * auVar113._8_4_;
                    fVar428 = auVar134._12_4_ * auVar113._12_4_;
                    auVar333._0_4_ = auVar133._0_4_ * fVar397;
                    auVar333._4_4_ = auVar133._4_4_ * fVar426;
                    auVar333._8_4_ = auVar133._8_4_ * fVar427;
                    auVar333._12_4_ = auVar133._12_4_ * fVar428;
                    auVar133 = vsubps_avx(auVar134,auVar333);
                    auVar334._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                    auVar334._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                    auVar334._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                    auVar334._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                    *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                         auVar334;
                    lVar98 = lVar98 + 0x10;
                    iVar79 = iVar79 + -1;
                  } while (iVar79 != 0);
                }
                uVar82 = uVar82 + 1;
              } while (uVar82 != uVar99);
              return 0;
            }
            return 0;
          }
          if (0 < (int)uVar7) {
            fVar397 = *local_110->data;
            auVar177._4_4_ = fVar397;
            auVar177._0_4_ = fVar397;
            auVar177._8_4_ = fVar397;
            auVar177._12_4_ = fVar397;
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar9->cstep;
                sVar11 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar12 = pMVar8->cstep;
                sVar13 = pMVar8->elemsize;
                pvVar95 = pMVar8->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = *(undefined1 (*) [16])
                              ((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82);
                  auVar133 = vrcpps_avx(auVar134);
                  fVar426 = fVar397 * auVar133._0_4_;
                  fVar427 = fVar397 * auVar133._4_4_;
                  fVar428 = fVar397 * auVar133._8_4_;
                  fVar429 = fVar397 * auVar133._12_4_;
                  auVar327._0_4_ = auVar134._0_4_ * fVar426;
                  auVar327._4_4_ = auVar134._4_4_ * fVar427;
                  auVar327._8_4_ = auVar134._8_4_ * fVar428;
                  auVar327._12_4_ = auVar134._12_4_ * fVar429;
                  auVar134 = vsubps_avx(auVar177,auVar327);
                  auVar328._0_4_ = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                  auVar328._4_4_ = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                  auVar328._8_4_ = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                  auVar328._12_4_ = fVar429 + auVar133._12_4_ * auVar134._12_4_;
                  *(undefined1 (*) [16])((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82) =
                       auVar328;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        if (pMVar8[1].dims != 2) {
          return 0;
        }
        if (0 < (int)uVar7) {
          uVar82 = 0;
          do {
            if (0 < (int)local_118) {
              pauVar87 = (undefined1 (*) [16])
                         (pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
              pauVar94 = (undefined1 (*) [16])
                         ((long)pMVar8[1].w * uVar82 * pMVar8[1].elemsize + (long)pMVar8[1].data);
              pauVar92 = (undefined1 (*) [16])
                         (pMVar8->cstep * uVar82 * pMVar8->elemsize + (long)pMVar8->data);
              iVar79 = 0;
              do {
                if (0 < (int)uVar104) {
                  auVar134 = *pauVar94;
                  uVar84 = uVar83;
                  do {
                    auVar133 = *pauVar92;
                    auVar113 = vrcpps_avx(auVar133);
                    fVar397 = auVar134._0_4_ * auVar113._0_4_;
                    fVar426 = auVar134._4_4_ * auVar113._4_4_;
                    fVar427 = auVar134._8_4_ * auVar113._8_4_;
                    fVar428 = auVar134._12_4_ * auVar113._12_4_;
                    auVar299._0_4_ = auVar133._0_4_ * fVar397;
                    auVar299._4_4_ = auVar133._4_4_ * fVar426;
                    auVar299._8_4_ = auVar133._8_4_ * fVar427;
                    auVar299._12_4_ = auVar133._12_4_ * fVar428;
                    auVar133 = vsubps_avx(auVar134,auVar299);
                    auVar300._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                    auVar300._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                    auVar300._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                    auVar300._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                    *pauVar87 = auVar300;
                    pauVar92 = pauVar92 + 1;
                    pauVar87 = pauVar87 + 1;
                    uVar103 = (int)uVar84 - 1;
                    uVar84 = (ulong)uVar103;
                  } while (uVar103 != 0);
                }
                pauVar94 = pauVar94 + 1;
                iVar79 = iVar79 + 1;
              } while (iVar79 != (int)local_118);
            }
            uVar82 = uVar82 + 1;
          } while (uVar82 != uVar99);
          return 0;
        }
        return 0;
      }
      local_f8 = sVar10;
      if (uVar101 == uVar7 && (uVar102 == 1 && (uVar103 ^ 1) == 0)) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8[1].data + pMVar8[1].cstep * uVar82 * pMVar8[1].elemsize);
                pvVar80 = pMVar8->data;
                sVar12 = pMVar9->cstep;
                sVar13 = pMVar9->elemsize;
                pvVar95 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar133 = *(undefined1 (*) [16])
                              ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                  auVar113 = vrcpps_avx(auVar133);
                  fVar397 = auVar134._0_4_ * auVar113._0_4_;
                  fVar426 = auVar134._4_4_ * auVar113._4_4_;
                  fVar427 = auVar134._8_4_ * auVar113._8_4_;
                  fVar428 = auVar134._12_4_ * auVar113._12_4_;
                  auVar278._0_4_ = auVar133._0_4_ * fVar397;
                  auVar278._4_4_ = auVar133._4_4_ * fVar426;
                  auVar278._8_4_ = auVar133._8_4_ * fVar427;
                  auVar278._12_4_ = auVar133._12_4_ * fVar428;
                  auVar133 = vsubps_avx(auVar134,auVar278);
                  auVar279._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                  auVar279._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                  auVar279._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                  auVar279._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                  *(undefined1 (*) [16])((long)pvVar95 + lVar98 + sVar12 * sVar13 * uVar82) =
                       auVar279;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar103 == uVar104) && (iVar81 == 1 && (uVar101 == 1 && uVar102 == uVar6))) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar7) {
            uVar82 = 0;
            do {
              if (0 < (int)local_130) {
                sVar10 = pMVar8->cstep;
                sVar11 = pMVar8->elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8->data;
                pvVar95 = pMVar8[1].data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = (int)local_130;
                do {
                  auVar134 = *(undefined1 (*) [16])
                              ((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar82);
                  auVar133 = vrcpps_avx(auVar134);
                  fVar397 = *(float *)((long)pvVar95 + lVar98);
                  auVar395._4_4_ = fVar397;
                  auVar395._0_4_ = fVar397;
                  auVar395._8_4_ = fVar397;
                  auVar395._12_4_ = fVar397;
                  fVar426 = fVar397 * auVar133._0_4_;
                  fVar427 = fVar397 * auVar133._4_4_;
                  fVar428 = fVar397 * auVar133._8_4_;
                  fVar397 = fVar397 * auVar133._12_4_;
                  auVar131._0_4_ = auVar134._0_4_ * fVar426;
                  auVar131._4_4_ = auVar134._4_4_ * fVar427;
                  auVar131._8_4_ = auVar134._8_4_ * fVar428;
                  auVar131._12_4_ = auVar134._12_4_ * fVar397;
                  auVar134 = vsubps_avx(auVar395,auVar131);
                  auVar132._0_4_ = fVar426 + auVar133._0_4_ * auVar134._0_4_;
                  auVar132._4_4_ = fVar427 + auVar133._4_4_ * auVar134._4_4_;
                  auVar132._8_4_ = fVar428 + auVar133._8_4_ * auVar134._8_4_;
                  auVar132._12_4_ = fVar397 + auVar133._12_4_ * auVar134._12_4_;
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar82) =
                       auVar132;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != uVar99);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((uVar6 == 1 && (uVar104 ^ 1) == 0) && uVar7 == uVar101) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            auVar135._8_4_ = 0x3f800000;
            auVar135._0_8_ = 0x3f8000003f800000;
            auVar135._12_4_ = 0x3f800000;
            do {
              if (0 < iVar88) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar9->cstep;
                auVar134 = *(undefined1 (*) [16])
                            ((long)pMVar8->data + pMVar8->cstep * uVar83 * pMVar8->elemsize);
                auVar133 = vrcpps_avx(auVar134);
                fVar397 = auVar133._0_4_;
                auVar307._0_4_ = auVar134._0_4_ * fVar397;
                fVar426 = auVar133._4_4_;
                auVar307._4_4_ = auVar134._4_4_ * fVar426;
                fVar427 = auVar133._8_4_;
                auVar307._8_4_ = auVar134._8_4_ * fVar427;
                fVar428 = auVar133._12_4_;
                auVar307._12_4_ = auVar134._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar135,auVar307);
                sVar12 = pMVar9->elemsize;
                pvVar80 = pMVar9->data;
                sVar13 = pMVar8[1].elemsize;
                pvVar95 = pMVar8[1].data;
                lVar98 = 0;
                iVar79 = iVar88;
                do {
                  pfVar96 = (float *)((long)pvVar95 + lVar98 + sVar10 * sVar13 * uVar83);
                  fVar429 = pfVar96[1];
                  fVar14 = pfVar96[2];
                  fVar15 = pfVar96[3];
                  pfVar97 = (float *)((long)pvVar80 + lVar98 + sVar11 * sVar12 * uVar83);
                  *pfVar97 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar96;
                  pfVar97[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                  pfVar97[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                  pfVar97[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                  lVar98 = lVar98 + 0x10;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 == uVar104) && (iVar79 == 1)) && (uVar102 == uVar6)) && (uVar7 == 1)) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar83 = 0;
            do {
              if (0 < iVar88) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                sVar12 = pMVar9->cstep;
                pvVar80 = pMVar8[1].data;
                pvVar95 = pMVar8->data;
                sVar13 = pMVar9->elemsize;
                pvVar100 = pMVar9->data;
                lVar98 = 0;
                iVar79 = iVar88;
                do {
                  auVar134 = ZEXT416((uint)(1.0 / *(float *)((long)pvVar95 + lVar98)));
                  auVar134 = vshufps_avx(auVar134,auVar134,0);
                  pfVar96 = (float *)((long)pvVar80 + lVar98 * 4 + sVar10 * sVar11 * uVar83);
                  auVar317._0_4_ = auVar134._0_4_ * *pfVar96;
                  auVar317._4_4_ = auVar134._4_4_ * pfVar96[1];
                  auVar317._8_4_ = auVar134._8_4_ * pfVar96[2];
                  auVar317._12_4_ = auVar134._12_4_ * pfVar96[3];
                  *(undefined1 (*) [16])((long)pvVar100 + lVar98 * 4 + sVar12 * sVar13 * uVar83) =
                       auVar317;
                  lVar98 = lVar98 + 4;
                  iVar79 = iVar79 + -1;
                } while (iVar79 != 0);
              }
              uVar83 = uVar83 + 1;
            } while (uVar83 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar103 ^ 1) == 0 && uVar102 == uVar6) && uVar7 == uVar101) && uVar104 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)uVar101) {
            uVar84 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = pMVar8[1].cstep;
                sVar11 = pMVar8[1].elemsize;
                pvVar80 = pMVar8[1].data;
                pauVar87 = (undefined1 (*) [16])
                           (pMVar9->cstep * uVar84 * pMVar9->elemsize + (long)pMVar9->data);
                pauVar94 = (undefined1 (*) [16])
                           (pMVar8->cstep * uVar84 * pMVar8->elemsize + (long)pMVar8->data);
                uVar99 = 0;
                do {
                  if (0 < (int)uVar104) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar99 * 0x10 + sVar10 * uVar84 * sVar11);
                    uVar105 = uVar83;
                    do {
                      auVar133 = *pauVar94;
                      auVar113 = vrcpps_avx(auVar133);
                      fVar397 = auVar134._0_4_ * auVar113._0_4_;
                      fVar426 = auVar134._4_4_ * auVar113._4_4_;
                      fVar427 = auVar134._8_4_ * auVar113._8_4_;
                      fVar428 = auVar134._12_4_ * auVar113._12_4_;
                      auVar321._0_4_ = auVar133._0_4_ * fVar397;
                      auVar321._4_4_ = auVar133._4_4_ * fVar426;
                      auVar321._8_4_ = auVar133._8_4_ * fVar427;
                      auVar321._12_4_ = auVar133._12_4_ * fVar428;
                      auVar133 = vsubps_avx(auVar134,auVar321);
                      auVar322._0_4_ = fVar397 + auVar113._0_4_ * auVar133._0_4_;
                      auVar322._4_4_ = fVar426 + auVar113._4_4_ * auVar133._4_4_;
                      auVar322._8_4_ = fVar427 + auVar113._8_4_ * auVar133._8_4_;
                      auVar322._12_4_ = fVar428 + auVar113._12_4_ * auVar133._12_4_;
                      *pauVar87 = auVar322;
                      pauVar94 = pauVar94 + 1;
                      pauVar87 = pauVar87 + 1;
                      uVar103 = (int)uVar105 - 1;
                      uVar105 = (ulong)uVar103;
                    } while (uVar103 != 0);
                  }
                  uVar99 = uVar99 + 1;
                } while (uVar99 != local_118);
              }
              uVar84 = uVar84 + 1;
            } while (uVar84 != uVar82);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_f0 = uVar82;
      if (((uVar102 == 1 && (uVar103 ^ uVar104) == 0) && uVar101 == uVar7) && uVar6 != 1) {
        Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            uVar82 = 0;
            do {
              if (0 < (int)local_118) {
                sVar10 = local_120[1].elemsize;
                pvVar95 = (void *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pvVar100 = (void *)(local_120->cstep * uVar82 * local_120->elemsize +
                                   (long)local_120->data);
                sVar11 = local_120[1].cstep;
                pvVar80 = local_120[1].data;
                iVar79 = 0;
                do {
                  if (0 < (int)uVar104) {
                    lVar98 = 0;
                    do {
                      auVar134 = *(undefined1 (*) [16])((long)pvVar100 + lVar98);
                      auVar113 = vrcpps_avx(auVar134);
                      auVar133 = *(undefined1 (*) [16])
                                  ((long)pvVar80 + lVar98 + sVar10 * sVar11 * uVar82);
                      fVar397 = auVar133._0_4_ * auVar113._0_4_;
                      fVar426 = auVar133._4_4_ * auVar113._4_4_;
                      fVar427 = auVar133._8_4_ * auVar113._8_4_;
                      fVar428 = auVar133._12_4_ * auVar113._12_4_;
                      auVar181._0_4_ = auVar134._0_4_ * fVar397;
                      auVar181._4_4_ = auVar134._4_4_ * fVar426;
                      auVar181._8_4_ = auVar134._8_4_ * fVar427;
                      auVar181._12_4_ = auVar134._12_4_ * fVar428;
                      auVar134 = vsubps_avx(auVar133,auVar181);
                      auVar182._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                      auVar182._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                      auVar182._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                      auVar182._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                      *(undefined1 (*) [16])((long)pvVar95 + lVar98) = auVar182;
                      lVar98 = lVar98 + 0x10;
                    } while (uVar83 << 4 != lVar98);
                    pvVar95 = (void *)((long)pvVar95 + lVar98);
                    pvVar100 = (void *)((long)pvVar100 + lVar98);
                  }
                  iVar79 = iVar79 + 1;
                } while (iVar79 != (int)local_118);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar104 ^ 1) == 0 && uVar6 == uVar102) && uVar101 == uVar7) && uVar103 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar9->c * pMVar9->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            uVar82 = 0;
            auVar185._8_4_ = 0x3f800000;
            auVar185._0_8_ = 0x3f8000003f800000;
            auVar185._12_4_ = 0x3f800000;
            do {
              if (0 < (int)uVar102) {
                sVar10 = local_120->cstep;
                sVar11 = local_120->elemsize;
                pvVar80 = local_120->data;
                pfVar96 = (float *)(pMVar9->cstep * uVar82 * pMVar9->elemsize + (long)pMVar9->data);
                pfVar97 = (float *)(local_120[1].cstep * uVar82 * local_120[1].elemsize +
                                   (long)local_120[1].data);
                uVar83 = 0;
                do {
                  if (0 < (int)uVar103) {
                    auVar134 = *(undefined1 (*) [16])
                                ((long)pvVar80 + uVar83 * 0x10 + sVar10 * uVar82 * sVar11);
                    auVar133 = vrcpps_avx(auVar134);
                    fVar397 = auVar133._0_4_;
                    auVar340._0_4_ = auVar134._0_4_ * fVar397;
                    fVar426 = auVar133._4_4_;
                    auVar340._4_4_ = auVar134._4_4_ * fVar426;
                    fVar427 = auVar133._8_4_;
                    auVar340._8_4_ = auVar134._8_4_ * fVar427;
                    fVar428 = auVar133._12_4_;
                    auVar340._12_4_ = auVar134._12_4_ * fVar428;
                    auVar134 = vsubps_avx(auVar185,auVar340);
                    uVar104 = uVar103;
                    do {
                      fVar429 = pfVar97[1];
                      fVar14 = pfVar97[2];
                      fVar15 = pfVar97[3];
                      *pfVar96 = (fVar397 + fVar397 * auVar134._0_4_) * *pfVar97;
                      pfVar96[1] = (fVar426 + fVar426 * auVar134._4_4_) * fVar429;
                      pfVar96[2] = (fVar427 + fVar427 * auVar134._8_4_) * fVar14;
                      pfVar96[3] = (fVar428 + fVar428 * auVar134._12_4_) * fVar15;
                      pfVar97 = pfVar97 + 4;
                      pfVar96 = pfVar96 + 4;
                      uVar104 = uVar104 - 1;
                    } while (uVar104 != 0);
                  }
                  uVar83 = uVar83 + 1;
                } while (uVar83 != uVar102);
              }
              uVar82 = uVar82 + 1;
            } while (uVar82 != local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      local_e8 = uVar99;
      if ((((uVar103 ^ uVar104) == 0 && uVar6 == 1) && uVar7 == uVar101) && uVar102 != 1) {
        Mat::create(pMVar9,uVar103,uVar102,uVar101,local_100,iVar81,opt->blob_allocator);
        if (pMVar9->data == (void *)0x0) {
          return -100;
        }
        if ((long)local_108->c * local_108->cstep != 0) {
          if (0 < (int)(uint)local_f0) {
            local_128 = (void *)(uVar84 << 4);
            iVar79 = 0;
            do {
              Mat::channel((Mat *)local_e0,local_120,iVar79);
              auVar78 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_110,iVar79);
              auVar89 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              Mat::channel((Mat *)local_e0,local_108,iVar79);
              auVar109 = local_e0;
              Mat::~Mat((Mat *)local_e0);
              if (0 < (int)uVar102) {
                uVar104 = 0;
                do {
                  if (0 < (int)uVar103) {
                    lVar98 = 0;
                    do {
                      auVar134 = *(undefined1 (*) [16])((long)auVar78 + lVar98);
                      auVar113 = vrcpps_avx(auVar134);
                      auVar133 = *(undefined1 (*) [16])((long)auVar89 + lVar98);
                      fVar397 = auVar133._0_4_ * auVar113._0_4_;
                      fVar426 = auVar133._4_4_ * auVar113._4_4_;
                      fVar427 = auVar133._8_4_ * auVar113._8_4_;
                      fVar428 = auVar133._12_4_ * auVar113._12_4_;
                      auVar190._0_4_ = auVar134._0_4_ * fVar397;
                      auVar190._4_4_ = auVar134._4_4_ * fVar426;
                      auVar190._8_4_ = auVar134._8_4_ * fVar427;
                      auVar190._12_4_ = auVar134._12_4_ * fVar428;
                      auVar134 = vsubps_avx(auVar133,auVar190);
                      auVar191._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                      auVar191._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                      auVar191._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                      auVar191._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                      *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar191;
                      lVar98 = lVar98 + 0x10;
                    } while (local_128 != (void *)lVar98);
                    auVar109 = (undefined1  [8])((long)auVar109 + lVar98);
                    auVar89 = (undefined1  [8])((long)auVar89 + lVar98);
                  }
                  uVar104 = uVar104 + 1;
                } while (uVar104 != uVar102);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != (int)local_f0);
            return 0;
          }
          return 0;
        }
        return -100;
      }
      Mat::create(pMVar9,uVar104,uVar6,uVar7,sVar10,iVar79,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)local_108->c * local_108->cstep != 0) {
        if (0 < (int)(uint)local_e8) {
          iVar79 = 0;
          do {
            pMVar9 = local_108;
            Mat::channel((Mat *)local_e0,local_120,iVar79);
            auVar78 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,local_110,iVar79);
            auVar89 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            Mat::channel((Mat *)local_e0,pMVar9,iVar79);
            auVar109 = local_e0;
            Mat::~Mat((Mat *)local_e0);
            if (0 < (int)local_130) {
              lVar98 = 0;
              iVar81 = (int)local_130;
              do {
                auVar134 = *(undefined1 (*) [16])((long)auVar78 + lVar98);
                auVar113 = vrcpps_avx(auVar134);
                auVar133 = *(undefined1 (*) [16])((long)auVar89 + lVar98);
                fVar397 = auVar133._0_4_ * auVar113._0_4_;
                fVar426 = auVar133._4_4_ * auVar113._4_4_;
                fVar427 = auVar133._8_4_ * auVar113._8_4_;
                fVar428 = auVar133._12_4_ * auVar113._12_4_;
                auVar195._0_4_ = auVar134._0_4_ * fVar397;
                auVar195._4_4_ = auVar134._4_4_ * fVar426;
                auVar195._8_4_ = auVar134._8_4_ * fVar427;
                auVar195._12_4_ = auVar134._12_4_ * fVar428;
                auVar134 = vsubps_avx(auVar133,auVar195);
                auVar196._0_4_ = fVar397 + auVar113._0_4_ * auVar134._0_4_;
                auVar196._4_4_ = fVar426 + auVar113._4_4_ * auVar134._4_4_;
                auVar196._8_4_ = fVar427 + auVar113._8_4_ * auVar134._8_4_;
                auVar196._12_4_ = fVar428 + auVar113._12_4_ * auVar134._12_4_;
                *(undefined1 (*) [16])((long)auVar109 + lVar98) = auVar196;
                lVar98 = lVar98 + 0x10;
                iVar81 = iVar81 + -1;
              } while (iVar81 != 0);
            }
            iVar79 = iVar79 + 1;
          } while (iVar79 != (uint)local_e8);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  iVar79 = BinaryOp::forward((BinaryOp *)
                             ((long)&this->_vptr_BinaryOp_x86_avx +
                             (long)this->_vptr_BinaryOp_x86_avx[-3]),bottom_blobs,top_blobs,opt);
  return iVar79;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_rsub_pack8>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_rdiv_pack8>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_rsub_pack4>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_rdiv_pack4>(bottom_blob, bottom_blob1, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}